

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersector1<8>::
     occluded_n<embree::avx::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Primitive PVar24;
  Geometry *pGVar25;
  __int_type_conflict _Var26;
  long lVar27;
  long lVar28;
  long lVar29;
  RTCFilterFunctionN p_Var30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  byte bVar84;
  uint uVar85;
  ulong uVar86;
  uint uVar87;
  long lVar89;
  bool bVar90;
  uint uVar91;
  long lVar92;
  long lVar93;
  undefined1 auVar94 [8];
  ulong uVar95;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar110 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar144 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar145 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar201;
  undefined1 auVar196 [32];
  float fVar202;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float t1;
  float fVar203;
  float fVar223;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar222;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar220;
  float fVar221;
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar227;
  float fVar253;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar252;
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  float fVar257;
  float fVar276;
  float fVar277;
  undefined1 auVar258 [16];
  float fVar278;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [32];
  undefined1 auVar290 [16];
  vfloat4 b0;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar312 [16];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar321 [16];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar334 [16];
  float fVar333;
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar335 [16];
  undefined1 auVar342 [32];
  float fVar343;
  float fVar344;
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  float fVar355;
  float fVar357;
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  float fVar356;
  float fVar358;
  float fVar359;
  float fVar360;
  undefined1 auVar354 [32];
  float fVar361;
  float fVar371;
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  float fVar369;
  float fVar370;
  float in_register_0000151c;
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  float fVar372;
  float fVar373;
  float fVar381;
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  float fVar379;
  float fVar380;
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  vfloat4 a0;
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  float in_register_0000159c;
  undefined1 auVar389 [32];
  float fVar391;
  float fVar393;
  float fVar394;
  undefined1 auVar392 [16];
  float fVar395;
  float in_register_000015dc;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  int local_4cc;
  undefined1 local_4c8 [8];
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  float fStack_4a0;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined1 auStack_488 [16];
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  ulong local_420;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 auStack_2f8 [16];
  ulong local_2e8;
  Primitive *local_2e0;
  RTCFilterFunctionNArguments local_2d8;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  uint auStack_298 [4];
  undefined8 local_288;
  undefined4 local_280;
  undefined8 local_27c;
  undefined4 local_274;
  undefined4 local_270;
  uint local_26c;
  uint local_268;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [32];
  float afStack_1b8 [8];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar88;
  undefined1 auVar289 [32];
  undefined1 auVar390 [32];
  
  PVar24 = prim[1];
  uVar86 = (ulong)(byte)PVar24;
  lVar92 = uVar86 * 0x25;
  fVar203 = *(float *)(prim + lVar92 + 0x12);
  auVar210 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar92 + 6));
  auVar258._0_4_ = fVar203 * (ray->dir).field_0.m128[0];
  auVar258._4_4_ = fVar203 * (ray->dir).field_0.m128[1];
  auVar258._8_4_ = fVar203 * (ray->dir).field_0.m128[2];
  auVar258._12_4_ = fVar203 * (ray->dir).field_0.m128[3];
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 4 + 6)));
  auVar135._0_4_ = fVar203 * auVar210._0_4_;
  auVar135._4_4_ = fVar203 * auVar210._4_4_;
  auVar135._8_4_ = fVar203 * auVar210._8_4_;
  auVar135._12_4_ = fVar203 * auVar210._12_4_;
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 4 + 10)));
  auVar125._16_16_ = auVar210;
  auVar125._0_16_ = auVar114;
  auVar125 = vcvtdq2ps_avx(auVar125);
  lVar1 = uVar86 * 5;
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 6)));
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar1 + 10)));
  auVar196._16_16_ = auVar210;
  auVar196._0_16_ = auVar114;
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 6 + 6)));
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 6 + 10)));
  auVar31 = vcvtdq2ps_avx(auVar196);
  auVar215._16_16_ = auVar210;
  auVar215._0_16_ = auVar114;
  auVar32 = vcvtdq2ps_avx(auVar215);
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0xf + 6)));
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0xf + 10)));
  auVar216._16_16_ = auVar210;
  auVar216._0_16_ = auVar114;
  auVar33 = vcvtdq2ps_avx(auVar216);
  lVar93 = (ulong)(byte)PVar24 * 0x10;
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar93 + 6)));
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar93 + 10)));
  auVar288._16_16_ = auVar210;
  auVar288._0_16_ = auVar114;
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar93 + uVar86 + 6)));
  auVar34 = vcvtdq2ps_avx(auVar288);
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar93 + uVar86 + 10)));
  auVar298._16_16_ = auVar210;
  auVar298._0_16_ = auVar114;
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1a + 6)));
  auVar35 = vcvtdq2ps_avx(auVar298);
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1a + 10)));
  auVar299._16_16_ = auVar210;
  auVar299._0_16_ = auVar114;
  auVar36 = vcvtdq2ps_avx(auVar299);
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1b + 6)));
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1b + 10)));
  auVar327._16_16_ = auVar210;
  auVar327._0_16_ = auVar114;
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1c + 6)));
  auVar210 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar86 * 0x1c + 10)));
  auVar37 = vcvtdq2ps_avx(auVar327);
  auVar338._16_16_ = auVar210;
  auVar338._0_16_ = auVar114;
  auVar38 = vcvtdq2ps_avx(auVar338);
  auVar114 = vshufps_avx(auVar258,auVar258,0);
  auVar210 = vshufps_avx(auVar258,auVar258,0x55);
  auVar194 = vshufps_avx(auVar258,auVar258,0xaa);
  fVar203 = auVar194._0_4_;
  fVar227 = auVar194._4_4_;
  fVar201 = auVar194._8_4_;
  fVar220 = auVar194._12_4_;
  fVar202 = auVar210._0_4_;
  fVar373 = auVar210._4_4_;
  fVar221 = auVar210._8_4_;
  fVar252 = auVar210._12_4_;
  fVar333 = auVar114._0_4_;
  fVar223 = auVar114._4_4_;
  fVar253 = auVar114._8_4_;
  fVar222 = auVar114._12_4_;
  auVar365._0_4_ = fVar333 * auVar125._0_4_ + fVar202 * auVar31._0_4_ + fVar203 * auVar32._0_4_;
  auVar365._4_4_ = fVar223 * auVar125._4_4_ + fVar373 * auVar31._4_4_ + fVar227 * auVar32._4_4_;
  auVar365._8_4_ = fVar253 * auVar125._8_4_ + fVar221 * auVar31._8_4_ + fVar201 * auVar32._8_4_;
  auVar365._12_4_ = fVar222 * auVar125._12_4_ + fVar252 * auVar31._12_4_ + fVar220 * auVar32._12_4_;
  auVar365._16_4_ = fVar333 * auVar125._16_4_ + fVar202 * auVar31._16_4_ + fVar203 * auVar32._16_4_;
  auVar365._20_4_ = fVar223 * auVar125._20_4_ + fVar373 * auVar31._20_4_ + fVar227 * auVar32._20_4_;
  auVar365._24_4_ = fVar253 * auVar125._24_4_ + fVar221 * auVar31._24_4_ + fVar201 * auVar32._24_4_;
  auVar365._28_4_ = fVar252 + in_register_000015dc + in_register_0000151c;
  auVar349._0_4_ = fVar333 * auVar33._0_4_ + fVar202 * auVar34._0_4_ + auVar35._0_4_ * fVar203;
  auVar349._4_4_ = fVar223 * auVar33._4_4_ + fVar373 * auVar34._4_4_ + auVar35._4_4_ * fVar227;
  auVar349._8_4_ = fVar253 * auVar33._8_4_ + fVar221 * auVar34._8_4_ + auVar35._8_4_ * fVar201;
  auVar349._12_4_ = fVar222 * auVar33._12_4_ + fVar252 * auVar34._12_4_ + auVar35._12_4_ * fVar220;
  auVar349._16_4_ = fVar333 * auVar33._16_4_ + fVar202 * auVar34._16_4_ + auVar35._16_4_ * fVar203;
  auVar349._20_4_ = fVar223 * auVar33._20_4_ + fVar373 * auVar34._20_4_ + auVar35._20_4_ * fVar227;
  auVar349._24_4_ = fVar253 * auVar33._24_4_ + fVar221 * auVar34._24_4_ + auVar35._24_4_ * fVar201;
  auVar349._28_4_ = fVar252 + in_register_000015dc + in_register_0000159c;
  auVar273._0_4_ = fVar333 * auVar36._0_4_ + fVar202 * auVar37._0_4_ + auVar38._0_4_ * fVar203;
  auVar273._4_4_ = fVar223 * auVar36._4_4_ + fVar373 * auVar37._4_4_ + auVar38._4_4_ * fVar227;
  auVar273._8_4_ = fVar253 * auVar36._8_4_ + fVar221 * auVar37._8_4_ + auVar38._8_4_ * fVar201;
  auVar273._12_4_ = fVar222 * auVar36._12_4_ + fVar252 * auVar37._12_4_ + auVar38._12_4_ * fVar220;
  auVar273._16_4_ = fVar333 * auVar36._16_4_ + fVar202 * auVar37._16_4_ + auVar38._16_4_ * fVar203;
  auVar273._20_4_ = fVar223 * auVar36._20_4_ + fVar373 * auVar37._20_4_ + auVar38._20_4_ * fVar227;
  auVar273._24_4_ = fVar253 * auVar36._24_4_ + fVar221 * auVar37._24_4_ + auVar38._24_4_ * fVar201;
  auVar273._28_4_ = fVar222 + fVar252 + fVar220;
  auVar114 = vshufps_avx(auVar135,auVar135,0);
  auVar210 = vshufps_avx(auVar135,auVar135,0x55);
  auVar194 = vshufps_avx(auVar135,auVar135,0xaa);
  fVar203 = auVar194._0_4_;
  fVar227 = auVar194._4_4_;
  fVar201 = auVar194._8_4_;
  fVar220 = auVar194._12_4_;
  fVar223 = auVar210._0_4_;
  fVar253 = auVar210._4_4_;
  fVar222 = auVar210._8_4_;
  fVar224 = auVar210._12_4_;
  fVar202 = auVar31._28_4_ + auVar32._28_4_;
  fVar373 = auVar114._0_4_;
  fVar221 = auVar114._4_4_;
  fVar252 = auVar114._8_4_;
  fVar333 = auVar114._12_4_;
  auVar163._0_4_ = fVar373 * auVar125._0_4_ + fVar223 * auVar31._0_4_ + fVar203 * auVar32._0_4_;
  auVar163._4_4_ = fVar221 * auVar125._4_4_ + fVar253 * auVar31._4_4_ + fVar227 * auVar32._4_4_;
  auVar163._8_4_ = fVar252 * auVar125._8_4_ + fVar222 * auVar31._8_4_ + fVar201 * auVar32._8_4_;
  auVar163._12_4_ = fVar333 * auVar125._12_4_ + fVar224 * auVar31._12_4_ + fVar220 * auVar32._12_4_;
  auVar163._16_4_ = fVar373 * auVar125._16_4_ + fVar223 * auVar31._16_4_ + fVar203 * auVar32._16_4_;
  auVar163._20_4_ = fVar221 * auVar125._20_4_ + fVar253 * auVar31._20_4_ + fVar227 * auVar32._20_4_;
  auVar163._24_4_ = fVar252 * auVar125._24_4_ + fVar222 * auVar31._24_4_ + fVar201 * auVar32._24_4_;
  auVar163._28_4_ = auVar125._28_4_ + fVar202;
  auVar126._0_4_ = fVar373 * auVar33._0_4_ + auVar35._0_4_ * fVar203 + fVar223 * auVar34._0_4_;
  auVar126._4_4_ = fVar221 * auVar33._4_4_ + auVar35._4_4_ * fVar227 + fVar253 * auVar34._4_4_;
  auVar126._8_4_ = fVar252 * auVar33._8_4_ + auVar35._8_4_ * fVar201 + fVar222 * auVar34._8_4_;
  auVar126._12_4_ = fVar333 * auVar33._12_4_ + auVar35._12_4_ * fVar220 + fVar224 * auVar34._12_4_;
  auVar126._16_4_ = fVar373 * auVar33._16_4_ + auVar35._16_4_ * fVar203 + fVar223 * auVar34._16_4_;
  auVar126._20_4_ = fVar221 * auVar33._20_4_ + auVar35._20_4_ * fVar227 + fVar253 * auVar34._20_4_;
  auVar126._24_4_ = fVar252 * auVar33._24_4_ + auVar35._24_4_ * fVar201 + fVar222 * auVar34._24_4_;
  auVar126._28_4_ = auVar125._28_4_ + auVar35._28_4_ + auVar32._28_4_;
  auVar217._8_4_ = 0x7fffffff;
  auVar217._0_8_ = 0x7fffffff7fffffff;
  auVar217._12_4_ = 0x7fffffff;
  auVar217._16_4_ = 0x7fffffff;
  auVar217._20_4_ = 0x7fffffff;
  auVar217._24_4_ = 0x7fffffff;
  auVar217._28_4_ = 0x7fffffff;
  auVar249._8_4_ = 0x219392ef;
  auVar249._0_8_ = 0x219392ef219392ef;
  auVar249._12_4_ = 0x219392ef;
  auVar249._16_4_ = 0x219392ef;
  auVar249._20_4_ = 0x219392ef;
  auVar249._24_4_ = 0x219392ef;
  auVar249._28_4_ = 0x219392ef;
  auVar125 = vandps_avx(auVar365,auVar217);
  auVar125 = vcmpps_avx(auVar125,auVar249,1);
  auVar31 = vblendvps_avx(auVar365,auVar249,auVar125);
  auVar125 = vandps_avx(auVar349,auVar217);
  auVar125 = vcmpps_avx(auVar125,auVar249,1);
  auVar32 = vblendvps_avx(auVar349,auVar249,auVar125);
  auVar125 = vandps_avx(auVar273,auVar217);
  auVar125 = vcmpps_avx(auVar125,auVar249,1);
  auVar125 = vblendvps_avx(auVar273,auVar249,auVar125);
  auVar197._0_4_ = fVar373 * auVar36._0_4_ + fVar223 * auVar37._0_4_ + auVar38._0_4_ * fVar203;
  auVar197._4_4_ = fVar221 * auVar36._4_4_ + fVar253 * auVar37._4_4_ + auVar38._4_4_ * fVar227;
  auVar197._8_4_ = fVar252 * auVar36._8_4_ + fVar222 * auVar37._8_4_ + auVar38._8_4_ * fVar201;
  auVar197._12_4_ = fVar333 * auVar36._12_4_ + fVar224 * auVar37._12_4_ + auVar38._12_4_ * fVar220;
  auVar197._16_4_ = fVar373 * auVar36._16_4_ + fVar223 * auVar37._16_4_ + auVar38._16_4_ * fVar203;
  auVar197._20_4_ = fVar221 * auVar36._20_4_ + fVar253 * auVar37._20_4_ + auVar38._20_4_ * fVar227;
  auVar197._24_4_ = fVar252 * auVar36._24_4_ + fVar222 * auVar37._24_4_ + auVar38._24_4_ * fVar201;
  auVar197._28_4_ = fVar202 + auVar34._28_4_ + fVar220;
  auVar33 = vrcpps_avx(auVar31);
  fVar203 = auVar33._0_4_;
  fVar220 = auVar33._4_4_;
  auVar34._4_4_ = auVar31._4_4_ * fVar220;
  auVar34._0_4_ = auVar31._0_4_ * fVar203;
  fVar221 = auVar33._8_4_;
  auVar34._8_4_ = auVar31._8_4_ * fVar221;
  fVar223 = auVar33._12_4_;
  auVar34._12_4_ = auVar31._12_4_ * fVar223;
  fVar224 = auVar33._16_4_;
  auVar34._16_4_ = auVar31._16_4_ * fVar224;
  fVar225 = auVar33._20_4_;
  auVar34._20_4_ = auVar31._20_4_ * fVar225;
  fVar226 = auVar33._24_4_;
  auVar34._24_4_ = auVar31._24_4_ * fVar226;
  auVar34._28_4_ = 0x219392ef;
  auVar300._8_4_ = 0x3f800000;
  auVar300._0_8_ = 0x3f8000003f800000;
  auVar300._12_4_ = 0x3f800000;
  auVar300._16_4_ = 0x3f800000;
  auVar300._20_4_ = 0x3f800000;
  auVar300._24_4_ = 0x3f800000;
  auVar300._28_4_ = 0x3f800000;
  auVar35 = vsubps_avx(auVar300,auVar34);
  auVar34 = vrcpps_avx(auVar32);
  fVar203 = fVar203 + fVar203 * auVar35._0_4_;
  fVar220 = fVar220 + fVar220 * auVar35._4_4_;
  fVar221 = fVar221 + fVar221 * auVar35._8_4_;
  fVar223 = fVar223 + fVar223 * auVar35._12_4_;
  fVar224 = fVar224 + fVar224 * auVar35._16_4_;
  fVar225 = fVar225 + fVar225 * auVar35._20_4_;
  fVar226 = fVar226 + fVar226 * auVar35._24_4_;
  fVar227 = auVar34._0_4_;
  fVar202 = auVar34._4_4_;
  auVar31._4_4_ = auVar32._4_4_ * fVar202;
  auVar31._0_4_ = auVar32._0_4_ * fVar227;
  fVar252 = auVar34._8_4_;
  auVar31._8_4_ = auVar32._8_4_ * fVar252;
  fVar253 = auVar34._12_4_;
  auVar31._12_4_ = auVar32._12_4_ * fVar253;
  fVar254 = auVar34._16_4_;
  auVar31._16_4_ = auVar32._16_4_ * fVar254;
  fVar255 = auVar34._20_4_;
  auVar31._20_4_ = auVar32._20_4_ * fVar255;
  fVar256 = auVar34._24_4_;
  auVar31._24_4_ = auVar32._24_4_ * fVar256;
  auVar31._28_4_ = auVar35._28_4_;
  auVar32 = vsubps_avx(auVar300,auVar31);
  fVar227 = fVar227 + fVar227 * auVar32._0_4_;
  fVar202 = fVar202 + fVar202 * auVar32._4_4_;
  fVar252 = fVar252 + fVar252 * auVar32._8_4_;
  fVar253 = fVar253 + fVar253 * auVar32._12_4_;
  fVar254 = fVar254 + fVar254 * auVar32._16_4_;
  fVar255 = fVar255 + fVar255 * auVar32._20_4_;
  fVar256 = fVar256 + fVar256 * auVar32._24_4_;
  auVar31 = vrcpps_avx(auVar125);
  fVar257 = auVar31._0_4_;
  fVar276 = auVar31._4_4_;
  auVar36._4_4_ = fVar276 * auVar125._4_4_;
  auVar36._0_4_ = fVar257 * auVar125._0_4_;
  fVar277 = auVar31._8_4_;
  auVar36._8_4_ = fVar277 * auVar125._8_4_;
  fVar278 = auVar31._12_4_;
  auVar36._12_4_ = fVar278 * auVar125._12_4_;
  fVar279 = auVar31._16_4_;
  auVar36._16_4_ = fVar279 * auVar125._16_4_;
  fVar280 = auVar31._20_4_;
  auVar36._20_4_ = fVar280 * auVar125._20_4_;
  fVar281 = auVar31._24_4_;
  auVar36._24_4_ = fVar281 * auVar125._24_4_;
  auVar36._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(auVar300,auVar36);
  fVar257 = fVar257 + fVar257 * auVar125._0_4_;
  fVar276 = fVar276 + fVar276 * auVar125._4_4_;
  fVar277 = fVar277 + fVar277 * auVar125._8_4_;
  fVar278 = fVar278 + fVar278 * auVar125._12_4_;
  fVar279 = fVar279 + fVar279 * auVar125._16_4_;
  fVar280 = fVar280 + fVar280 * auVar125._20_4_;
  fVar281 = fVar281 + fVar281 * auVar125._24_4_;
  auVar114 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar92 + 0x16)) *
                           *(float *)(prim + lVar92 + 0x1a)));
  auVar147 = vshufps_avx(auVar114,auVar114,0);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar86 * 7 + 6);
  auVar114 = vpmovsxwd_avx(auVar114);
  auVar210._8_8_ = 0;
  auVar210._0_8_ = *(ulong *)(prim + uVar86 * 7 + 0xe);
  auVar210 = vpmovsxwd_avx(auVar210);
  auVar301._16_16_ = auVar210;
  auVar301._0_16_ = auVar114;
  auVar125 = vcvtdq2ps_avx(auVar301);
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar86 * 0xb + 6);
  auVar114 = vpmovsxwd_avx(auVar194);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + uVar86 * 0xb + 0xe);
  auVar210 = vpmovsxwd_avx(auVar158);
  auVar316._16_16_ = auVar210;
  auVar316._0_16_ = auVar114;
  auVar31 = vcvtdq2ps_avx(auVar316);
  auVar31 = vsubps_avx(auVar31,auVar125);
  fVar201 = auVar147._0_4_;
  fVar373 = auVar147._4_4_;
  fVar333 = auVar147._8_4_;
  fVar222 = auVar147._12_4_;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + uVar86 * 9 + 6);
  auVar114 = vpmovsxwd_avx(auVar147);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *(ulong *)(prim + uVar86 * 9 + 0xe);
  auVar210 = vpmovsxwd_avx(auVar184);
  auVar302._0_4_ = auVar31._0_4_ * fVar201 + auVar125._0_4_;
  auVar302._4_4_ = auVar31._4_4_ * fVar373 + auVar125._4_4_;
  auVar302._8_4_ = auVar31._8_4_ * fVar333 + auVar125._8_4_;
  auVar302._12_4_ = auVar31._12_4_ * fVar222 + auVar125._12_4_;
  auVar302._16_4_ = auVar31._16_4_ * fVar201 + auVar125._16_4_;
  auVar302._20_4_ = auVar31._20_4_ * fVar373 + auVar125._20_4_;
  auVar302._24_4_ = auVar31._24_4_ * fVar333 + auVar125._24_4_;
  auVar302._28_4_ = auVar31._28_4_ + auVar125._28_4_;
  auVar317._16_16_ = auVar210;
  auVar317._0_16_ = auVar114;
  auVar125 = vcvtdq2ps_avx(auVar317);
  auVar148._8_8_ = 0;
  auVar148._0_8_ = *(ulong *)(prim + uVar86 * 0xd + 6);
  auVar114 = vpmovsxwd_avx(auVar148);
  auVar290._8_8_ = 0;
  auVar290._0_8_ = *(ulong *)(prim + uVar86 * 0xd + 0xe);
  auVar210 = vpmovsxwd_avx(auVar290);
  auVar328._16_16_ = auVar210;
  auVar328._0_16_ = auVar114;
  auVar31 = vcvtdq2ps_avx(auVar328);
  auVar31 = vsubps_avx(auVar31,auVar125);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar86 * 0x12 + 6);
  auVar114 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar86 * 0x12 + 0xe);
  auVar210 = vpmovsxwd_avx(auVar11);
  auVar318._0_4_ = auVar125._0_4_ + auVar31._0_4_ * fVar201;
  auVar318._4_4_ = auVar125._4_4_ + auVar31._4_4_ * fVar373;
  auVar318._8_4_ = auVar125._8_4_ + auVar31._8_4_ * fVar333;
  auVar318._12_4_ = auVar125._12_4_ + auVar31._12_4_ * fVar222;
  auVar318._16_4_ = auVar125._16_4_ + auVar31._16_4_ * fVar201;
  auVar318._20_4_ = auVar125._20_4_ + auVar31._20_4_ * fVar373;
  auVar318._24_4_ = auVar125._24_4_ + auVar31._24_4_ * fVar333;
  auVar318._28_4_ = auVar125._28_4_ + auVar31._28_4_;
  auVar329._16_16_ = auVar210;
  auVar329._0_16_ = auVar114;
  auVar125 = vcvtdq2ps_avx(auVar329);
  uVar95 = (ulong)(uint)((int)lVar1 << 2);
  lVar92 = uVar86 * 2 + uVar95;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = *(ulong *)(prim + lVar92 + 6);
  auVar114 = vpmovsxwd_avx(auVar308);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar92 + 0xe);
  auVar210 = vpmovsxwd_avx(auVar12);
  auVar339._16_16_ = auVar210;
  auVar339._0_16_ = auVar114;
  auVar31 = vcvtdq2ps_avx(auVar339);
  auVar31 = vsubps_avx(auVar31,auVar125);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar95 + 6);
  auVar114 = vpmovsxwd_avx(auVar13);
  auVar330._0_4_ = auVar125._0_4_ + auVar31._0_4_ * fVar201;
  auVar330._4_4_ = auVar125._4_4_ + auVar31._4_4_ * fVar373;
  auVar330._8_4_ = auVar125._8_4_ + auVar31._8_4_ * fVar333;
  auVar330._12_4_ = auVar125._12_4_ + auVar31._12_4_ * fVar222;
  auVar330._16_4_ = auVar125._16_4_ + auVar31._16_4_ * fVar201;
  auVar330._20_4_ = auVar125._20_4_ + auVar31._20_4_ * fVar373;
  auVar330._24_4_ = auVar125._24_4_ + auVar31._24_4_ * fVar333;
  auVar330._28_4_ = auVar125._28_4_ + auVar31._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar95 + 0xe);
  auVar210 = vpmovsxwd_avx(auVar14);
  auVar340._16_16_ = auVar210;
  auVar340._0_16_ = auVar114;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = *(ulong *)(prim + uVar86 * 0x18 + 6);
  auVar114 = vpmovsxwd_avx(auVar177);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar86 * 0x18 + 0xe);
  auVar210 = vpmovsxwd_avx(auVar15);
  auVar125 = vcvtdq2ps_avx(auVar340);
  auVar350._16_16_ = auVar210;
  auVar350._0_16_ = auVar114;
  auVar31 = vcvtdq2ps_avx(auVar350);
  auVar31 = vsubps_avx(auVar31,auVar125);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar86 * 0x1d + 6);
  auVar114 = vpmovsxwd_avx(auVar16);
  auVar341._0_4_ = auVar125._0_4_ + auVar31._0_4_ * fVar201;
  auVar341._4_4_ = auVar125._4_4_ + auVar31._4_4_ * fVar373;
  auVar341._8_4_ = auVar125._8_4_ + auVar31._8_4_ * fVar333;
  auVar341._12_4_ = auVar125._12_4_ + auVar31._12_4_ * fVar222;
  auVar341._16_4_ = auVar125._16_4_ + auVar31._16_4_ * fVar201;
  auVar341._20_4_ = auVar125._20_4_ + auVar31._20_4_ * fVar373;
  auVar341._24_4_ = auVar125._24_4_ + auVar31._24_4_ * fVar333;
  auVar341._28_4_ = auVar125._28_4_ + auVar31._28_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar86 * 0x1d + 0xe);
  auVar210 = vpmovsxwd_avx(auVar17);
  auVar351._16_16_ = auVar210;
  auVar351._0_16_ = auVar114;
  auVar125 = vcvtdq2ps_avx(auVar351);
  lVar92 = uVar86 + (ulong)(byte)PVar24 * 0x20;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar92 + 6);
  auVar114 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar92 + 0xe);
  auVar210 = vpmovsxwd_avx(auVar19);
  auVar366._16_16_ = auVar210;
  auVar366._0_16_ = auVar114;
  auVar31 = vcvtdq2ps_avx(auVar366);
  auVar31 = vsubps_avx(auVar31,auVar125);
  auVar352._0_4_ = auVar125._0_4_ + auVar31._0_4_ * fVar201;
  auVar352._4_4_ = auVar125._4_4_ + auVar31._4_4_ * fVar373;
  auVar352._8_4_ = auVar125._8_4_ + auVar31._8_4_ * fVar333;
  auVar352._12_4_ = auVar125._12_4_ + auVar31._12_4_ * fVar222;
  auVar352._16_4_ = auVar125._16_4_ + auVar31._16_4_ * fVar201;
  auVar352._20_4_ = auVar125._20_4_ + auVar31._20_4_ * fVar373;
  auVar352._24_4_ = auVar125._24_4_ + auVar31._24_4_ * fVar333;
  auVar352._28_4_ = auVar125._28_4_ + auVar31._28_4_;
  lVar92 = (ulong)(byte)PVar24 * 0x20 - uVar86;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + lVar92 + 6);
  auVar114 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + lVar92 + 0xe);
  auVar210 = vpmovsxwd_avx(auVar21);
  auVar367._16_16_ = auVar210;
  auVar367._0_16_ = auVar114;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar86 * 0x23 + 6);
  auVar114 = vpmovsxwd_avx(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar86 * 0x23 + 0xe);
  auVar210 = vpmovsxwd_avx(auVar23);
  auVar125 = vcvtdq2ps_avx(auVar367);
  auVar377._16_16_ = auVar210;
  auVar377._0_16_ = auVar114;
  auVar31 = vcvtdq2ps_avx(auVar377);
  auVar31 = vsubps_avx(auVar31,auVar125);
  auVar368._0_4_ = auVar125._0_4_ + auVar31._0_4_ * fVar201;
  auVar368._4_4_ = auVar125._4_4_ + auVar31._4_4_ * fVar373;
  auVar368._8_4_ = auVar125._8_4_ + auVar31._8_4_ * fVar333;
  auVar368._12_4_ = auVar125._12_4_ + auVar31._12_4_ * fVar222;
  auVar368._16_4_ = auVar125._16_4_ + auVar31._16_4_ * fVar201;
  auVar368._20_4_ = auVar125._20_4_ + auVar31._20_4_ * fVar373;
  auVar368._24_4_ = auVar125._24_4_ + auVar31._24_4_ * fVar333;
  auVar368._28_4_ = auVar125._28_4_ + fVar222;
  auVar125 = vsubps_avx(auVar302,auVar163);
  auVar282._0_4_ = fVar203 * auVar125._0_4_;
  auVar282._4_4_ = fVar220 * auVar125._4_4_;
  auVar282._8_4_ = fVar221 * auVar125._8_4_;
  auVar282._12_4_ = fVar223 * auVar125._12_4_;
  auVar37._16_4_ = fVar224 * auVar125._16_4_;
  auVar37._0_16_ = auVar282;
  auVar37._20_4_ = fVar225 * auVar125._20_4_;
  auVar37._24_4_ = fVar226 * auVar125._24_4_;
  auVar37._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(auVar318,auVar163);
  auVar204._0_4_ = fVar203 * auVar125._0_4_;
  auVar204._4_4_ = fVar220 * auVar125._4_4_;
  auVar204._8_4_ = fVar221 * auVar125._8_4_;
  auVar204._12_4_ = fVar223 * auVar125._12_4_;
  auVar38._16_4_ = fVar224 * auVar125._16_4_;
  auVar38._0_16_ = auVar204;
  auVar38._20_4_ = fVar225 * auVar125._20_4_;
  auVar38._24_4_ = fVar226 * auVar125._24_4_;
  auVar38._28_4_ = auVar33._28_4_ + auVar35._28_4_;
  auVar125 = vsubps_avx(auVar330,auVar126);
  auVar136._0_4_ = fVar227 * auVar125._0_4_;
  auVar136._4_4_ = fVar202 * auVar125._4_4_;
  auVar136._8_4_ = fVar252 * auVar125._8_4_;
  auVar136._12_4_ = fVar253 * auVar125._12_4_;
  auVar33._16_4_ = fVar254 * auVar125._16_4_;
  auVar33._0_16_ = auVar136;
  auVar33._20_4_ = fVar255 * auVar125._20_4_;
  auVar33._24_4_ = fVar256 * auVar125._24_4_;
  auVar33._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(auVar341,auVar126);
  auVar228._0_4_ = fVar227 * auVar125._0_4_;
  auVar228._4_4_ = fVar202 * auVar125._4_4_;
  auVar228._8_4_ = fVar252 * auVar125._8_4_;
  auVar228._12_4_ = fVar253 * auVar125._12_4_;
  auVar35._16_4_ = fVar254 * auVar125._16_4_;
  auVar35._0_16_ = auVar228;
  auVar35._20_4_ = fVar255 * auVar125._20_4_;
  auVar35._24_4_ = fVar256 * auVar125._24_4_;
  auVar35._28_4_ = auVar34._28_4_ + auVar32._28_4_;
  auVar125 = vsubps_avx(auVar352,auVar197);
  auVar96._0_4_ = fVar257 * auVar125._0_4_;
  auVar96._4_4_ = fVar276 * auVar125._4_4_;
  auVar96._8_4_ = fVar277 * auVar125._8_4_;
  auVar96._12_4_ = fVar278 * auVar125._12_4_;
  auVar32._16_4_ = fVar279 * auVar125._16_4_;
  auVar32._0_16_ = auVar96;
  auVar32._20_4_ = fVar280 * auVar125._20_4_;
  auVar32._24_4_ = fVar281 * auVar125._24_4_;
  auVar32._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(auVar368,auVar197);
  auVar170._0_4_ = fVar257 * auVar125._0_4_;
  auVar170._4_4_ = fVar276 * auVar125._4_4_;
  auVar170._8_4_ = fVar277 * auVar125._8_4_;
  auVar170._12_4_ = fVar278 * auVar125._12_4_;
  auVar39._16_4_ = fVar279 * auVar125._16_4_;
  auVar39._0_16_ = auVar170;
  auVar39._20_4_ = fVar280 * auVar125._20_4_;
  auVar39._24_4_ = fVar281 * auVar125._24_4_;
  auVar39._28_4_ = auVar125._28_4_;
  auVar114 = vpminsd_avx(auVar37._16_16_,auVar38._16_16_);
  auVar210 = vpminsd_avx(auVar282,auVar204);
  auVar319._16_16_ = auVar114;
  auVar319._0_16_ = auVar210;
  auVar114 = vpminsd_avx(auVar33._16_16_,auVar35._16_16_);
  auVar210 = vpminsd_avx(auVar136,auVar228);
  auVar353._16_16_ = auVar114;
  auVar353._0_16_ = auVar210;
  auVar125 = vmaxps_avx(auVar319,auVar353);
  auVar114 = vpminsd_avx(auVar32._16_16_,auVar39._16_16_);
  auVar210 = vpminsd_avx(auVar96,auVar170);
  auVar378._16_16_ = auVar114;
  auVar378._0_16_ = auVar210;
  uVar7 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar389._4_4_ = uVar7;
  auVar389._0_4_ = uVar7;
  auVar389._8_4_ = uVar7;
  auVar389._12_4_ = uVar7;
  auVar389._16_4_ = uVar7;
  auVar389._20_4_ = uVar7;
  auVar389._24_4_ = uVar7;
  auVar389._28_4_ = uVar7;
  auVar31 = vmaxps_avx(auVar378,auVar389);
  auVar125 = vmaxps_avx(auVar125,auVar31);
  local_198._4_4_ = auVar125._4_4_ * 0.99999964;
  local_198._0_4_ = auVar125._0_4_ * 0.99999964;
  local_198._8_4_ = auVar125._8_4_ * 0.99999964;
  local_198._12_4_ = auVar125._12_4_ * 0.99999964;
  local_198._16_4_ = auVar125._16_4_ * 0.99999964;
  local_198._20_4_ = auVar125._20_4_ * 0.99999964;
  local_198._24_4_ = auVar125._24_4_ * 0.99999964;
  local_198._28_4_ = auVar125._28_4_;
  auVar114 = vpmaxsd_avx(auVar37._16_16_,auVar38._16_16_);
  auVar210 = vpmaxsd_avx(auVar282,auVar204);
  auVar218._16_16_ = auVar114;
  auVar218._0_16_ = auVar210;
  auVar114 = vpmaxsd_avx(auVar33._16_16_,auVar35._16_16_);
  auVar210 = vpmaxsd_avx(auVar136,auVar228);
  auVar164._16_16_ = auVar114;
  auVar164._0_16_ = auVar210;
  auVar125 = vminps_avx(auVar218,auVar164);
  auVar114 = vpmaxsd_avx(auVar32._16_16_,auVar39._16_16_);
  auVar210 = vpmaxsd_avx(auVar96,auVar170);
  fVar203 = ray->tfar;
  auVar198._4_4_ = fVar203;
  auVar198._0_4_ = fVar203;
  auVar198._8_4_ = fVar203;
  auVar198._12_4_ = fVar203;
  auVar198._16_4_ = fVar203;
  auVar198._20_4_ = fVar203;
  auVar198._24_4_ = fVar203;
  auVar198._28_4_ = fVar203;
  auVar127._16_16_ = auVar114;
  auVar127._0_16_ = auVar210;
  auVar31 = vminps_avx(auVar127,auVar198);
  auVar125 = vminps_avx(auVar125,auVar31);
  auVar40._4_4_ = auVar125._4_4_ * 1.0000004;
  auVar40._0_4_ = auVar125._0_4_ * 1.0000004;
  auVar40._8_4_ = auVar125._8_4_ * 1.0000004;
  auVar40._12_4_ = auVar125._12_4_ * 1.0000004;
  auVar40._16_4_ = auVar125._16_4_ * 1.0000004;
  auVar40._20_4_ = auVar125._20_4_ * 1.0000004;
  auVar40._24_4_ = auVar125._24_4_ * 1.0000004;
  auVar40._28_4_ = auVar125._28_4_;
  auVar125 = vcmpps_avx(local_198,auVar40,2);
  auVar114 = vpshufd_avx(ZEXT116((byte)PVar24),0);
  auVar165._16_16_ = auVar114;
  auVar165._0_16_ = auVar114;
  auVar31 = vcvtdq2ps_avx(auVar165);
  auVar31 = vcmpps_avx(_DAT_01faff40,auVar31,1);
  auVar125 = vandps_avx(auVar125,auVar31);
  uVar85 = vmovmskps_avx(auVar125);
  if (uVar85 == 0) {
    return false;
  }
  auVar128._16_16_ = mm_lookupmask_ps._240_16_;
  auVar128._0_16_ = mm_lookupmask_ps._240_16_;
  uVar85 = uVar85 & 0xff;
  local_178 = vblendps_avx(auVar128,ZEXT832(0) << 0x20,0x80);
  local_2e0 = prim;
LAB_0112d56f:
  lVar92 = 0;
  if ((ulong)uVar85 != 0) {
    for (; (uVar85 >> lVar92 & 1) == 0; lVar92 = lVar92 + 1) {
    }
  }
  local_420 = (ulong)*(uint *)(local_2e0 + 2);
  local_2e8 = (ulong)*(uint *)(local_2e0 + lVar92 * 4 + 6);
  pGVar25 = (context->scene->geometries).items[local_420].ptr;
  fVar203 = (pGVar25->time_range).lower;
  fVar203 = pGVar25->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar203) / ((pGVar25->time_range).upper - fVar203));
  auVar114 = vroundss_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),9);
  auVar114 = vminss_avx(auVar114,ZEXT416((uint)(pGVar25->fnumTimeSegments + -1.0)));
  auVar114 = vmaxss_avx(ZEXT816(0) << 0x20,auVar114);
  uVar86 = (ulong)*(uint *)(*(long *)&pGVar25->field_0x58 +
                           local_2e8 *
                           pGVar25[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var26 = pGVar25[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar89 = (long)(int)auVar114._0_4_ * 0x38;
  lVar27 = *(long *)(_Var26 + lVar89);
  lVar28 = *(long *)(_Var26 + 0x10 + lVar89);
  pfVar2 = (float *)(lVar27 + lVar28 * uVar86);
  fVar227 = *pfVar2;
  fVar201 = pfVar2[1];
  fVar220 = pfVar2[2];
  fVar202 = pfVar2[3];
  lVar92 = uVar86 + 1;
  pfVar2 = (float *)(lVar27 + lVar28 * lVar92);
  lVar1 = uVar86 + 2;
  pfVar3 = (float *)(lVar27 + lVar28 * lVar1);
  lVar93 = uVar86 + 3;
  pfVar4 = (float *)(lVar27 + lVar28 * lVar93);
  fVar373 = *pfVar4;
  fVar221 = pfVar4[1];
  fVar252 = pfVar4[2];
  fVar333 = pfVar4[3];
  lVar27 = *(long *)&pGVar25[4].fnumTimeSegments;
  lVar28 = *(long *)(lVar27 + lVar89);
  lVar29 = *(long *)(lVar27 + 0x10 + lVar89);
  pfVar4 = (float *)(lVar28 + lVar29 * uVar86);
  fVar223 = *pfVar4;
  fVar253 = pfVar4[1];
  fVar222 = pfVar4[2];
  fVar224 = pfVar4[3];
  pfVar4 = (float *)(lVar28 + lVar29 * lVar92);
  pfVar5 = (float *)(lVar28 + lVar29 * lVar1);
  fVar203 = fVar203 - auVar114._0_4_;
  pfVar6 = (float *)(lVar28 + lVar29 * lVar93);
  fVar254 = *pfVar6;
  fVar225 = pfVar6[1];
  fVar255 = pfVar6[2];
  fVar226 = pfVar6[3];
  fVar278 = *pfVar3 * 0.0;
  fVar279 = pfVar3[1] * 0.0;
  fVar280 = pfVar3[2] * 0.0;
  fVar281 = pfVar3[3] * 0.0;
  fVar256 = fVar278 + fVar373 * 0.0;
  fVar257 = fVar279 + fVar221 * 0.0;
  fVar276 = fVar280 + fVar252 * 0.0;
  fVar277 = fVar281 + fVar333 * 0.0;
  fVar343 = *pfVar2 * 0.0;
  fVar355 = pfVar2[1] * 0.0;
  fVar357 = pfVar2[2] * 0.0;
  fVar359 = pfVar2[3] * 0.0;
  local_4f8._0_4_ = fVar227 + fVar343 + fVar256;
  local_4f8._4_4_ = fVar201 + fVar355 + fVar257;
  fStack_4f0 = fVar220 + fVar357 + fVar276;
  fStack_4ec = fVar202 + fVar359 + fVar277;
  auVar97._0_4_ = *pfVar2 * 3.0 + fVar256;
  auVar97._4_4_ = pfVar2[1] * 3.0 + fVar257;
  auVar97._8_4_ = pfVar2[2] * 3.0 + fVar276;
  auVar97._12_4_ = pfVar2[3] * 3.0 + fVar277;
  auVar171._0_4_ = fVar227 * 3.0;
  auVar171._4_4_ = fVar201 * 3.0;
  auVar171._8_4_ = fVar220 * 3.0;
  auVar171._12_4_ = fVar202 * 3.0;
  auVar290 = vsubps_avx(auVar97,auVar171);
  fVar361 = *pfVar5 * 0.0;
  fVar369 = pfVar5[1] * 0.0;
  fVar370 = pfVar5[2] * 0.0;
  fVar371 = pfVar5[3] * 0.0;
  fVar256 = fVar361 + fVar254 * 0.0;
  fVar257 = fVar369 + fVar225 * 0.0;
  fVar276 = fVar370 + fVar255 * 0.0;
  fVar277 = fVar371 + fVar226 * 0.0;
  fVar372 = *pfVar4 * 0.0;
  fVar379 = pfVar4[1] * 0.0;
  fVar380 = pfVar4[2] * 0.0;
  fVar381 = pfVar4[3] * 0.0;
  auVar382._0_4_ = fVar372 + fVar256 + fVar223;
  auVar382._4_4_ = fVar379 + fVar257 + fVar253;
  auVar382._8_4_ = fVar380 + fVar276 + fVar222;
  auVar382._12_4_ = fVar381 + fVar277 + fVar224;
  auVar98._0_4_ = *pfVar4 * 3.0 + fVar256;
  auVar98._4_4_ = pfVar4[1] * 3.0 + fVar257;
  auVar98._8_4_ = pfVar4[2] * 3.0 + fVar276;
  auVar98._12_4_ = pfVar4[3] * 3.0 + fVar277;
  auVar283._0_4_ = fVar223 * 3.0;
  auVar283._4_4_ = fVar253 * 3.0;
  auVar283._8_4_ = fVar222 * 3.0;
  auVar283._12_4_ = fVar224 * 3.0;
  auVar158 = vsubps_avx(auVar98,auVar283);
  auVar205._0_4_ = fVar227 * 0.0;
  auVar205._4_4_ = fVar201 * 0.0;
  auVar205._8_4_ = fVar220 * 0.0;
  auVar205._12_4_ = fVar202 * 0.0;
  auVar284._0_4_ = auVar205._0_4_ + fVar343 + fVar278 + fVar373;
  auVar284._4_4_ = auVar205._4_4_ + fVar355 + fVar279 + fVar221;
  auVar284._8_4_ = auVar205._8_4_ + fVar357 + fVar280 + fVar252;
  auVar284._12_4_ = auVar205._12_4_ + fVar359 + fVar281 + fVar333;
  auVar291._0_4_ = fVar373 * 3.0;
  auVar291._4_4_ = fVar221 * 3.0;
  auVar291._8_4_ = fVar252 * 3.0;
  auVar291._12_4_ = fVar333 * 3.0;
  auVar229._0_4_ = *pfVar3 * 3.0;
  auVar229._4_4_ = pfVar3[1] * 3.0;
  auVar229._8_4_ = pfVar3[2] * 3.0;
  auVar229._12_4_ = pfVar3[3] * 3.0;
  auVar114 = vsubps_avx(auVar291,auVar229);
  auVar230._0_4_ = fVar343 + auVar114._0_4_;
  auVar230._4_4_ = fVar355 + auVar114._4_4_;
  auVar230._8_4_ = fVar357 + auVar114._8_4_;
  auVar230._12_4_ = fVar359 + auVar114._12_4_;
  auVar10 = vsubps_avx(auVar230,auVar205);
  auVar231._0_4_ = fVar223 * 0.0;
  auVar231._4_4_ = fVar253 * 0.0;
  auVar231._8_4_ = fVar222 * 0.0;
  auVar231._12_4_ = fVar224 * 0.0;
  auVar206._0_4_ = auVar231._0_4_ + fVar372 + fVar361 + fVar254;
  auVar206._4_4_ = auVar231._4_4_ + fVar379 + fVar369 + fVar225;
  auVar206._8_4_ = auVar231._8_4_ + fVar380 + fVar370 + fVar255;
  auVar206._12_4_ = auVar231._12_4_ + fVar381 + fVar371 + fVar226;
  auVar259._0_4_ = fVar254 * 3.0;
  auVar259._4_4_ = fVar225 * 3.0;
  auVar259._8_4_ = fVar255 * 3.0;
  auVar259._12_4_ = fVar226 * 3.0;
  auVar292._0_4_ = *pfVar5 * 3.0;
  auVar292._4_4_ = pfVar5[1] * 3.0;
  auVar292._8_4_ = pfVar5[2] * 3.0;
  auVar292._12_4_ = pfVar5[3] * 3.0;
  auVar114 = vsubps_avx(auVar259,auVar292);
  auVar260._0_4_ = fVar372 + auVar114._0_4_;
  auVar260._4_4_ = fVar379 + auVar114._4_4_;
  auVar260._8_4_ = fVar380 + auVar114._8_4_;
  auVar260._12_4_ = fVar381 + auVar114._12_4_;
  auVar184 = vsubps_avx(auVar260,auVar231);
  auVar114 = vshufps_avx(auVar290,auVar290,0xc9);
  auVar210 = vshufps_avx(auVar382,auVar382,0xc9);
  fVar256 = auVar290._0_4_;
  auVar261._0_4_ = fVar256 * auVar210._0_4_;
  fVar257 = auVar290._4_4_;
  auVar261._4_4_ = fVar257 * auVar210._4_4_;
  fVar276 = auVar290._8_4_;
  auVar261._8_4_ = fVar276 * auVar210._8_4_;
  fVar277 = auVar290._12_4_;
  auVar261._12_4_ = fVar277 * auVar210._12_4_;
  auVar304._0_4_ = auVar382._0_4_ * auVar114._0_4_;
  auVar304._4_4_ = auVar382._4_4_ * auVar114._4_4_;
  auVar304._8_4_ = auVar382._8_4_ * auVar114._8_4_;
  auVar304._12_4_ = auVar382._12_4_ * auVar114._12_4_;
  auVar210 = vsubps_avx(auVar304,auVar261);
  auVar194 = vshufps_avx(auVar210,auVar210,0xc9);
  auVar210 = vshufps_avx(auVar158,auVar158,0xc9);
  auVar305._0_4_ = auVar210._0_4_ * fVar256;
  auVar305._4_4_ = auVar210._4_4_ * fVar257;
  auVar305._8_4_ = auVar210._8_4_ * fVar276;
  auVar305._12_4_ = auVar210._12_4_ * fVar277;
  auVar99._0_4_ = auVar114._0_4_ * auVar158._0_4_;
  auVar99._4_4_ = auVar114._4_4_ * auVar158._4_4_;
  auVar99._8_4_ = auVar114._8_4_ * auVar158._8_4_;
  auVar99._12_4_ = auVar114._12_4_ * auVar158._12_4_;
  auVar114 = vsubps_avx(auVar99,auVar305);
  auVar158 = vshufps_avx(auVar114,auVar114,0xc9);
  auVar114 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar210 = vshufps_avx(auVar206,auVar206,0xc9);
  fVar372 = auVar10._0_4_;
  auVar306._0_4_ = fVar372 * auVar210._0_4_;
  fVar379 = auVar10._4_4_;
  auVar306._4_4_ = fVar379 * auVar210._4_4_;
  fVar380 = auVar10._8_4_;
  auVar306._8_4_ = fVar380 * auVar210._8_4_;
  fVar381 = auVar10._12_4_;
  auVar306._12_4_ = fVar381 * auVar210._12_4_;
  auVar207._0_4_ = auVar114._0_4_ * auVar206._0_4_;
  auVar207._4_4_ = auVar114._4_4_ * auVar206._4_4_;
  auVar207._8_4_ = auVar114._8_4_ * auVar206._8_4_;
  auVar207._12_4_ = auVar114._12_4_ * auVar206._12_4_;
  auVar210 = vsubps_avx(auVar207,auVar306);
  auVar147 = vshufps_avx(auVar210,auVar210,0xc9);
  auVar210 = vshufps_avx(auVar184,auVar184,0xc9);
  auVar307._0_4_ = fVar372 * auVar210._0_4_;
  auVar307._4_4_ = fVar379 * auVar210._4_4_;
  auVar307._8_4_ = fVar380 * auVar210._8_4_;
  auVar307._12_4_ = fVar381 * auVar210._12_4_;
  auVar232._0_4_ = auVar114._0_4_ * auVar184._0_4_;
  auVar232._4_4_ = auVar114._4_4_ * auVar184._4_4_;
  auVar232._8_4_ = auVar114._8_4_ * auVar184._8_4_;
  auVar232._12_4_ = auVar114._12_4_ * auVar184._12_4_;
  auVar114 = vdpps_avx(auVar194,auVar194,0x7f);
  auVar210 = vsubps_avx(auVar232,auVar307);
  auVar184 = vshufps_avx(auVar210,auVar210,0xc9);
  fVar201 = auVar114._0_4_;
  auVar308 = ZEXT416((uint)fVar201);
  auVar210 = vrsqrtss_avx(auVar308,auVar308);
  fVar227 = auVar210._0_4_;
  auVar210 = ZEXT416((uint)(fVar227 * 1.5 - fVar201 * 0.5 * fVar227 * fVar227 * fVar227));
  auVar148 = vshufps_avx(auVar210,auVar210,0);
  fVar254 = auVar148._0_4_ * auVar194._0_4_;
  fVar225 = auVar148._4_4_ * auVar194._4_4_;
  fVar255 = auVar148._8_4_ * auVar194._8_4_;
  fVar226 = auVar148._12_4_ * auVar194._12_4_;
  auVar210 = vdpps_avx(auVar194,auVar158,0x7f);
  auVar114 = vshufps_avx(auVar114,auVar114,0);
  auVar100._0_4_ = auVar114._0_4_ * auVar158._0_4_;
  auVar100._4_4_ = auVar114._4_4_ * auVar158._4_4_;
  auVar100._8_4_ = auVar114._8_4_ * auVar158._8_4_;
  auVar100._12_4_ = auVar114._12_4_ * auVar158._12_4_;
  auVar114 = vshufps_avx(auVar210,auVar210,0);
  auVar262._0_4_ = auVar114._0_4_ * auVar194._0_4_;
  auVar262._4_4_ = auVar114._4_4_ * auVar194._4_4_;
  auVar262._8_4_ = auVar114._8_4_ * auVar194._8_4_;
  auVar262._12_4_ = auVar114._12_4_ * auVar194._12_4_;
  auVar11 = vsubps_avx(auVar100,auVar262);
  auVar114 = vrcpss_avx(auVar308,auVar308);
  auVar114 = ZEXT416((uint)(auVar114._0_4_ * (2.0 - fVar201 * auVar114._0_4_)));
  auVar194 = vshufps_avx(auVar114,auVar114,0);
  auVar114 = vdpps_avx(auVar147,auVar147,0x7f);
  fVar278 = auVar114._0_4_;
  auVar158 = ZEXT416((uint)fVar278);
  auVar210 = vrsqrtss_avx(auVar158,auVar158);
  fVar223 = auVar210._0_4_;
  auVar210 = vdpps_avx(auVar147,auVar184,0x7f);
  auVar114 = vshufps_avx(auVar114,auVar114,0);
  auVar392._0_4_ = auVar184._0_4_ * auVar114._0_4_;
  auVar392._4_4_ = auVar184._4_4_ * auVar114._4_4_;
  auVar392._8_4_ = auVar184._8_4_ * auVar114._8_4_;
  auVar392._12_4_ = auVar184._12_4_ * auVar114._12_4_;
  lVar28 = *(long *)(_Var26 + 0x38 + lVar89);
  lVar29 = *(long *)(_Var26 + 0x48 + lVar89);
  pfVar2 = (float *)(lVar28 + lVar29 * uVar86);
  fVar227 = *pfVar2;
  fVar201 = pfVar2[1];
  fVar220 = pfVar2[2];
  fVar202 = pfVar2[3];
  pfVar2 = (float *)(lVar28 + lVar29 * lVar92);
  pfVar3 = (float *)(lVar28 + lVar29 * lVar1);
  auVar114 = vshufps_avx(auVar210,auVar210,0);
  auVar101._0_4_ = auVar147._0_4_ * auVar114._0_4_;
  auVar101._4_4_ = auVar147._4_4_ * auVar114._4_4_;
  auVar101._8_4_ = auVar147._8_4_ * auVar114._8_4_;
  auVar101._12_4_ = auVar147._12_4_ * auVar114._12_4_;
  auVar184 = vsubps_avx(auVar392,auVar101);
  pfVar4 = (float *)(lVar28 + lVar29 * lVar93);
  fVar373 = *pfVar4;
  fVar221 = pfVar4[1];
  fVar252 = pfVar4[2];
  fVar333 = pfVar4[3];
  auVar114 = ZEXT416((uint)(fVar223 * 1.5 - fVar278 * 0.5 * fVar223 * fVar223 * fVar223));
  auVar210 = vshufps_avx(auVar114,auVar114,0);
  fVar223 = auVar210._0_4_ * auVar147._0_4_;
  fVar253 = auVar210._4_4_ * auVar147._4_4_;
  fVar222 = auVar210._8_4_ * auVar147._8_4_;
  fVar224 = auVar210._12_4_ * auVar147._12_4_;
  auVar114 = vrcpss_avx(auVar158,auVar158);
  auVar114 = ZEXT416((uint)(auVar114._0_4_ * (2.0 - auVar114._0_4_ * fVar278)));
  auVar114 = vshufps_avx(auVar114,auVar114,0);
  auVar158 = vshufps_avx(_local_4f8,_local_4f8,0xff);
  auVar383._0_4_ = auVar158._0_4_ * fVar254;
  auVar383._4_4_ = auVar158._4_4_ * fVar225;
  auVar383._8_4_ = auVar158._8_4_ * fVar255;
  auVar383._12_4_ = auVar158._12_4_ * fVar226;
  auVar147 = vshufps_avx(auVar290,auVar290,0xff);
  auVar308 = vsubps_avx(_local_4f8,auVar383);
  auVar293._0_4_ =
       auVar147._0_4_ * fVar254 + auVar158._0_4_ * auVar148._0_4_ * auVar11._0_4_ * auVar194._0_4_;
  auVar293._4_4_ =
       auVar147._4_4_ * fVar225 + auVar158._4_4_ * auVar148._4_4_ * auVar11._4_4_ * auVar194._4_4_;
  auVar293._8_4_ =
       auVar147._8_4_ * fVar255 + auVar158._8_4_ * auVar148._8_4_ * auVar11._8_4_ * auVar194._8_4_;
  auVar293._12_4_ =
       auVar147._12_4_ * fVar226 +
       auVar158._12_4_ * auVar148._12_4_ * auVar11._12_4_ * auVar194._12_4_;
  auVar148 = vsubps_avx(auVar290,auVar293);
  local_4f8._0_4_ = (float)local_4f8._0_4_ + auVar383._0_4_;
  local_4f8._4_4_ = (float)local_4f8._4_4_ + auVar383._4_4_;
  fStack_4f0 = fStack_4f0 + auVar383._8_4_;
  fStack_4ec = fStack_4ec + auVar383._12_4_;
  auVar194 = vshufps_avx(auVar284,auVar284,0xff);
  auVar172._0_4_ = auVar194._0_4_ * fVar223;
  auVar172._4_4_ = auVar194._4_4_ * fVar253;
  auVar172._8_4_ = auVar194._8_4_ * fVar222;
  auVar172._12_4_ = auVar194._12_4_ * fVar224;
  auVar158 = vshufps_avx(auVar10,auVar10,0xff);
  auVar290 = vsubps_avx(auVar284,auVar172);
  auVar102._0_4_ =
       auVar158._0_4_ * fVar223 + auVar194._0_4_ * auVar210._0_4_ * auVar184._0_4_ * auVar114._0_4_;
  auVar102._4_4_ =
       auVar158._4_4_ * fVar253 + auVar194._4_4_ * auVar210._4_4_ * auVar184._4_4_ * auVar114._4_4_;
  auVar102._8_4_ =
       auVar158._8_4_ * fVar222 + auVar194._8_4_ * auVar210._8_4_ * auVar184._8_4_ * auVar114._8_4_;
  auVar102._12_4_ =
       auVar158._12_4_ * fVar224 +
       auVar194._12_4_ * auVar210._12_4_ * auVar184._12_4_ * auVar114._12_4_;
  auVar10 = vsubps_avx(auVar10,auVar102);
  local_408._4_4_ = auVar284._4_4_ + auVar172._4_4_;
  local_408._0_4_ = auVar284._0_4_ + auVar172._0_4_;
  fStack_400 = auVar284._8_4_ + auVar172._8_4_;
  fStack_3fc = auVar284._12_4_ + auVar172._12_4_;
  fVar343 = *pfVar3 * 0.0;
  fVar355 = pfVar3[1] * 0.0;
  fVar357 = pfVar3[2] * 0.0;
  fVar359 = pfVar3[3] * 0.0;
  fVar391 = fVar343 + fVar373 * 0.0;
  fVar393 = fVar355 + fVar221 * 0.0;
  fVar394 = fVar357 + fVar252 * 0.0;
  fVar395 = fVar359 + fVar333 * 0.0;
  auVar103._0_4_ = fVar391 + *pfVar2 * 3.0;
  auVar103._4_4_ = fVar393 + pfVar2[1] * 3.0;
  auVar103._8_4_ = fVar394 + pfVar2[2] * 3.0;
  auVar103._12_4_ = fVar395 + pfVar2[3] * 3.0;
  auVar173._0_4_ = fVar227 * 3.0;
  auVar173._4_4_ = fVar201 * 3.0;
  auVar173._8_4_ = fVar220 * 3.0;
  auVar173._12_4_ = fVar202 * 3.0;
  auVar11 = vsubps_avx(auVar103,auVar173);
  lVar28 = *(long *)(lVar27 + 0x38 + lVar89);
  lVar27 = *(long *)(lVar27 + 0x48 + lVar89);
  auVar114 = *(undefined1 (*) [16])(lVar28 + lVar1 * lVar27);
  pfVar4 = (float *)(lVar28 + lVar27 * lVar93);
  fVar223 = *pfVar4;
  fVar253 = pfVar4[1];
  fVar222 = pfVar4[2];
  fVar224 = pfVar4[3];
  fVar278 = auVar114._0_4_ * 0.0;
  fVar279 = auVar114._4_4_ * 0.0;
  fVar280 = auVar114._8_4_ * 0.0;
  fVar281 = auVar114._12_4_ * 0.0;
  fVar361 = fVar278 + fVar223 * 0.0;
  fVar369 = fVar279 + fVar253 * 0.0;
  fVar370 = fVar280 + fVar222 * 0.0;
  fVar371 = fVar281 + fVar224 * 0.0;
  pfVar4 = (float *)(lVar28 + lVar92 * lVar27);
  auVar384._0_4_ = *pfVar4 * 3.0 + fVar361;
  auVar384._4_4_ = pfVar4[1] * 3.0 + fVar369;
  auVar384._8_4_ = pfVar4[2] * 3.0 + fVar370;
  auVar384._12_4_ = pfVar4[3] * 3.0 + fVar371;
  pfVar5 = (float *)(lVar28 + uVar86 * lVar27);
  fVar254 = *pfVar5;
  fVar225 = pfVar5[1];
  fVar255 = pfVar5[2];
  fVar226 = pfVar5[3];
  auVar309._0_4_ = fVar254 * 3.0;
  auVar309._4_4_ = fVar225 * 3.0;
  auVar309._8_4_ = fVar255 * 3.0;
  auVar309._12_4_ = fVar226 * 3.0;
  auVar210 = vsubps_avx(auVar384,auVar309);
  auVar310._0_4_ = fVar373 * 3.0;
  auVar310._4_4_ = fVar221 * 3.0;
  auVar310._8_4_ = fVar252 * 3.0;
  auVar310._12_4_ = fVar333 * 3.0;
  auVar362._0_4_ = *pfVar3 * 3.0;
  auVar362._4_4_ = pfVar3[1] * 3.0;
  auVar362._8_4_ = pfVar3[2] * 3.0;
  auVar362._12_4_ = pfVar3[3] * 3.0;
  auVar194 = vsubps_avx(auVar310,auVar362);
  fVar344 = *pfVar2 * 0.0;
  fVar356 = pfVar2[1] * 0.0;
  fVar358 = pfVar2[2] * 0.0;
  fVar360 = pfVar2[3] * 0.0;
  auVar311._0_4_ = fVar344 + auVar194._0_4_;
  auVar311._4_4_ = fVar356 + auVar194._4_4_;
  auVar311._8_4_ = fVar358 + auVar194._8_4_;
  auVar311._12_4_ = fVar360 + auVar194._12_4_;
  auVar363._0_4_ = fVar227 + fVar344 + fVar391;
  auVar363._4_4_ = fVar201 + fVar356 + fVar393;
  auVar363._8_4_ = fVar220 + fVar358 + fVar394;
  auVar363._12_4_ = fVar202 + fVar360 + fVar395;
  auVar334._0_4_ = fVar227 * 0.0;
  auVar334._4_4_ = fVar201 * 0.0;
  auVar334._8_4_ = fVar220 * 0.0;
  auVar334._12_4_ = fVar202 * 0.0;
  local_4b8._0_4_ = auVar334._0_4_ + fVar344 + fVar373 + fVar343;
  local_4b8._4_4_ = auVar334._4_4_ + fVar356 + fVar221 + fVar355;
  fStack_4b0 = auVar334._8_4_ + fVar358 + fVar252 + fVar357;
  fStack_4ac = auVar334._12_4_ + fVar360 + fVar333 + fVar359;
  auVar12 = vsubps_avx(auVar311,auVar334);
  auVar137._0_4_ = fVar223 * 3.0;
  auVar137._4_4_ = fVar253 * 3.0;
  auVar137._8_4_ = fVar222 * 3.0;
  auVar137._12_4_ = fVar224 * 3.0;
  auVar233._0_4_ = auVar114._0_4_ * 3.0;
  auVar233._4_4_ = auVar114._4_4_ * 3.0;
  auVar233._8_4_ = auVar114._8_4_ * 3.0;
  auVar233._12_4_ = auVar114._12_4_ * 3.0;
  auVar114 = vsubps_avx(auVar137,auVar233);
  fVar227 = *pfVar4 * 0.0;
  fVar201 = pfVar4[1] * 0.0;
  fVar220 = pfVar4[2] * 0.0;
  fVar202 = pfVar4[3] * 0.0;
  auVar138._0_4_ = fVar227 + auVar114._0_4_;
  auVar138._4_4_ = fVar201 + auVar114._4_4_;
  auVar138._8_4_ = fVar220 + auVar114._8_4_;
  auVar138._12_4_ = fVar202 + auVar114._12_4_;
  auVar174._0_4_ = fVar254 + fVar227 + fVar361;
  auVar174._4_4_ = fVar225 + fVar201 + fVar369;
  auVar174._8_4_ = fVar255 + fVar220 + fVar370;
  auVar174._12_4_ = fVar226 + fVar202 + fVar371;
  auVar104._0_4_ = fVar254 * 0.0;
  auVar104._4_4_ = fVar225 * 0.0;
  auVar104._8_4_ = fVar255 * 0.0;
  auVar104._12_4_ = fVar226 * 0.0;
  auVar208._0_4_ = auVar104._0_4_ + fVar227 + fVar278 + fVar223;
  auVar208._4_4_ = auVar104._4_4_ + fVar201 + fVar279 + fVar253;
  auVar208._8_4_ = auVar104._8_4_ + fVar220 + fVar280 + fVar222;
  auVar208._12_4_ = auVar104._12_4_ + fVar202 + fVar281 + fVar224;
  auVar158 = vsubps_avx(auVar138,auVar104);
  auVar114 = vshufps_avx(auVar174,auVar174,0xc9);
  fVar333 = auVar11._0_4_;
  auVar139._0_4_ = fVar333 * auVar114._0_4_;
  fVar223 = auVar11._4_4_;
  auVar139._4_4_ = fVar223 * auVar114._4_4_;
  fVar253 = auVar11._8_4_;
  auVar139._8_4_ = fVar253 * auVar114._8_4_;
  fVar222 = auVar11._12_4_;
  auVar139._12_4_ = fVar222 * auVar114._12_4_;
  auVar114 = vshufps_avx(auVar11,auVar11,0xc9);
  auVar175._0_4_ = auVar114._0_4_ * auVar174._0_4_;
  auVar175._4_4_ = auVar114._4_4_ * auVar174._4_4_;
  auVar175._8_4_ = auVar114._8_4_ * auVar174._8_4_;
  auVar175._12_4_ = auVar114._12_4_ * auVar174._12_4_;
  auVar194 = vsubps_avx(auVar175,auVar139);
  auVar176._0_4_ = auVar210._0_4_ * auVar114._0_4_;
  auVar176._4_4_ = auVar210._4_4_ * auVar114._4_4_;
  auVar176._8_4_ = auVar210._8_4_ * auVar114._8_4_;
  auVar176._12_4_ = auVar210._12_4_ * auVar114._12_4_;
  auVar114 = vshufps_avx(auVar210,auVar210,0xc9);
  auVar234._0_4_ = fVar333 * auVar114._0_4_;
  auVar234._4_4_ = fVar223 * auVar114._4_4_;
  auVar234._8_4_ = fVar253 * auVar114._8_4_;
  auVar234._12_4_ = fVar222 * auVar114._12_4_;
  auVar147 = vsubps_avx(auVar176,auVar234);
  auVar114 = vshufps_avx(auVar208,auVar208,0xc9);
  fVar224 = auVar12._0_4_;
  auVar235._0_4_ = fVar224 * auVar114._0_4_;
  fVar254 = auVar12._4_4_;
  auVar235._4_4_ = fVar254 * auVar114._4_4_;
  fVar225 = auVar12._8_4_;
  auVar235._8_4_ = fVar225 * auVar114._8_4_;
  fVar255 = auVar12._12_4_;
  auVar235._12_4_ = fVar255 * auVar114._12_4_;
  auVar114 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar209._0_4_ = auVar114._0_4_ * auVar208._0_4_;
  auVar209._4_4_ = auVar114._4_4_ * auVar208._4_4_;
  auVar209._8_4_ = auVar114._8_4_ * auVar208._8_4_;
  auVar209._12_4_ = auVar114._12_4_ * auVar208._12_4_;
  auVar184 = vsubps_avx(auVar209,auVar235);
  auVar194 = vshufps_avx(auVar194,auVar194,0xc9);
  auVar140._0_4_ = auVar114._0_4_ * auVar158._0_4_;
  auVar140._4_4_ = auVar114._4_4_ * auVar158._4_4_;
  auVar140._8_4_ = auVar114._8_4_ * auVar158._8_4_;
  auVar140._12_4_ = auVar114._12_4_ * auVar158._12_4_;
  auVar210 = vshufps_avx(auVar158,auVar158,0xc9);
  auVar114 = vdpps_avx(auVar194,auVar194,0x7f);
  auVar105._0_4_ = fVar224 * auVar210._0_4_;
  auVar105._4_4_ = fVar254 * auVar210._4_4_;
  auVar105._8_4_ = fVar225 * auVar210._8_4_;
  auVar105._12_4_ = fVar255 * auVar210._12_4_;
  auVar13 = vsubps_avx(auVar140,auVar105);
  auVar158 = vshufps_avx(auVar147,auVar147,0xc9);
  fVar227 = auVar114._0_4_;
  auVar147 = ZEXT416((uint)fVar227);
  auVar210 = vrsqrtss_avx(auVar147,auVar147);
  fVar201 = auVar210._0_4_;
  auVar210 = vdpps_avx(auVar194,auVar158,0x7f);
  auVar114 = vshufps_avx(auVar114,auVar114,0);
  auVar106._0_4_ = auVar114._0_4_ * auVar158._0_4_;
  auVar106._4_4_ = auVar114._4_4_ * auVar158._4_4_;
  auVar106._8_4_ = auVar114._8_4_ * auVar158._8_4_;
  auVar106._12_4_ = auVar114._12_4_ * auVar158._12_4_;
  auVar114 = vshufps_avx(auVar210,auVar210,0);
  auVar263._0_4_ = auVar194._0_4_ * auVar114._0_4_;
  auVar263._4_4_ = auVar194._4_4_ * auVar114._4_4_;
  auVar263._8_4_ = auVar194._8_4_ * auVar114._8_4_;
  auVar263._12_4_ = auVar194._12_4_ * auVar114._12_4_;
  auVar14 = vsubps_avx(auVar106,auVar263);
  auVar114 = vrcpss_avx(auVar147,auVar147);
  auVar114 = ZEXT416((uint)(auVar114._0_4_ * (2.0 - fVar227 * auVar114._0_4_)));
  auVar158 = vshufps_avx(auVar114,auVar114,0);
  auVar147 = vshufps_avx(auVar184,auVar184,0xc9);
  auVar114 = ZEXT416((uint)(fVar201 * 1.5 - fVar227 * 0.5 * fVar201 * fVar201 * fVar201));
  auVar184 = vshufps_avx(auVar114,auVar114,0);
  auVar114 = vdpps_avx(auVar147,auVar147,0x7f);
  fVar373 = auVar194._0_4_ * auVar184._0_4_;
  fVar221 = auVar194._4_4_ * auVar184._4_4_;
  fVar252 = auVar194._8_4_ * auVar184._8_4_;
  fVar226 = auVar194._12_4_ * auVar184._12_4_;
  auVar194 = vshufps_avx(auVar13,auVar13,0xc9);
  fVar201 = auVar114._0_4_;
  auVar177 = ZEXT416((uint)fVar201);
  auVar210 = vrsqrtss_avx(auVar177,auVar177);
  fVar227 = auVar210._0_4_;
  auVar210 = vdpps_avx(auVar147,auVar194,0x7f);
  auVar114 = vshufps_avx(auVar114,auVar114,0);
  auVar141._0_4_ = auVar114._0_4_ * auVar194._0_4_;
  auVar141._4_4_ = auVar114._4_4_ * auVar194._4_4_;
  auVar141._8_4_ = auVar114._8_4_ * auVar194._8_4_;
  auVar141._12_4_ = auVar114._12_4_ * auVar194._12_4_;
  auVar114 = vshufps_avx(auVar210,auVar210,0);
  auVar264._0_4_ = auVar147._0_4_ * auVar114._0_4_;
  auVar264._4_4_ = auVar147._4_4_ * auVar114._4_4_;
  auVar264._8_4_ = auVar147._8_4_ * auVar114._8_4_;
  auVar264._12_4_ = auVar147._12_4_ * auVar114._12_4_;
  auVar13 = vsubps_avx(auVar141,auVar264);
  auVar114 = vrcpss_avx(auVar177,auVar177);
  auVar114 = ZEXT416((uint)(auVar114._0_4_ * (2.0 - fVar201 * auVar114._0_4_)));
  auVar114 = vshufps_avx(auVar114,auVar114,0);
  auVar210 = ZEXT416((uint)(fVar227 * 1.5 - fVar201 * 0.5 * fVar227 * fVar227 * fVar227));
  auVar210 = vshufps_avx(auVar210,auVar210,0);
  fVar227 = auVar147._0_4_ * auVar210._0_4_;
  fVar201 = auVar147._4_4_ * auVar210._4_4_;
  fVar220 = auVar147._8_4_ * auVar210._8_4_;
  fVar202 = auVar147._12_4_ * auVar210._12_4_;
  auVar194 = vshufps_avx(auVar11,auVar11,0xff);
  auVar147 = vshufps_avx(auVar363,auVar363,0xff);
  auVar236._0_4_ = fVar373 * auVar147._0_4_;
  auVar236._4_4_ = fVar221 * auVar147._4_4_;
  auVar236._8_4_ = fVar252 * auVar147._8_4_;
  auVar236._12_4_ = fVar226 * auVar147._12_4_;
  auVar178._0_4_ =
       fVar373 * auVar194._0_4_ + auVar184._0_4_ * auVar14._0_4_ * auVar158._0_4_ * auVar147._0_4_;
  auVar178._4_4_ =
       fVar221 * auVar194._4_4_ + auVar184._4_4_ * auVar14._4_4_ * auVar158._4_4_ * auVar147._4_4_;
  auVar178._8_4_ =
       fVar252 * auVar194._8_4_ + auVar184._8_4_ * auVar14._8_4_ * auVar158._8_4_ * auVar147._8_4_;
  auVar178._12_4_ =
       fVar226 * auVar194._12_4_ +
       auVar184._12_4_ * auVar14._12_4_ * auVar158._12_4_ * auVar147._12_4_;
  auVar147 = vsubps_avx(auVar363,auVar236);
  auVar184 = vsubps_avx(auVar11,auVar178);
  auVar194 = vshufps_avx(auVar12,auVar12,0xff);
  auVar158 = vshufps_avx(_local_4b8,_local_4b8,0xff);
  auVar107._0_4_ = auVar158._0_4_ * fVar227;
  auVar107._4_4_ = auVar158._4_4_ * fVar201;
  auVar107._8_4_ = auVar158._8_4_ * fVar220;
  auVar107._12_4_ = auVar158._12_4_ * fVar202;
  auVar142._0_4_ =
       auVar194._0_4_ * fVar227 + auVar158._0_4_ * auVar210._0_4_ * auVar13._0_4_ * auVar114._0_4_;
  auVar142._4_4_ =
       auVar194._4_4_ * fVar201 + auVar158._4_4_ * auVar210._4_4_ * auVar13._4_4_ * auVar114._4_4_;
  auVar142._8_4_ =
       auVar194._8_4_ * fVar220 + auVar158._8_4_ * auVar210._8_4_ * auVar13._8_4_ * auVar114._8_4_;
  auVar142._12_4_ =
       auVar194._12_4_ * fVar202 +
       auVar158._12_4_ * auVar210._12_4_ * auVar13._12_4_ * auVar114._12_4_;
  auVar194 = vsubps_avx(_local_4b8,auVar107);
  local_4b8._0_4_ = (float)local_4b8._0_4_ + auVar107._0_4_;
  local_4b8._4_4_ = (float)local_4b8._4_4_ + auVar107._4_4_;
  fStack_4b0 = fStack_4b0 + auVar107._8_4_;
  fStack_4ac = fStack_4ac + auVar107._12_4_;
  auVar158 = vsubps_avx(auVar12,auVar142);
  local_308._0_4_ = auVar148._0_4_;
  local_308._4_4_ = auVar148._4_4_;
  fStack_300 = auVar148._8_4_;
  fStack_2fc = auVar148._12_4_;
  local_498._0_4_ = auVar308._0_4_;
  local_498._4_4_ = auVar308._4_4_;
  fStack_490 = auVar308._8_4_;
  fStack_48c = auVar308._12_4_;
  auVar114 = vshufps_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),0);
  auVar210 = vshufps_avx(ZEXT416((uint)(1.0 - fVar203)),ZEXT416((uint)(1.0 - fVar203)),0);
  fVar202 = auVar114._0_4_;
  fVar373 = auVar114._4_4_;
  fVar221 = auVar114._8_4_;
  fVar252 = auVar114._12_4_;
  fVar203 = auVar210._0_4_;
  fVar227 = auVar210._4_4_;
  fVar201 = auVar210._8_4_;
  fVar220 = auVar210._12_4_;
  local_388._0_4_ = fVar203 * (float)local_498._0_4_ + fVar202 * auVar147._0_4_;
  local_388._4_4_ = fVar227 * (float)local_498._4_4_ + fVar373 * auVar147._4_4_;
  fStack_380 = fVar201 * fStack_490 + fVar221 * auVar147._8_4_;
  fStack_37c = fVar220 * fStack_48c + fVar252 * auVar147._12_4_;
  local_398._0_4_ =
       fVar203 * ((float)local_498._0_4_ + (float)local_308._0_4_ * 0.33333334) +
       fVar202 * (auVar147._0_4_ + auVar184._0_4_ * 0.33333334);
  local_398._4_4_ =
       fVar227 * ((float)local_498._4_4_ + (float)local_308._4_4_ * 0.33333334) +
       fVar373 * (auVar147._4_4_ + auVar184._4_4_ * 0.33333334);
  fStack_390 = fVar201 * (fStack_490 + fStack_300 * 0.33333334) +
               fVar221 * (auVar147._8_4_ + auVar184._8_4_ * 0.33333334);
  fStack_38c = fVar220 * (fStack_48c + fStack_2fc * 0.33333334) +
               fVar252 * (auVar147._12_4_ + auVar184._12_4_ * 0.33333334);
  local_478._0_4_ = auVar10._0_4_;
  local_478._4_4_ = auVar10._4_4_;
  fStack_470 = auVar10._8_4_;
  fStack_46c = auVar10._12_4_;
  auVar211._0_4_ = (float)local_478._0_4_ * 0.33333334;
  auVar211._4_4_ = (float)local_478._4_4_ * 0.33333334;
  auVar211._8_4_ = fStack_470 * 0.33333334;
  auVar211._12_4_ = fStack_46c * 0.33333334;
  auVar114 = vsubps_avx(auVar290,auVar211);
  auVar265._0_4_ = (fVar372 + auVar102._0_4_) * 0.33333334;
  auVar265._4_4_ = (fVar379 + auVar102._4_4_) * 0.33333334;
  auVar265._8_4_ = (fVar380 + auVar102._8_4_) * 0.33333334;
  auVar265._12_4_ = (fVar381 + auVar102._12_4_) * 0.33333334;
  auVar210 = vsubps_avx(_local_408,auVar265);
  auVar179._0_4_ = auVar158._0_4_ * 0.33333334;
  auVar179._4_4_ = auVar158._4_4_ * 0.33333334;
  auVar179._8_4_ = auVar158._8_4_ * 0.33333334;
  auVar179._12_4_ = auVar158._12_4_ * 0.33333334;
  auVar158 = vsubps_avx(auVar194,auVar179);
  auVar143._0_4_ = (fVar224 + auVar142._0_4_) * 0.33333334;
  auVar143._4_4_ = (fVar254 + auVar142._4_4_) * 0.33333334;
  auVar143._8_4_ = (fVar225 + auVar142._8_4_) * 0.33333334;
  auVar143._12_4_ = (fVar255 + auVar142._12_4_) * 0.33333334;
  auVar147 = vsubps_avx(_local_4b8,auVar143);
  local_3a8._0_4_ = fVar203 * auVar114._0_4_ + fVar202 * auVar158._0_4_;
  local_3a8._4_4_ = fVar227 * auVar114._4_4_ + fVar373 * auVar158._4_4_;
  fStack_3a0 = fVar201 * auVar114._8_4_ + fVar221 * auVar158._8_4_;
  fStack_39c = fVar220 * auVar114._12_4_ + fVar252 * auVar158._12_4_;
  local_3b8._0_4_ = fVar202 * auVar194._0_4_ + auVar290._0_4_ * fVar203;
  local_3b8._4_4_ = fVar373 * auVar194._4_4_ + auVar290._4_4_ * fVar227;
  fStack_3b0 = fVar221 * auVar194._8_4_ + auVar290._8_4_ * fVar201;
  fStack_3ac = fVar252 * auVar194._12_4_ + auVar290._12_4_ * fVar220;
  local_3c8._0_4_ = fVar203 * (float)local_4f8._0_4_ + fVar202 * (auVar363._0_4_ + auVar236._0_4_);
  local_3c8._4_4_ = fVar227 * (float)local_4f8._4_4_ + fVar373 * (auVar363._4_4_ + auVar236._4_4_);
  fStack_3c0 = fVar201 * fStack_4f0 + fVar221 * (auVar363._8_4_ + auVar236._8_4_);
  fStack_3bc = fVar220 * fStack_4ec + fVar252 * (auVar363._12_4_ + auVar236._12_4_);
  local_3d8._0_4_ =
       fVar203 * ((float)local_4f8._0_4_ + (fVar256 + auVar293._0_4_) * 0.33333334) +
       fVar202 * (auVar363._0_4_ + auVar236._0_4_ + (fVar333 + auVar178._0_4_) * 0.33333334);
  local_3d8._4_4_ =
       fVar227 * ((float)local_4f8._4_4_ + (fVar257 + auVar293._4_4_) * 0.33333334) +
       fVar373 * (auVar363._4_4_ + auVar236._4_4_ + (fVar223 + auVar178._4_4_) * 0.33333334);
  fStack_3d0 = fVar201 * (fStack_4f0 + (fVar276 + auVar293._8_4_) * 0.33333334) +
               fVar221 * (auVar363._8_4_ + auVar236._8_4_ + (fVar253 + auVar178._8_4_) * 0.33333334)
  ;
  fStack_3cc = fVar220 * (fStack_4ec + (fVar277 + auVar293._12_4_) * 0.33333334) +
               fVar252 * (auVar363._12_4_ + auVar236._12_4_ +
                         (fVar222 + auVar178._12_4_) * 0.33333334);
  local_3e8 = fVar203 * auVar210._0_4_ + fVar202 * auVar147._0_4_;
  fStack_3e4 = fVar227 * auVar210._4_4_ + fVar373 * auVar147._4_4_;
  fStack_3e0 = fVar201 * auVar210._8_4_ + fVar221 * auVar147._8_4_;
  fStack_3dc = fVar220 * auVar210._12_4_ + fVar252 * auVar147._12_4_;
  local_418 = (auVar284._0_4_ + auVar172._0_4_) * fVar203 + fVar202 * (float)local_4b8._0_4_;
  fStack_414 = (auVar284._4_4_ + auVar172._4_4_) * fVar227 + fVar373 * (float)local_4b8._4_4_;
  fStack_410 = (auVar284._8_4_ + auVar172._8_4_) * fVar201 + fVar221 * fStack_4b0;
  fStack_40c = (auVar284._12_4_ + auVar172._12_4_) * fVar220 + fVar252 * fStack_4ac;
  aVar9 = (ray->org).field_0;
  auVar194 = vsubps_avx(_local_388,(undefined1  [16])aVar9);
  auVar210 = vmovsldup_avx(auVar194);
  auVar114 = vmovshdup_avx(auVar194);
  auVar194 = vshufps_avx(auVar194,auVar194,0xaa);
  fVar203 = (pre->ray_space).vx.field_0.m128[0];
  fVar227 = (pre->ray_space).vx.field_0.m128[1];
  fVar201 = (pre->ray_space).vx.field_0.m128[2];
  fVar220 = (pre->ray_space).vx.field_0.m128[3];
  fVar202 = (pre->ray_space).vy.field_0.m128[0];
  fVar373 = (pre->ray_space).vy.field_0.m128[1];
  fVar221 = (pre->ray_space).vy.field_0.m128[2];
  fVar252 = (pre->ray_space).vy.field_0.m128[3];
  fVar333 = (pre->ray_space).vz.field_0.m128[0];
  fVar223 = (pre->ray_space).vz.field_0.m128[1];
  fVar253 = (pre->ray_space).vz.field_0.m128[2];
  fVar222 = (pre->ray_space).vz.field_0.m128[3];
  local_4e8._4_4_ = fVar227 * auVar210._4_4_ + fVar373 * auVar114._4_4_ + fVar223 * auVar194._4_4_;
  local_4e8._0_4_ = fVar203 * auVar210._0_4_ + fVar202 * auVar114._0_4_ + fVar333 * auVar194._0_4_;
  fStack_4e0 = fVar201 * auVar210._8_4_ + fVar221 * auVar114._8_4_ + fVar253 * auVar194._8_4_;
  fStack_4dc = fVar220 * auVar210._12_4_ + fVar252 * auVar114._12_4_ + fVar222 * auVar194._12_4_;
  auVar194 = vsubps_avx(_local_398,(undefined1  [16])aVar9);
  auVar210 = vmovsldup_avx(auVar194);
  auVar114 = vmovshdup_avx(auVar194);
  auVar194 = vshufps_avx(auVar194,auVar194,0xaa);
  auVar374._0_8_ =
       CONCAT44(fVar227 * auVar210._4_4_ + fVar373 * auVar114._4_4_ + fVar223 * auVar194._4_4_,
                fVar203 * auVar210._0_4_ + fVar202 * auVar114._0_4_ + fVar333 * auVar194._0_4_);
  auVar374._8_4_ = fVar201 * auVar210._8_4_ + fVar221 * auVar114._8_4_ + fVar253 * auVar194._8_4_;
  auVar374._12_4_ =
       fVar220 * auVar210._12_4_ + fVar252 * auVar114._12_4_ + fVar222 * auVar194._12_4_;
  auVar210 = vsubps_avx(_local_3a8,(undefined1  [16])aVar9);
  auVar194 = vshufps_avx(auVar210,auVar210,0xaa);
  auVar114 = vmovshdup_avx(auVar210);
  auVar210 = vmovsldup_avx(auVar210);
  auVar144._0_8_ =
       CONCAT44(fVar227 * auVar210._4_4_ + auVar114._4_4_ * fVar373 + fVar223 * auVar194._4_4_,
                fVar203 * auVar210._0_4_ + auVar114._0_4_ * fVar202 + fVar333 * auVar194._0_4_);
  auVar144._8_4_ = fVar201 * auVar210._8_4_ + auVar114._8_4_ * fVar221 + fVar253 * auVar194._8_4_;
  auVar144._12_4_ =
       fVar220 * auVar210._12_4_ + auVar114._12_4_ * fVar252 + fVar222 * auVar194._12_4_;
  auVar210 = vsubps_avx(_local_3b8,(undefined1  [16])aVar9);
  auVar194 = vshufps_avx(auVar210,auVar210,0xaa);
  auVar114 = vmovshdup_avx(auVar210);
  auVar210 = vmovsldup_avx(auVar210);
  auVar294._0_8_ =
       CONCAT44(auVar114._4_4_ * fVar373 + auVar194._4_4_ * fVar223 + fVar227 * auVar210._4_4_,
                auVar114._0_4_ * fVar202 + auVar194._0_4_ * fVar333 + fVar203 * auVar210._0_4_);
  auVar294._8_4_ = auVar114._8_4_ * fVar221 + auVar194._8_4_ * fVar253 + fVar201 * auVar210._8_4_;
  auVar294._12_4_ =
       auVar114._12_4_ * fVar252 + auVar194._12_4_ * fVar222 + fVar220 * auVar210._12_4_;
  auVar210 = vsubps_avx(_local_3c8,(undefined1  [16])aVar9);
  auVar194 = vshufps_avx(auVar210,auVar210,0xaa);
  auVar114 = vmovshdup_avx(auVar210);
  auVar210 = vmovsldup_avx(auVar210);
  auVar312._0_8_ =
       CONCAT44(auVar210._4_4_ * fVar227 + auVar114._4_4_ * fVar373 + auVar194._4_4_ * fVar223,
                auVar210._0_4_ * fVar203 + auVar114._0_4_ * fVar202 + auVar194._0_4_ * fVar333);
  auVar312._8_4_ = auVar210._8_4_ * fVar201 + auVar114._8_4_ * fVar221 + auVar194._8_4_ * fVar253;
  auVar312._12_4_ =
       auVar210._12_4_ * fVar220 + auVar114._12_4_ * fVar252 + auVar194._12_4_ * fVar222;
  auVar210 = vsubps_avx(_local_3d8,(undefined1  [16])aVar9);
  auVar194 = vshufps_avx(auVar210,auVar210,0xaa);
  auVar114 = vmovshdup_avx(auVar210);
  auVar210 = vmovsldup_avx(auVar210);
  auVar321._0_8_ =
       CONCAT44(auVar210._4_4_ * fVar227 + auVar114._4_4_ * fVar373 + auVar194._4_4_ * fVar223,
                auVar210._0_4_ * fVar203 + auVar114._0_4_ * fVar202 + auVar194._0_4_ * fVar333);
  auVar321._8_4_ = auVar210._8_4_ * fVar201 + auVar114._8_4_ * fVar221 + auVar194._8_4_ * fVar253;
  auVar321._12_4_ =
       auVar210._12_4_ * fVar220 + auVar114._12_4_ * fVar252 + auVar194._12_4_ * fVar222;
  auVar82._4_4_ = fStack_3e4;
  auVar82._0_4_ = local_3e8;
  auVar82._8_4_ = fStack_3e0;
  auVar82._12_4_ = fStack_3dc;
  auVar210 = vsubps_avx(auVar82,(undefined1  [16])aVar9);
  auVar194 = vshufps_avx(auVar210,auVar210,0xaa);
  auVar114 = vmovshdup_avx(auVar210);
  auVar210 = vmovsldup_avx(auVar210);
  auVar335._0_8_ =
       CONCAT44(auVar210._4_4_ * fVar227 + auVar114._4_4_ * fVar373 + auVar194._4_4_ * fVar223,
                auVar210._0_4_ * fVar203 + auVar114._0_4_ * fVar202 + auVar194._0_4_ * fVar333);
  auVar335._8_4_ = auVar210._8_4_ * fVar201 + auVar114._8_4_ * fVar221 + auVar194._8_4_ * fVar253;
  auVar335._12_4_ =
       auVar210._12_4_ * fVar220 + auVar114._12_4_ * fVar252 + auVar194._12_4_ * fVar222;
  auVar79._4_4_ = fStack_414;
  auVar79._0_4_ = local_418;
  auVar79._8_4_ = fStack_410;
  auVar79._12_4_ = fStack_40c;
  auVar210 = vsubps_avx(auVar79,(undefined1  [16])aVar9);
  auVar194 = vshufps_avx(auVar210,auVar210,0xaa);
  auVar114 = vmovshdup_avx(auVar210);
  auVar210 = vmovsldup_avx(auVar210);
  auVar108._0_8_ =
       CONCAT44(fVar227 * auVar210._4_4_ + auVar114._4_4_ * fVar373 + auVar194._4_4_ * fVar223,
                fVar203 * auVar210._0_4_ + auVar114._0_4_ * fVar202 + auVar194._0_4_ * fVar333);
  auVar108._8_4_ = fVar201 * auVar210._8_4_ + auVar114._8_4_ * fVar221 + auVar194._8_4_ * fVar253;
  auVar108._12_4_ =
       fVar220 * auVar210._12_4_ + auVar114._12_4_ * fVar252 + auVar194._12_4_ * fVar222;
  _local_458 = vmovlhps_avx(_local_4e8,auVar312);
  _local_468 = vmovlhps_avx(auVar374,auVar321);
  _local_478 = vmovlhps_avx(auVar144,auVar335);
  _local_2a8 = vmovlhps_avx(auVar294,auVar108);
  auVar114 = vminps_avx(_local_458,_local_468);
  auVar210 = vminps_avx(_local_478,_local_2a8);
  auVar194 = vminps_avx(auVar114,auVar210);
  auVar114 = vmaxps_avx(_local_458,_local_468);
  auVar210 = vmaxps_avx(_local_478,_local_2a8);
  auVar114 = vmaxps_avx(auVar114,auVar210);
  auVar210 = vshufpd_avx(auVar194,auVar194,3);
  auVar194 = vminps_avx(auVar194,auVar210);
  auVar210 = vshufpd_avx(auVar114,auVar114,3);
  auVar210 = vmaxps_avx(auVar114,auVar210);
  auVar285._8_4_ = 0x7fffffff;
  auVar285._0_8_ = 0x7fffffff7fffffff;
  auVar285._12_4_ = 0x7fffffff;
  auVar114 = vandps_avx(auVar194,auVar285);
  auVar210 = vandps_avx(auVar210,auVar285);
  auVar114 = vmaxps_avx(auVar114,auVar210);
  auVar210 = vmovshdup_avx(auVar114);
  auVar114 = vmaxss_avx(auVar210,auVar114);
  auVar94 = (undefined1  [8])((ulong)uVar85 + 0xff);
  fVar203 = auVar114._0_4_ * 9.536743e-07;
  register0x00001348 = local_4e8;
  local_4c8 = local_4e8;
  local_378._8_8_ = auVar374._0_8_;
  local_378._0_8_ = auVar374._0_8_;
  register0x00001388 = auVar144._0_8_;
  local_318 = auVar144._0_8_;
  register0x000013c8 = auVar294._0_8_;
  local_328 = auVar294._0_8_;
  register0x00001408 = auVar312._0_8_;
  local_338 = auVar312._0_8_;
  register0x00001448 = auVar321._0_8_;
  local_348 = auVar321._0_8_;
  register0x00001488 = auVar335._0_8_;
  local_358 = auVar335._0_8_;
  register0x00001588 = auVar108._0_8_;
  local_368 = auVar108._0_8_;
  auVar114 = vshufps_avx(ZEXT416((uint)fVar203),ZEXT416((uint)fVar203),0);
  local_1d8._16_16_ = auVar114;
  local_1d8._0_16_ = auVar114;
  auVar109._0_8_ = auVar114._0_8_ ^ 0x8000000080000000;
  auVar109._8_4_ = auVar114._8_4_ ^ 0x80000000;
  auVar109._12_4_ = auVar114._12_4_ ^ 0x80000000;
  local_78._16_16_ = auVar109;
  local_78._0_16_ = auVar109;
  bVar90 = false;
  uVar86 = 0;
  _local_1e8 = vsubps_avx(_local_468,_local_458);
  _local_1f8 = vsubps_avx(_local_478,_local_468);
  _local_208 = vsubps_avx(_local_2a8,_local_478);
  _local_228 = vsubps_avx(_local_3c8,_local_388);
  _local_238 = vsubps_avx(_local_3d8,_local_398);
  _local_248 = vsubps_avx(auVar82,_local_3a8);
  auVar80._4_4_ = fStack_414;
  auVar80._0_4_ = local_418;
  auVar80._8_4_ = fStack_410;
  auVar80._12_4_ = fStack_40c;
  _local_258 = vsubps_avx(auVar80,_local_3b8);
  auVar110 = ZEXT816(0x3f80000000000000);
  local_218 = auVar110;
LAB_0112e0de:
  do {
    auVar114 = vshufps_avx(auVar110,auVar110,0x50);
    auVar385._8_4_ = 0x3f800000;
    auVar385._0_8_ = 0x3f8000003f800000;
    auVar385._12_4_ = 0x3f800000;
    auVar390._16_4_ = 0x3f800000;
    auVar390._0_16_ = auVar385;
    auVar390._20_4_ = 0x3f800000;
    auVar390._24_4_ = 0x3f800000;
    auVar390._28_4_ = 0x3f800000;
    auVar210 = vsubps_avx(auVar385,auVar114);
    fVar227 = auVar114._0_4_;
    fVar201 = auVar114._4_4_;
    fVar220 = auVar114._8_4_;
    fVar202 = auVar114._12_4_;
    fVar373 = auVar210._0_4_;
    fVar221 = auVar210._4_4_;
    fVar252 = auVar210._8_4_;
    fVar333 = auVar210._12_4_;
    auVar212._0_4_ = local_338._0_4_ * fVar227 + fVar373 * local_4c8._0_4_;
    auVar212._4_4_ = local_338._4_4_ * fVar201 + fVar221 * local_4c8._4_4_;
    auVar212._8_4_ = local_338._8_4_ * fVar220 + fVar252 * local_4c8._8_4_;
    auVar212._12_4_ = local_338._12_4_ * fVar202 + fVar333 * local_4c8._12_4_;
    auVar180._0_4_ = local_348._0_4_ * fVar227 + local_378._0_4_ * fVar373;
    auVar180._4_4_ = local_348._4_4_ * fVar201 + local_378._4_4_ * fVar221;
    auVar180._8_4_ = local_348._8_4_ * fVar220 + local_378._8_4_ * fVar252;
    auVar180._12_4_ = local_348._12_4_ * fVar202 + local_378._12_4_ * fVar333;
    auVar295._0_4_ = local_358._0_4_ * fVar227 + fVar373 * local_318._0_4_;
    auVar295._4_4_ = local_358._4_4_ * fVar201 + fVar221 * local_318._4_4_;
    auVar295._8_4_ = local_358._8_4_ * fVar220 + fVar252 * local_318._8_4_;
    auVar295._12_4_ = local_358._12_4_ * fVar202 + fVar333 * local_318._12_4_;
    auVar237._0_4_ = local_368._0_4_ * fVar227 + local_328._0_4_ * fVar373;
    auVar237._4_4_ = local_368._4_4_ * fVar201 + local_328._4_4_ * fVar221;
    auVar237._8_4_ = local_368._8_4_ * fVar220 + local_328._8_4_ * fVar252;
    auVar237._12_4_ = local_368._12_4_ * fVar202 + local_328._12_4_ * fVar333;
    auVar114 = vmovshdup_avx(local_218);
    auVar210 = vshufps_avx(local_218,local_218,0);
    auVar331._16_16_ = auVar210;
    auVar331._0_16_ = auVar210;
    auVar194 = vshufps_avx(local_218,local_218,0x55);
    auVar129._16_16_ = auVar194;
    auVar129._0_16_ = auVar194;
    auVar125 = vsubps_avx(auVar129,auVar331);
    auVar194 = vshufps_avx(auVar212,auVar212,0);
    auVar158 = vshufps_avx(auVar212,auVar212,0x55);
    auVar147 = vshufps_avx(auVar180,auVar180,0);
    auVar184 = vshufps_avx(auVar180,auVar180,0x55);
    auVar148 = vshufps_avx(auVar295,auVar295,0);
    auVar290 = vshufps_avx(auVar295,auVar295,0x55);
    auVar10 = vshufps_avx(auVar237,auVar237,0);
    auVar11 = vshufps_avx(auVar237,auVar237,0x55);
    auVar114 = ZEXT416((uint)((auVar114._0_4_ - local_218._0_4_) * 0.04761905));
    auVar114 = vshufps_avx(auVar114,auVar114,0);
    auVar342._0_4_ = auVar210._0_4_ + auVar125._0_4_ * 0.0;
    auVar342._4_4_ = auVar210._4_4_ + auVar125._4_4_ * 0.14285715;
    auVar342._8_4_ = auVar210._8_4_ + auVar125._8_4_ * 0.2857143;
    auVar342._12_4_ = auVar210._12_4_ + auVar125._12_4_ * 0.42857146;
    auVar342._16_4_ = auVar210._0_4_ + auVar125._16_4_ * 0.5714286;
    auVar342._20_4_ = auVar210._4_4_ + auVar125._20_4_ * 0.71428573;
    auVar342._24_4_ = auVar210._8_4_ + auVar125._24_4_ * 0.8571429;
    auVar342._28_4_ = auVar210._12_4_ + auVar125._28_4_;
    auVar32 = vsubps_avx(auVar390,auVar342);
    fVar227 = auVar147._0_4_;
    fVar220 = auVar147._4_4_;
    fVar373 = auVar147._8_4_;
    fVar252 = auVar147._12_4_;
    fVar361 = auVar32._0_4_;
    fVar369 = auVar32._4_4_;
    fVar370 = auVar32._8_4_;
    fVar371 = auVar32._12_4_;
    fVar372 = auVar32._16_4_;
    fVar379 = auVar32._20_4_;
    fVar380 = auVar32._24_4_;
    fVar278 = auVar184._0_4_;
    fVar280 = auVar184._4_4_;
    fVar343 = auVar184._8_4_;
    fVar357 = auVar184._12_4_;
    fVar360 = auVar158._12_4_ + 1.0;
    fVar256 = auVar148._0_4_;
    fVar257 = auVar148._4_4_;
    fVar276 = auVar148._8_4_;
    fVar277 = auVar148._12_4_;
    fVar223 = fVar256 * auVar342._0_4_ + fVar361 * fVar227;
    fVar253 = fVar257 * auVar342._4_4_ + fVar369 * fVar220;
    fVar222 = fVar276 * auVar342._8_4_ + fVar370 * fVar373;
    fVar224 = fVar277 * auVar342._12_4_ + fVar371 * fVar252;
    fVar254 = fVar256 * auVar342._16_4_ + fVar372 * fVar227;
    fVar225 = fVar257 * auVar342._20_4_ + fVar379 * fVar220;
    fVar255 = fVar276 * auVar342._24_4_ + fVar380 * fVar373;
    fVar201 = auVar290._0_4_;
    fVar202 = auVar290._4_4_;
    fVar221 = auVar290._8_4_;
    fVar333 = auVar290._12_4_;
    fVar279 = fVar278 * fVar361 + auVar342._0_4_ * fVar201;
    fVar281 = fVar280 * fVar369 + auVar342._4_4_ * fVar202;
    fVar355 = fVar343 * fVar370 + auVar342._8_4_ * fVar221;
    fVar359 = fVar357 * fVar371 + auVar342._12_4_ * fVar333;
    fVar381 = fVar278 * fVar372 + auVar342._16_4_ * fVar201;
    fVar344 = fVar280 * fVar379 + auVar342._20_4_ * fVar202;
    fVar356 = fVar343 * fVar380 + auVar342._24_4_ * fVar221;
    fVar358 = fVar357 + fVar252;
    auVar210 = vshufps_avx(auVar212,auVar212,0xaa);
    auVar147 = vshufps_avx(auVar212,auVar212,0xff);
    fVar226 = fVar277 + 0.0;
    auVar184 = vshufps_avx(auVar180,auVar180,0xaa);
    auVar148 = vshufps_avx(auVar180,auVar180,0xff);
    auVar250._0_4_ =
         fVar361 * (auVar342._0_4_ * fVar227 + fVar361 * auVar194._0_4_) + auVar342._0_4_ * fVar223;
    auVar250._4_4_ =
         fVar369 * (auVar342._4_4_ * fVar220 + fVar369 * auVar194._4_4_) + auVar342._4_4_ * fVar253;
    auVar250._8_4_ =
         fVar370 * (auVar342._8_4_ * fVar373 + fVar370 * auVar194._8_4_) + auVar342._8_4_ * fVar222;
    auVar250._12_4_ =
         fVar371 * (auVar342._12_4_ * fVar252 + fVar371 * auVar194._12_4_) +
         auVar342._12_4_ * fVar224;
    auVar250._16_4_ =
         fVar372 * (auVar342._16_4_ * fVar227 + fVar372 * auVar194._0_4_) +
         auVar342._16_4_ * fVar254;
    auVar250._20_4_ =
         fVar379 * (auVar342._20_4_ * fVar220 + fVar379 * auVar194._4_4_) +
         auVar342._20_4_ * fVar225;
    auVar250._24_4_ =
         fVar380 * (auVar342._24_4_ * fVar373 + fVar380 * auVar194._8_4_) +
         auVar342._24_4_ * fVar255;
    auVar250._28_4_ = auVar194._12_4_ + 1.0 + fVar333;
    auVar274._0_4_ =
         fVar361 * (fVar278 * auVar342._0_4_ + auVar158._0_4_ * fVar361) + auVar342._0_4_ * fVar279;
    auVar274._4_4_ =
         fVar369 * (fVar280 * auVar342._4_4_ + auVar158._4_4_ * fVar369) + auVar342._4_4_ * fVar281;
    auVar274._8_4_ =
         fVar370 * (fVar343 * auVar342._8_4_ + auVar158._8_4_ * fVar370) + auVar342._8_4_ * fVar355;
    auVar274._12_4_ =
         fVar371 * (fVar357 * auVar342._12_4_ + auVar158._12_4_ * fVar371) +
         auVar342._12_4_ * fVar359;
    auVar274._16_4_ =
         fVar372 * (fVar278 * auVar342._16_4_ + auVar158._0_4_ * fVar372) +
         auVar342._16_4_ * fVar381;
    auVar274._20_4_ =
         fVar379 * (fVar280 * auVar342._20_4_ + auVar158._4_4_ * fVar379) +
         auVar342._20_4_ * fVar344;
    auVar274._24_4_ =
         fVar380 * (fVar343 * auVar342._24_4_ + auVar158._8_4_ * fVar380) +
         auVar342._24_4_ * fVar356;
    auVar274._28_4_ = auVar11._12_4_ + fVar333;
    auVar130._0_4_ =
         fVar361 * fVar223 + auVar342._0_4_ * (fVar256 * fVar361 + auVar10._0_4_ * auVar342._0_4_);
    auVar130._4_4_ =
         fVar369 * fVar253 + auVar342._4_4_ * (fVar257 * fVar369 + auVar10._4_4_ * auVar342._4_4_);
    auVar130._8_4_ =
         fVar370 * fVar222 + auVar342._8_4_ * (fVar276 * fVar370 + auVar10._8_4_ * auVar342._8_4_);
    auVar130._12_4_ =
         fVar371 * fVar224 +
         auVar342._12_4_ * (fVar277 * fVar371 + auVar10._12_4_ * auVar342._12_4_);
    auVar130._16_4_ =
         fVar372 * fVar254 + auVar342._16_4_ * (fVar256 * fVar372 + auVar10._0_4_ * auVar342._16_4_)
    ;
    auVar130._20_4_ =
         fVar379 * fVar225 + auVar342._20_4_ * (fVar257 * fVar379 + auVar10._4_4_ * auVar342._20_4_)
    ;
    auVar130._24_4_ =
         fVar380 * fVar255 + auVar342._24_4_ * (fVar276 * fVar380 + auVar10._8_4_ * auVar342._24_4_)
    ;
    auVar130._28_4_ = fVar252 + 1.0 + fVar226;
    auVar354._0_4_ =
         fVar361 * fVar279 + auVar342._0_4_ * (auVar11._0_4_ * auVar342._0_4_ + fVar361 * fVar201);
    auVar354._4_4_ =
         fVar369 * fVar281 + auVar342._4_4_ * (auVar11._4_4_ * auVar342._4_4_ + fVar369 * fVar202);
    auVar354._8_4_ =
         fVar370 * fVar355 + auVar342._8_4_ * (auVar11._8_4_ * auVar342._8_4_ + fVar370 * fVar221);
    auVar354._12_4_ =
         fVar371 * fVar359 +
         auVar342._12_4_ * (auVar11._12_4_ * auVar342._12_4_ + fVar371 * fVar333);
    auVar354._16_4_ =
         fVar372 * fVar381 + auVar342._16_4_ * (auVar11._0_4_ * auVar342._16_4_ + fVar372 * fVar201)
    ;
    auVar354._20_4_ =
         fVar379 * fVar344 + auVar342._20_4_ * (auVar11._4_4_ * auVar342._20_4_ + fVar379 * fVar202)
    ;
    auVar354._24_4_ =
         fVar380 * fVar356 + auVar342._24_4_ * (auVar11._8_4_ * auVar342._24_4_ + fVar380 * fVar221)
    ;
    auVar354._28_4_ = fVar226 + fVar333 + 0.0;
    local_b8._0_4_ = fVar361 * auVar250._0_4_ + auVar342._0_4_ * auVar130._0_4_;
    local_b8._4_4_ = fVar369 * auVar250._4_4_ + auVar342._4_4_ * auVar130._4_4_;
    local_b8._8_4_ = fVar370 * auVar250._8_4_ + auVar342._8_4_ * auVar130._8_4_;
    local_b8._12_4_ = fVar371 * auVar250._12_4_ + auVar342._12_4_ * auVar130._12_4_;
    local_b8._16_4_ = fVar372 * auVar250._16_4_ + auVar342._16_4_ * auVar130._16_4_;
    local_b8._20_4_ = fVar379 * auVar250._20_4_ + auVar342._20_4_ * auVar130._20_4_;
    local_b8._24_4_ = fVar380 * auVar250._24_4_ + auVar342._24_4_ * auVar130._24_4_;
    local_b8._28_4_ = fVar358 + fVar333 + 0.0;
    auVar219._0_4_ = fVar361 * auVar274._0_4_ + auVar342._0_4_ * auVar354._0_4_;
    auVar219._4_4_ = fVar369 * auVar274._4_4_ + auVar342._4_4_ * auVar354._4_4_;
    auVar219._8_4_ = fVar370 * auVar274._8_4_ + auVar342._8_4_ * auVar354._8_4_;
    auVar219._12_4_ = fVar371 * auVar274._12_4_ + auVar342._12_4_ * auVar354._12_4_;
    auVar219._16_4_ = fVar372 * auVar274._16_4_ + auVar342._16_4_ * auVar354._16_4_;
    auVar219._20_4_ = fVar379 * auVar274._20_4_ + auVar342._20_4_ * auVar354._20_4_;
    auVar219._24_4_ = fVar380 * auVar274._24_4_ + auVar342._24_4_ * auVar354._24_4_;
    auVar219._28_4_ = fVar358 + fVar226;
    auVar33 = vsubps_avx(auVar130,auVar250);
    auVar125 = vsubps_avx(auVar354,auVar274);
    local_4b8._0_4_ = auVar114._0_4_;
    local_4b8._4_4_ = auVar114._4_4_;
    fStack_4b0 = auVar114._8_4_;
    fStack_4ac = auVar114._12_4_;
    local_f8 = (float)local_4b8._0_4_ * auVar33._0_4_ * 3.0;
    fStack_f4 = (float)local_4b8._4_4_ * auVar33._4_4_ * 3.0;
    auVar41._4_4_ = fStack_f4;
    auVar41._0_4_ = local_f8;
    fStack_f0 = fStack_4b0 * auVar33._8_4_ * 3.0;
    auVar41._8_4_ = fStack_f0;
    fStack_ec = fStack_4ac * auVar33._12_4_ * 3.0;
    auVar41._12_4_ = fStack_ec;
    fStack_e8 = (float)local_4b8._0_4_ * auVar33._16_4_ * 3.0;
    auVar41._16_4_ = fStack_e8;
    fStack_e4 = (float)local_4b8._4_4_ * auVar33._20_4_ * 3.0;
    auVar41._20_4_ = fStack_e4;
    fStack_e0 = fStack_4b0 * auVar33._24_4_ * 3.0;
    auVar41._24_4_ = fStack_e0;
    auVar41._28_4_ = auVar33._28_4_;
    local_118 = (float)local_4b8._0_4_ * auVar125._0_4_ * 3.0;
    fStack_114 = (float)local_4b8._4_4_ * auVar125._4_4_ * 3.0;
    auVar42._4_4_ = fStack_114;
    auVar42._0_4_ = local_118;
    fStack_110 = fStack_4b0 * auVar125._8_4_ * 3.0;
    auVar42._8_4_ = fStack_110;
    fStack_10c = fStack_4ac * auVar125._12_4_ * 3.0;
    auVar42._12_4_ = fStack_10c;
    fStack_108 = (float)local_4b8._0_4_ * auVar125._16_4_ * 3.0;
    auVar42._16_4_ = fStack_108;
    fStack_104 = (float)local_4b8._4_4_ * auVar125._20_4_ * 3.0;
    auVar42._20_4_ = fStack_104;
    fStack_100 = fStack_4b0 * auVar125._24_4_ * 3.0;
    auVar42._24_4_ = fStack_100;
    auVar42._28_4_ = fVar358;
    auVar31 = vsubps_avx(local_b8,auVar41);
    auVar125 = vperm2f128_avx(auVar31,auVar31,1);
    auVar125 = vshufps_avx(auVar125,auVar31,0x30);
    auVar125 = vshufps_avx(auVar31,auVar125,0x29);
    auVar34 = vsubps_avx(auVar219,auVar42);
    auVar31 = vperm2f128_avx(auVar34,auVar34,1);
    auVar31 = vshufps_avx(auVar31,auVar34,0x30);
    _local_408 = vshufps_avx(auVar34,auVar31,0x29);
    fVar344 = auVar184._0_4_;
    fVar356 = auVar184._4_4_;
    fVar391 = auVar184._8_4_;
    fVar252 = auVar210._12_4_;
    fVar257 = auVar148._0_4_;
    fVar277 = auVar148._4_4_;
    fVar279 = auVar148._8_4_;
    fVar281 = auVar148._12_4_;
    auVar114 = vshufps_avx(auVar295,auVar295,0xaa);
    fVar227 = auVar114._0_4_;
    fVar220 = auVar114._4_4_;
    fVar373 = auVar114._8_4_;
    fVar333 = auVar114._12_4_;
    fVar222 = auVar342._0_4_ * fVar227 + fVar344 * fVar361;
    fVar224 = auVar342._4_4_ * fVar220 + fVar356 * fVar369;
    fVar254 = auVar342._8_4_ * fVar373 + fVar391 * fVar370;
    fVar225 = auVar342._12_4_ * fVar333 + auVar184._12_4_ * fVar371;
    fVar255 = auVar342._16_4_ * fVar227 + fVar344 * fVar372;
    fVar226 = auVar342._20_4_ * fVar220 + fVar356 * fVar379;
    fVar256 = auVar342._24_4_ * fVar373 + fVar391 * fVar380;
    auVar114 = vshufps_avx(auVar295,auVar295,0xff);
    fVar201 = auVar114._0_4_;
    fVar202 = auVar114._4_4_;
    fVar221 = auVar114._8_4_;
    fVar223 = auVar114._12_4_;
    fVar276 = auVar342._0_4_ * fVar201 + fVar257 * fVar361;
    fVar278 = auVar342._4_4_ * fVar202 + fVar277 * fVar369;
    fVar280 = auVar342._8_4_ * fVar221 + fVar279 * fVar370;
    fVar343 = auVar342._12_4_ * fVar223 + fVar281 * fVar371;
    fVar355 = auVar342._16_4_ * fVar201 + fVar257 * fVar372;
    fVar357 = auVar342._20_4_ * fVar202 + fVar277 * fVar379;
    fVar359 = auVar342._24_4_ * fVar221 + fVar279 * fVar380;
    auVar114 = vshufps_avx(auVar237,auVar237,0xaa);
    fVar381 = auVar114._12_4_ + fVar333;
    auVar194 = vshufps_avx(auVar237,auVar237,0xff);
    fVar253 = auVar194._12_4_;
    auVar131._0_4_ =
         fVar361 * (fVar344 * auVar342._0_4_ + fVar361 * auVar210._0_4_) + auVar342._0_4_ * fVar222;
    auVar131._4_4_ =
         fVar369 * (fVar356 * auVar342._4_4_ + fVar369 * auVar210._4_4_) + auVar342._4_4_ * fVar224;
    auVar131._8_4_ =
         fVar370 * (fVar391 * auVar342._8_4_ + fVar370 * auVar210._8_4_) + auVar342._8_4_ * fVar254;
    auVar131._12_4_ =
         fVar371 * (auVar184._12_4_ * auVar342._12_4_ + fVar371 * fVar252) +
         auVar342._12_4_ * fVar225;
    auVar131._16_4_ =
         fVar372 * (fVar344 * auVar342._16_4_ + fVar372 * auVar210._0_4_) +
         auVar342._16_4_ * fVar255;
    auVar131._20_4_ =
         fVar379 * (fVar356 * auVar342._20_4_ + fVar379 * auVar210._4_4_) +
         auVar342._20_4_ * fVar226;
    auVar131._24_4_ =
         fVar380 * (fVar391 * auVar342._24_4_ + fVar380 * auVar210._8_4_) +
         auVar342._24_4_ * fVar256;
    auVar131._28_4_ = local_408._28_4_ + fVar252 + fVar253;
    auVar166._0_4_ =
         fVar361 * (fVar257 * auVar342._0_4_ + auVar147._0_4_ * fVar361) + auVar342._0_4_ * fVar276;
    auVar166._4_4_ =
         fVar369 * (fVar277 * auVar342._4_4_ + auVar147._4_4_ * fVar369) + auVar342._4_4_ * fVar278;
    auVar166._8_4_ =
         fVar370 * (fVar279 * auVar342._8_4_ + auVar147._8_4_ * fVar370) + auVar342._8_4_ * fVar280;
    auVar166._12_4_ =
         fVar371 * (fVar281 * auVar342._12_4_ + auVar147._12_4_ * fVar371) +
         auVar342._12_4_ * fVar343;
    auVar166._16_4_ =
         fVar372 * (fVar257 * auVar342._16_4_ + auVar147._0_4_ * fVar372) +
         auVar342._16_4_ * fVar355;
    auVar166._20_4_ =
         fVar379 * (fVar277 * auVar342._20_4_ + auVar147._4_4_ * fVar379) +
         auVar342._20_4_ * fVar357;
    auVar166._24_4_ =
         fVar380 * (fVar279 * auVar342._24_4_ + auVar147._8_4_ * fVar380) +
         auVar342._24_4_ * fVar359;
    auVar166._28_4_ = fVar252 + auVar31._28_4_ + fVar253;
    auVar31 = vperm2f128_avx(local_b8,local_b8,1);
    auVar31 = vshufps_avx(auVar31,local_b8,0x30);
    _local_308 = vshufps_avx(local_b8,auVar31,0x29);
    auVar275._0_4_ =
         auVar342._0_4_ * (auVar114._0_4_ * auVar342._0_4_ + fVar361 * fVar227) + fVar361 * fVar222;
    auVar275._4_4_ =
         auVar342._4_4_ * (auVar114._4_4_ * auVar342._4_4_ + fVar369 * fVar220) + fVar369 * fVar224;
    auVar275._8_4_ =
         auVar342._8_4_ * (auVar114._8_4_ * auVar342._8_4_ + fVar370 * fVar373) + fVar370 * fVar254;
    auVar275._12_4_ =
         auVar342._12_4_ * (auVar114._12_4_ * auVar342._12_4_ + fVar371 * fVar333) +
         fVar371 * fVar225;
    auVar275._16_4_ =
         auVar342._16_4_ * (auVar114._0_4_ * auVar342._16_4_ + fVar372 * fVar227) +
         fVar372 * fVar255;
    auVar275._20_4_ =
         auVar342._20_4_ * (auVar114._4_4_ * auVar342._20_4_ + fVar379 * fVar220) +
         fVar379 * fVar226;
    auVar275._24_4_ =
         auVar342._24_4_ * (auVar114._8_4_ * auVar342._24_4_ + fVar380 * fVar373) +
         fVar380 * fVar256;
    auVar275._28_4_ = fVar381 + fVar360 + auVar274._28_4_;
    auVar320._0_4_ =
         fVar361 * fVar276 + auVar342._0_4_ * (auVar342._0_4_ * auVar194._0_4_ + fVar361 * fVar201);
    auVar320._4_4_ =
         fVar369 * fVar278 + auVar342._4_4_ * (auVar342._4_4_ * auVar194._4_4_ + fVar369 * fVar202);
    auVar320._8_4_ =
         fVar370 * fVar280 + auVar342._8_4_ * (auVar342._8_4_ * auVar194._8_4_ + fVar370 * fVar221);
    auVar320._12_4_ =
         fVar371 * fVar343 + auVar342._12_4_ * (auVar342._12_4_ * fVar253 + fVar371 * fVar223);
    auVar320._16_4_ =
         fVar372 * fVar355 +
         auVar342._16_4_ * (auVar342._16_4_ * auVar194._0_4_ + fVar372 * fVar201);
    auVar320._20_4_ =
         fVar379 * fVar357 +
         auVar342._20_4_ * (auVar342._20_4_ * auVar194._4_4_ + fVar379 * fVar202);
    auVar320._24_4_ =
         fVar380 * fVar359 +
         auVar342._24_4_ * (auVar342._24_4_ * auVar194._8_4_ + fVar380 * fVar221);
    auVar320._28_4_ = fVar360 + fVar281 + fVar253 + fVar223;
    auVar303._0_4_ = fVar361 * auVar131._0_4_ + auVar342._0_4_ * auVar275._0_4_;
    auVar303._4_4_ = fVar369 * auVar131._4_4_ + auVar342._4_4_ * auVar275._4_4_;
    auVar303._8_4_ = fVar370 * auVar131._8_4_ + auVar342._8_4_ * auVar275._8_4_;
    auVar303._12_4_ = fVar371 * auVar131._12_4_ + auVar342._12_4_ * auVar275._12_4_;
    auVar303._16_4_ = fVar372 * auVar131._16_4_ + auVar342._16_4_ * auVar275._16_4_;
    auVar303._20_4_ = fVar379 * auVar131._20_4_ + auVar342._20_4_ * auVar275._20_4_;
    auVar303._24_4_ = fVar380 * auVar131._24_4_ + auVar342._24_4_ * auVar275._24_4_;
    auVar303._28_4_ = fVar381 + fVar253 + fVar223;
    auVar332._0_4_ = fVar361 * auVar166._0_4_ + auVar342._0_4_ * auVar320._0_4_;
    auVar332._4_4_ = fVar369 * auVar166._4_4_ + auVar342._4_4_ * auVar320._4_4_;
    auVar332._8_4_ = fVar370 * auVar166._8_4_ + auVar342._8_4_ * auVar320._8_4_;
    auVar332._12_4_ = fVar371 * auVar166._12_4_ + auVar342._12_4_ * auVar320._12_4_;
    auVar332._16_4_ = fVar372 * auVar166._16_4_ + auVar342._16_4_ * auVar320._16_4_;
    auVar332._20_4_ = fVar379 * auVar166._20_4_ + auVar342._20_4_ * auVar320._20_4_;
    auVar332._24_4_ = fVar380 * auVar166._24_4_ + auVar342._24_4_ * auVar320._24_4_;
    auVar332._28_4_ = auVar32._28_4_ + auVar342._28_4_;
    auVar32 = vsubps_avx(auVar275,auVar131);
    auVar31 = vsubps_avx(auVar320,auVar166);
    local_138 = (float)local_4b8._0_4_ * auVar32._0_4_ * 3.0;
    fStack_134 = (float)local_4b8._4_4_ * auVar32._4_4_ * 3.0;
    auVar43._4_4_ = fStack_134;
    auVar43._0_4_ = local_138;
    fStack_130 = fStack_4b0 * auVar32._8_4_ * 3.0;
    auVar43._8_4_ = fStack_130;
    fStack_12c = fStack_4ac * auVar32._12_4_ * 3.0;
    auVar43._12_4_ = fStack_12c;
    fStack_128 = (float)local_4b8._0_4_ * auVar32._16_4_ * 3.0;
    auVar43._16_4_ = fStack_128;
    fStack_124 = (float)local_4b8._4_4_ * auVar32._20_4_ * 3.0;
    auVar43._20_4_ = fStack_124;
    fStack_120 = fStack_4b0 * auVar32._24_4_ * 3.0;
    auVar43._24_4_ = fStack_120;
    auVar43._28_4_ = auVar32._28_4_;
    local_158 = (float)local_4b8._0_4_ * auVar31._0_4_ * 3.0;
    fStack_154 = (float)local_4b8._4_4_ * auVar31._4_4_ * 3.0;
    auVar44._4_4_ = fStack_154;
    auVar44._0_4_ = local_158;
    fStack_150 = fStack_4b0 * auVar31._8_4_ * 3.0;
    auVar44._8_4_ = fStack_150;
    fStack_14c = fStack_4ac * auVar31._12_4_ * 3.0;
    auVar44._12_4_ = fStack_14c;
    fStack_148 = (float)local_4b8._0_4_ * auVar31._16_4_ * 3.0;
    auVar44._16_4_ = fStack_148;
    fStack_144 = (float)local_4b8._4_4_ * auVar31._20_4_ * 3.0;
    auVar44._20_4_ = fStack_144;
    fStack_140 = fStack_4b0 * auVar31._24_4_ * 3.0;
    auVar44._24_4_ = fStack_140;
    auVar44._28_4_ = auVar275._28_4_;
    auVar31 = vperm2f128_avx(auVar303,auVar303,1);
    auVar31 = vshufps_avx(auVar31,auVar303,0x30);
    auVar35 = vshufps_avx(auVar303,auVar31,0x29);
    auVar34 = vsubps_avx(auVar303,auVar43);
    auVar31 = vperm2f128_avx(auVar34,auVar34,1);
    auVar31 = vshufps_avx(auVar31,auVar34,0x30);
    _local_4b8 = vshufps_avx(auVar34,auVar31,0x29);
    auVar34 = vsubps_avx(auVar332,auVar44);
    auVar31 = vperm2f128_avx(auVar34,auVar34,1);
    auVar31 = vshufps_avx(auVar31,auVar34,0x30);
    _local_498 = vshufps_avx(auVar34,auVar31,0x29);
    auVar34 = vsubps_avx(auVar303,local_b8);
    auVar36 = vsubps_avx(auVar35,_local_308);
    fVar227 = auVar36._0_4_ + auVar34._0_4_;
    fVar201 = auVar36._4_4_ + auVar34._4_4_;
    fVar220 = auVar36._8_4_ + auVar34._8_4_;
    fVar202 = auVar36._12_4_ + auVar34._12_4_;
    fVar373 = auVar36._16_4_ + auVar34._16_4_;
    fVar221 = auVar36._20_4_ + auVar34._20_4_;
    fVar252 = auVar36._24_4_ + auVar34._24_4_;
    auVar31 = vperm2f128_avx(auVar219,auVar219,1);
    auVar31 = vshufps_avx(auVar31,auVar219,0x30);
    local_d8 = vshufps_avx(auVar219,auVar31,0x29);
    auVar31 = vperm2f128_avx(auVar332,auVar332,1);
    auVar31 = vshufps_avx(auVar31,auVar332,0x30);
    local_98 = vshufps_avx(auVar332,auVar31,0x29);
    auVar31 = vsubps_avx(auVar332,auVar219);
    auVar37 = vsubps_avx(local_98,local_d8);
    fVar333 = auVar37._0_4_ + auVar31._0_4_;
    fVar223 = auVar37._4_4_ + auVar31._4_4_;
    fVar253 = auVar37._8_4_ + auVar31._8_4_;
    fVar222 = auVar37._12_4_ + auVar31._12_4_;
    fVar224 = auVar37._16_4_ + auVar31._16_4_;
    fVar254 = auVar37._20_4_ + auVar31._20_4_;
    fVar225 = auVar37._24_4_ + auVar31._24_4_;
    auVar45._4_4_ = fVar201 * auVar219._4_4_;
    auVar45._0_4_ = fVar227 * auVar219._0_4_;
    auVar45._8_4_ = fVar220 * auVar219._8_4_;
    auVar45._12_4_ = fVar202 * auVar219._12_4_;
    auVar45._16_4_ = fVar373 * auVar219._16_4_;
    auVar45._20_4_ = fVar221 * auVar219._20_4_;
    auVar45._24_4_ = fVar252 * auVar219._24_4_;
    auVar45._28_4_ = auVar31._28_4_;
    auVar46._4_4_ = fVar223 * local_b8._4_4_;
    auVar46._0_4_ = fVar333 * local_b8._0_4_;
    auVar46._8_4_ = fVar253 * local_b8._8_4_;
    auVar46._12_4_ = fVar222 * local_b8._12_4_;
    auVar46._16_4_ = fVar224 * local_b8._16_4_;
    auVar46._20_4_ = fVar254 * local_b8._20_4_;
    auVar46._24_4_ = fVar225 * local_b8._24_4_;
    auVar46._28_4_ = fVar381;
    auVar38 = vsubps_avx(auVar45,auVar46);
    local_f8 = local_b8._0_4_ + local_f8;
    fStack_f4 = local_b8._4_4_ + fStack_f4;
    fStack_f0 = local_b8._8_4_ + fStack_f0;
    fStack_ec = local_b8._12_4_ + fStack_ec;
    fStack_e8 = local_b8._16_4_ + fStack_e8;
    fStack_e4 = local_b8._20_4_ + fStack_e4;
    fStack_e0 = local_b8._24_4_ + fStack_e0;
    fStack_dc = local_b8._28_4_ + auVar33._28_4_;
    local_118 = local_118 + auVar219._0_4_;
    fStack_114 = fStack_114 + auVar219._4_4_;
    fStack_110 = fStack_110 + auVar219._8_4_;
    fStack_10c = fStack_10c + auVar219._12_4_;
    fStack_108 = fStack_108 + auVar219._16_4_;
    fStack_104 = fStack_104 + auVar219._20_4_;
    fStack_100 = fStack_100 + auVar219._24_4_;
    fStack_fc = fVar358 + auVar219._28_4_;
    auVar47._4_4_ = fVar201 * fStack_114;
    auVar47._0_4_ = fVar227 * local_118;
    auVar47._8_4_ = fVar220 * fStack_110;
    auVar47._12_4_ = fVar202 * fStack_10c;
    auVar47._16_4_ = fVar373 * fStack_108;
    auVar47._20_4_ = fVar221 * fStack_104;
    auVar47._24_4_ = fVar252 * fStack_100;
    auVar47._28_4_ = fVar358;
    auVar48._4_4_ = fVar223 * fStack_f4;
    auVar48._0_4_ = fVar333 * local_f8;
    auVar48._8_4_ = fVar253 * fStack_f0;
    auVar48._12_4_ = fVar222 * fStack_ec;
    auVar48._16_4_ = fVar224 * fStack_e8;
    auVar48._20_4_ = fVar254 * fStack_e4;
    auVar48._24_4_ = fVar225 * fStack_e0;
    auVar48._28_4_ = fVar358 + auVar219._28_4_;
    auVar33 = vsubps_avx(auVar47,auVar48);
    auVar49._4_4_ = fVar201 * (float)local_408._4_4_;
    auVar49._0_4_ = fVar227 * (float)local_408._0_4_;
    auVar49._8_4_ = fVar220 * fStack_400;
    auVar49._12_4_ = fVar202 * fStack_3fc;
    auVar49._16_4_ = fVar373 * fStack_3f8;
    auVar49._20_4_ = fVar221 * fStack_3f4;
    auVar49._24_4_ = fVar252 * fStack_3f0;
    auVar49._28_4_ = fVar358;
    local_448._0_4_ = auVar125._0_4_;
    local_448._4_4_ = auVar125._4_4_;
    fStack_440 = auVar125._8_4_;
    fStack_43c = auVar125._12_4_;
    fStack_438 = auVar125._16_4_;
    fStack_434 = auVar125._20_4_;
    fStack_430 = auVar125._24_4_;
    auVar50._4_4_ = fVar223 * (float)local_448._4_4_;
    auVar50._0_4_ = fVar333 * (float)local_448._0_4_;
    auVar50._8_4_ = fVar253 * fStack_440;
    auVar50._12_4_ = fVar222 * fStack_43c;
    auVar50._16_4_ = fVar224 * fStack_438;
    auVar50._20_4_ = fVar254 * fStack_434;
    auVar50._24_4_ = fVar225 * fStack_430;
    auVar50._28_4_ = local_b8._28_4_;
    auVar39 = vsubps_avx(auVar49,auVar50);
    auVar51._4_4_ = local_d8._4_4_ * fVar201;
    auVar51._0_4_ = local_d8._0_4_ * fVar227;
    auVar51._8_4_ = local_d8._8_4_ * fVar220;
    auVar51._12_4_ = local_d8._12_4_ * fVar202;
    auVar51._16_4_ = local_d8._16_4_ * fVar373;
    auVar51._20_4_ = local_d8._20_4_ * fVar221;
    auVar51._24_4_ = local_d8._24_4_ * fVar252;
    auVar51._28_4_ = fVar358;
    auVar52._4_4_ = local_308._4_4_ * fVar223;
    auVar52._0_4_ = local_308._0_4_ * fVar333;
    auVar52._8_4_ = local_308._8_4_ * fVar253;
    auVar52._12_4_ = local_308._12_4_ * fVar222;
    auVar52._16_4_ = local_308._16_4_ * fVar224;
    auVar52._20_4_ = local_308._20_4_ * fVar254;
    auVar52._24_4_ = local_308._24_4_ * fVar225;
    auVar52._28_4_ = local_d8._28_4_;
    auVar40 = vsubps_avx(auVar51,auVar52);
    auVar53._4_4_ = auVar332._4_4_ * fVar201;
    auVar53._0_4_ = auVar332._0_4_ * fVar227;
    auVar53._8_4_ = auVar332._8_4_ * fVar220;
    auVar53._12_4_ = auVar332._12_4_ * fVar202;
    auVar53._16_4_ = auVar332._16_4_ * fVar373;
    auVar53._20_4_ = auVar332._20_4_ * fVar221;
    auVar53._24_4_ = auVar332._24_4_ * fVar252;
    auVar53._28_4_ = fVar358;
    auVar54._4_4_ = fVar223 * auVar303._4_4_;
    auVar54._0_4_ = fVar333 * auVar303._0_4_;
    auVar54._8_4_ = fVar253 * auVar303._8_4_;
    auVar54._12_4_ = fVar222 * auVar303._12_4_;
    auVar54._16_4_ = fVar224 * auVar303._16_4_;
    auVar54._20_4_ = fVar254 * auVar303._20_4_;
    auVar54._24_4_ = fVar225 * auVar303._24_4_;
    auVar54._28_4_ = fStack_dc;
    auVar126 = vsubps_avx(auVar53,auVar54);
    local_138 = auVar303._0_4_ + local_138;
    fStack_134 = auVar303._4_4_ + fStack_134;
    fStack_130 = auVar303._8_4_ + fStack_130;
    fStack_12c = auVar303._12_4_ + fStack_12c;
    fStack_128 = auVar303._16_4_ + fStack_128;
    fStack_124 = auVar303._20_4_ + fStack_124;
    fStack_120 = auVar303._24_4_ + fStack_120;
    fStack_11c = auVar303._28_4_ + auVar32._28_4_;
    local_158 = auVar332._0_4_ + local_158;
    fStack_154 = auVar332._4_4_ + fStack_154;
    fStack_150 = auVar332._8_4_ + fStack_150;
    fStack_14c = auVar332._12_4_ + fStack_14c;
    fStack_148 = auVar332._16_4_ + fStack_148;
    fStack_144 = auVar332._20_4_ + fStack_144;
    fStack_140 = auVar332._24_4_ + fStack_140;
    fStack_13c = auVar332._28_4_ + auVar275._28_4_;
    auVar55._4_4_ = fVar201 * fStack_154;
    auVar55._0_4_ = fVar227 * local_158;
    auVar55._8_4_ = fVar220 * fStack_150;
    auVar55._12_4_ = fVar202 * fStack_14c;
    auVar55._16_4_ = fVar373 * fStack_148;
    auVar55._20_4_ = fVar221 * fStack_144;
    auVar55._24_4_ = fVar252 * fStack_140;
    auVar55._28_4_ = auVar332._28_4_ + auVar275._28_4_;
    auVar56._4_4_ = fStack_134 * fVar223;
    auVar56._0_4_ = local_138 * fVar333;
    auVar56._8_4_ = fStack_130 * fVar253;
    auVar56._12_4_ = fStack_12c * fVar222;
    auVar56._16_4_ = fStack_128 * fVar224;
    auVar56._20_4_ = fStack_124 * fVar254;
    auVar56._24_4_ = fStack_120 * fVar225;
    auVar56._28_4_ = fStack_11c;
    auVar127 = vsubps_avx(auVar55,auVar56);
    auVar57._4_4_ = fVar201 * local_498._4_4_;
    auVar57._0_4_ = fVar227 * local_498._0_4_;
    auVar57._8_4_ = fVar220 * local_498._8_4_;
    auVar57._12_4_ = fVar202 * local_498._12_4_;
    auVar57._16_4_ = fVar373 * local_498._16_4_;
    auVar57._20_4_ = fVar221 * local_498._20_4_;
    auVar57._24_4_ = fVar252 * local_498._24_4_;
    auVar57._28_4_ = fStack_11c;
    auVar58._4_4_ = fVar223 * (float)local_4b8._4_4_;
    auVar58._0_4_ = fVar333 * (float)local_4b8._0_4_;
    auVar58._8_4_ = fVar253 * fStack_4b0;
    auVar58._12_4_ = fVar222 * fStack_4ac;
    auVar58._16_4_ = fVar224 * fStack_4a8;
    auVar58._20_4_ = fVar254 * fStack_4a4;
    auVar58._24_4_ = fVar225 * fStack_4a0;
    auVar58._28_4_ = local_498._28_4_;
    auVar163 = vsubps_avx(auVar57,auVar58);
    auVar59._4_4_ = fVar201 * local_98._4_4_;
    auVar59._0_4_ = fVar227 * local_98._0_4_;
    auVar59._8_4_ = fVar220 * local_98._8_4_;
    auVar59._12_4_ = fVar202 * local_98._12_4_;
    auVar59._16_4_ = fVar373 * local_98._16_4_;
    auVar59._20_4_ = fVar221 * local_98._20_4_;
    auVar59._24_4_ = fVar252 * local_98._24_4_;
    auVar59._28_4_ = auVar36._28_4_ + auVar34._28_4_;
    auVar60._4_4_ = auVar35._4_4_ * fVar223;
    auVar60._0_4_ = auVar35._0_4_ * fVar333;
    auVar60._8_4_ = auVar35._8_4_ * fVar253;
    auVar60._12_4_ = auVar35._12_4_ * fVar222;
    auVar60._16_4_ = auVar35._16_4_ * fVar224;
    auVar60._20_4_ = auVar35._20_4_ * fVar254;
    auVar60._24_4_ = auVar35._24_4_ * fVar225;
    auVar60._28_4_ = auVar37._28_4_ + auVar31._28_4_;
    auVar36 = vsubps_avx(auVar59,auVar60);
    auVar31 = vminps_avx(auVar38,auVar33);
    auVar125 = vmaxps_avx(auVar38,auVar33);
    auVar32 = vminps_avx(auVar39,auVar40);
    auVar32 = vminps_avx(auVar31,auVar32);
    auVar31 = vmaxps_avx(auVar39,auVar40);
    auVar125 = vmaxps_avx(auVar125,auVar31);
    auVar33 = vminps_avx(auVar126,auVar127);
    auVar31 = vmaxps_avx(auVar126,auVar127);
    auVar34 = vminps_avx(auVar163,auVar36);
    auVar34 = vminps_avx(auVar33,auVar34);
    auVar34 = vminps_avx(auVar32,auVar34);
    auVar32 = vmaxps_avx(auVar163,auVar36);
    auVar31 = vmaxps_avx(auVar31,auVar32);
    auVar31 = vmaxps_avx(auVar125,auVar31);
    auVar125 = vcmpps_avx(auVar34,local_1d8,2);
    auVar31 = vcmpps_avx(auVar31,local_78,5);
    auVar125 = vandps_avx(auVar31,auVar125);
    auVar31 = local_178 & auVar125;
    if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar31 >> 0x7f,0) != '\0') ||
          (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar31 >> 0xbf,0) != '\0') ||
        (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar31[0x1f] < '\0')
    {
      auVar31 = vsubps_avx(_local_308,local_b8);
      auVar32 = vsubps_avx(auVar35,auVar303);
      fVar201 = auVar31._0_4_ + auVar32._0_4_;
      fVar220 = auVar31._4_4_ + auVar32._4_4_;
      fVar202 = auVar31._8_4_ + auVar32._8_4_;
      fVar373 = auVar31._12_4_ + auVar32._12_4_;
      fVar221 = auVar31._16_4_ + auVar32._16_4_;
      fVar252 = auVar31._20_4_ + auVar32._20_4_;
      fVar333 = auVar31._24_4_ + auVar32._24_4_;
      auVar34 = vsubps_avx(local_d8,auVar219);
      auVar36 = vsubps_avx(local_98,auVar332);
      fVar223 = auVar34._0_4_ + auVar36._0_4_;
      fVar253 = auVar34._4_4_ + auVar36._4_4_;
      fVar222 = auVar34._8_4_ + auVar36._8_4_;
      fVar224 = auVar34._12_4_ + auVar36._12_4_;
      fVar254 = auVar34._16_4_ + auVar36._16_4_;
      fVar225 = auVar34._20_4_ + auVar36._20_4_;
      fVar255 = auVar34._24_4_ + auVar36._24_4_;
      fVar227 = auVar36._28_4_;
      auVar61._4_4_ = auVar219._4_4_ * fVar220;
      auVar61._0_4_ = auVar219._0_4_ * fVar201;
      auVar61._8_4_ = auVar219._8_4_ * fVar202;
      auVar61._12_4_ = auVar219._12_4_ * fVar373;
      auVar61._16_4_ = auVar219._16_4_ * fVar221;
      auVar61._20_4_ = auVar219._20_4_ * fVar252;
      auVar61._24_4_ = auVar219._24_4_ * fVar333;
      auVar61._28_4_ = auVar219._28_4_;
      auVar62._4_4_ = local_b8._4_4_ * fVar253;
      auVar62._0_4_ = local_b8._0_4_ * fVar223;
      auVar62._8_4_ = local_b8._8_4_ * fVar222;
      auVar62._12_4_ = local_b8._12_4_ * fVar224;
      auVar62._16_4_ = local_b8._16_4_ * fVar254;
      auVar62._20_4_ = local_b8._20_4_ * fVar225;
      auVar62._24_4_ = local_b8._24_4_ * fVar255;
      auVar62._28_4_ = local_b8._28_4_;
      auVar36 = vsubps_avx(auVar61,auVar62);
      auVar63._4_4_ = fVar220 * fStack_114;
      auVar63._0_4_ = fVar201 * local_118;
      auVar63._8_4_ = fVar202 * fStack_110;
      auVar63._12_4_ = fVar373 * fStack_10c;
      auVar63._16_4_ = fVar221 * fStack_108;
      auVar63._20_4_ = fVar252 * fStack_104;
      auVar63._24_4_ = fVar333 * fStack_100;
      auVar63._28_4_ = auVar219._28_4_;
      auVar64._4_4_ = fVar253 * fStack_f4;
      auVar64._0_4_ = fVar223 * local_f8;
      auVar64._8_4_ = fVar222 * fStack_f0;
      auVar64._12_4_ = fVar224 * fStack_ec;
      auVar64._16_4_ = fVar254 * fStack_e8;
      auVar64._20_4_ = fVar225 * fStack_e4;
      auVar64._24_4_ = fVar255 * fStack_e0;
      auVar64._28_4_ = fVar227;
      auVar37 = vsubps_avx(auVar63,auVar64);
      auVar65._4_4_ = fVar220 * (float)local_408._4_4_;
      auVar65._0_4_ = fVar201 * (float)local_408._0_4_;
      auVar65._8_4_ = fVar202 * fStack_400;
      auVar65._12_4_ = fVar373 * fStack_3fc;
      auVar65._16_4_ = fVar221 * fStack_3f8;
      auVar65._20_4_ = fVar252 * fStack_3f4;
      auVar65._24_4_ = fVar333 * fStack_3f0;
      auVar65._28_4_ = fVar227;
      auVar66._4_4_ = fVar253 * (float)local_448._4_4_;
      auVar66._0_4_ = fVar223 * (float)local_448._0_4_;
      auVar66._8_4_ = fVar222 * fStack_440;
      auVar66._12_4_ = fVar224 * fStack_43c;
      auVar66._16_4_ = fVar254 * fStack_438;
      auVar66._20_4_ = fVar225 * fStack_434;
      auVar66._24_4_ = fVar255 * fStack_430;
      auVar66._28_4_ = auVar33._28_4_;
      auVar38 = vsubps_avx(auVar65,auVar66);
      auVar67._4_4_ = local_d8._4_4_ * fVar220;
      auVar67._0_4_ = local_d8._0_4_ * fVar201;
      auVar67._8_4_ = local_d8._8_4_ * fVar202;
      auVar67._12_4_ = local_d8._12_4_ * fVar373;
      auVar67._16_4_ = local_d8._16_4_ * fVar221;
      auVar67._20_4_ = local_d8._20_4_ * fVar252;
      auVar67._24_4_ = local_d8._24_4_ * fVar333;
      auVar67._28_4_ = auVar33._28_4_;
      auVar68._4_4_ = local_308._4_4_ * fVar253;
      auVar68._0_4_ = local_308._0_4_ * fVar223;
      auVar68._8_4_ = local_308._8_4_ * fVar222;
      auVar68._12_4_ = local_308._12_4_ * fVar224;
      auVar68._16_4_ = local_308._16_4_ * fVar254;
      auVar68._20_4_ = local_308._20_4_ * fVar225;
      uVar7 = local_308._28_4_;
      auVar68._24_4_ = local_308._24_4_ * fVar255;
      auVar68._28_4_ = uVar7;
      auVar39 = vsubps_avx(auVar67,auVar68);
      auVar69._4_4_ = auVar332._4_4_ * fVar220;
      auVar69._0_4_ = auVar332._0_4_ * fVar201;
      auVar69._8_4_ = auVar332._8_4_ * fVar202;
      auVar69._12_4_ = auVar332._12_4_ * fVar373;
      auVar69._16_4_ = auVar332._16_4_ * fVar221;
      auVar69._20_4_ = auVar332._20_4_ * fVar252;
      auVar69._24_4_ = auVar332._24_4_ * fVar333;
      auVar69._28_4_ = uVar7;
      auVar70._4_4_ = auVar303._4_4_ * fVar253;
      auVar70._0_4_ = auVar303._0_4_ * fVar223;
      auVar70._8_4_ = auVar303._8_4_ * fVar222;
      auVar70._12_4_ = auVar303._12_4_ * fVar224;
      auVar70._16_4_ = auVar303._16_4_ * fVar254;
      auVar70._20_4_ = auVar303._20_4_ * fVar225;
      auVar70._24_4_ = auVar303._24_4_ * fVar255;
      auVar70._28_4_ = auVar303._28_4_;
      auVar40 = vsubps_avx(auVar69,auVar70);
      auVar71._4_4_ = fVar220 * fStack_154;
      auVar71._0_4_ = fVar201 * local_158;
      auVar71._8_4_ = fVar202 * fStack_150;
      auVar71._12_4_ = fVar373 * fStack_14c;
      auVar71._16_4_ = fVar221 * fStack_148;
      auVar71._20_4_ = fVar252 * fStack_144;
      auVar71._24_4_ = fVar333 * fStack_140;
      auVar71._28_4_ = uVar7;
      auVar72._4_4_ = fVar253 * fStack_134;
      auVar72._0_4_ = fVar223 * local_138;
      auVar72._8_4_ = fVar222 * fStack_130;
      auVar72._12_4_ = fVar224 * fStack_12c;
      auVar72._16_4_ = fVar254 * fStack_128;
      auVar72._20_4_ = fVar225 * fStack_124;
      auVar72._24_4_ = fVar255 * fStack_120;
      auVar72._28_4_ = auVar332._28_4_;
      auVar126 = vsubps_avx(auVar71,auVar72);
      auVar73._4_4_ = fVar220 * local_498._4_4_;
      auVar73._0_4_ = fVar201 * local_498._0_4_;
      auVar73._8_4_ = fVar202 * local_498._8_4_;
      auVar73._12_4_ = fVar373 * local_498._12_4_;
      auVar73._16_4_ = fVar221 * local_498._16_4_;
      auVar73._20_4_ = fVar252 * local_498._20_4_;
      auVar73._24_4_ = fVar333 * local_498._24_4_;
      auVar73._28_4_ = auVar332._28_4_;
      auVar74._4_4_ = (float)local_4b8._4_4_ * fVar253;
      auVar74._0_4_ = (float)local_4b8._0_4_ * fVar223;
      auVar74._8_4_ = fStack_4b0 * fVar222;
      auVar74._12_4_ = fStack_4ac * fVar224;
      auVar74._16_4_ = fStack_4a8 * fVar254;
      auVar74._20_4_ = fStack_4a4 * fVar225;
      auVar74._24_4_ = fStack_4a0 * fVar255;
      auVar74._28_4_ = local_d8._28_4_;
      auVar127 = vsubps_avx(auVar73,auVar74);
      auVar75._4_4_ = local_98._4_4_ * fVar220;
      auVar75._0_4_ = local_98._0_4_ * fVar201;
      auVar75._8_4_ = local_98._8_4_ * fVar202;
      auVar75._12_4_ = local_98._12_4_ * fVar373;
      auVar75._16_4_ = local_98._16_4_ * fVar221;
      auVar75._20_4_ = local_98._20_4_ * fVar252;
      auVar75._24_4_ = local_98._24_4_ * fVar333;
      auVar75._28_4_ = auVar31._28_4_ + auVar32._28_4_;
      auVar76._4_4_ = auVar35._4_4_ * fVar253;
      auVar76._0_4_ = auVar35._0_4_ * fVar223;
      auVar76._8_4_ = auVar35._8_4_ * fVar222;
      auVar76._12_4_ = auVar35._12_4_ * fVar224;
      auVar76._16_4_ = auVar35._16_4_ * fVar254;
      auVar76._20_4_ = auVar35._20_4_ * fVar225;
      auVar76._24_4_ = auVar35._24_4_ * fVar255;
      auVar76._28_4_ = auVar34._28_4_ + fVar227;
      auVar163 = vsubps_avx(auVar75,auVar76);
      auVar32 = vminps_avx(auVar36,auVar37);
      auVar31 = vmaxps_avx(auVar36,auVar37);
      auVar33 = vminps_avx(auVar38,auVar39);
      auVar33 = vminps_avx(auVar32,auVar33);
      auVar32 = vmaxps_avx(auVar38,auVar39);
      auVar31 = vmaxps_avx(auVar31,auVar32);
      auVar34 = vminps_avx(auVar40,auVar126);
      auVar32 = vmaxps_avx(auVar40,auVar126);
      auVar35 = vminps_avx(auVar127,auVar163);
      auVar34 = vminps_avx(auVar34,auVar35);
      auVar34 = vminps_avx(auVar33,auVar34);
      auVar33 = vmaxps_avx(auVar127,auVar163);
      auVar32 = vmaxps_avx(auVar32,auVar33);
      auVar32 = vmaxps_avx(auVar31,auVar32);
      auVar31 = vcmpps_avx(auVar34,local_1d8,2);
      auVar32 = vcmpps_avx(auVar32,local_78,5);
      auVar31 = vandps_avx(auVar32,auVar31);
      auVar125 = vandps_avx(local_178,auVar125);
      auVar32 = auVar125 & auVar31;
      if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar32 >> 0x7f,0) != '\0') ||
            (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar32 >> 0xbf,0) != '\0') ||
          (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar32[0x1f] < '\0') {
        auVar125 = vandps_avx(auVar31,auVar125);
        uVar91 = vmovmskps_avx(auVar125);
        if (uVar91 != 0) {
          auStack_298[uVar86] = uVar91 & 0xff;
          uVar8 = vmovlps_avx(local_218);
          *(undefined8 *)(afStack_1b8 + uVar86 * 2) = uVar8;
          uVar95 = vmovlps_avx(auVar110);
          auStack_58[uVar86] = uVar95;
          uVar86 = (ulong)((int)uVar86 + 1);
        }
      }
    }
LAB_0112e711:
    do {
      do {
        do {
          do {
            if ((int)uVar86 == 0) {
              if (bVar90) {
                return bVar90;
              }
              fVar203 = ray->tfar;
              auVar134._4_4_ = fVar203;
              auVar134._0_4_ = fVar203;
              auVar134._8_4_ = fVar203;
              auVar134._12_4_ = fVar203;
              auVar134._16_4_ = fVar203;
              auVar134._20_4_ = fVar203;
              auVar134._24_4_ = fVar203;
              auVar134._28_4_ = fVar203;
              auVar125 = vcmpps_avx(local_198,auVar134,2);
              uVar91 = vmovmskps_avx(auVar125);
              uVar85 = uVar85 & SUB84(auVar94,0) & uVar91;
              if (uVar85 == 0) {
                return bVar90;
              }
              goto LAB_0112d56f;
            }
            uVar87 = (int)uVar86 - 1;
            uVar88 = (ulong)uVar87;
            uVar91 = auStack_298[uVar88];
            fVar227 = afStack_1b8[uVar88 * 2];
            fVar201 = afStack_1b8[uVar88 * 2 + 1];
            auVar110._8_8_ = 0;
            auVar110._0_8_ = auStack_58[uVar88];
            uVar95 = 0;
            if (uVar91 != 0) {
              for (; (uVar91 >> uVar95 & 1) == 0; uVar95 = uVar95 + 1) {
              }
            }
            uVar91 = uVar91 - 1 & uVar91;
            auStack_298[uVar88] = uVar91;
            if (uVar91 == 0) {
              uVar86 = (ulong)uVar87;
            }
            fVar202 = (float)(uVar95 + 1) * 0.14285715;
            fVar220 = (1.0 - (float)uVar95 * 0.14285715) * fVar227 +
                      fVar201 * (float)uVar95 * 0.14285715;
            fVar227 = (1.0 - fVar202) * fVar227 + fVar201 * fVar202;
            fVar201 = fVar227 - fVar220;
            if (0.16666667 <= fVar201) {
              local_218 = vinsertps_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar227),0x10);
              goto LAB_0112e0de;
            }
            auVar114 = vshufps_avx(auVar110,auVar110,0x50);
            auVar145._8_4_ = 0x3f800000;
            auVar145._0_8_ = 0x3f8000003f800000;
            auVar145._12_4_ = 0x3f800000;
            auVar210 = vsubps_avx(auVar145,auVar114);
            fVar202 = auVar114._0_4_;
            fVar373 = auVar114._4_4_;
            fVar221 = auVar114._8_4_;
            fVar252 = auVar114._12_4_;
            fVar333 = auVar210._0_4_;
            fVar223 = auVar210._4_4_;
            fVar253 = auVar210._8_4_;
            fVar222 = auVar210._12_4_;
            auVar181._0_4_ = fVar202 * (float)local_338._0_4_ + fVar333 * (float)local_4c8._0_4_;
            auVar181._4_4_ = fVar373 * (float)local_338._4_4_ + fVar223 * (float)local_4c8._4_4_;
            auVar181._8_4_ = fVar221 * fStack_330 + fVar253 * fStack_4c0;
            auVar181._12_4_ = fVar252 * fStack_32c + fVar222 * fStack_4bc;
            auVar238._0_4_ = fVar202 * (float)local_348._0_4_ + local_378._0_4_ * fVar333;
            auVar238._4_4_ = fVar373 * (float)local_348._4_4_ + local_378._4_4_ * fVar223;
            auVar238._8_4_ = fVar221 * fStack_340 + local_378._8_4_ * fVar253;
            auVar238._12_4_ = fVar252 * fStack_33c + local_378._12_4_ * fVar222;
            auVar266._0_4_ = fVar202 * (float)local_358._0_4_ + fVar333 * (float)local_318._0_4_;
            auVar266._4_4_ = fVar373 * (float)local_358._4_4_ + fVar223 * (float)local_318._4_4_;
            auVar266._8_4_ = fVar221 * fStack_350 + fVar253 * fStack_310;
            auVar266._12_4_ = fVar252 * fStack_34c + fVar222 * fStack_30c;
            auVar111._0_4_ = fVar202 * (float)local_368._0_4_ + fVar333 * (float)local_328._0_4_;
            auVar111._4_4_ = fVar373 * (float)local_368._4_4_ + fVar223 * (float)local_328._4_4_;
            auVar111._8_4_ = fVar221 * fStack_360 + fVar253 * fStack_320;
            auVar111._12_4_ = fVar252 * fStack_35c + fVar222 * fStack_31c;
            auVar167._16_16_ = auVar181;
            auVar167._0_16_ = auVar181;
            auVar199._16_16_ = auVar238;
            auVar199._0_16_ = auVar238;
            auVar251._16_16_ = auVar266;
            auVar251._0_16_ = auVar266;
            _local_448 = ZEXT432((uint)fVar220);
            _local_408 = ZEXT416((uint)fVar227);
            auVar125 = ZEXT2032(CONCAT416(fVar227,ZEXT416((uint)fVar220)));
            auVar125 = vshufps_avx(auVar125,auVar125,0);
            auVar31 = vsubps_avx(auVar199,auVar167);
            fVar202 = auVar125._0_4_;
            fVar373 = auVar125._4_4_;
            fVar221 = auVar125._8_4_;
            fVar252 = auVar125._12_4_;
            fVar333 = auVar125._16_4_;
            fVar223 = auVar125._20_4_;
            fVar253 = auVar125._24_4_;
            auVar168._0_4_ = auVar181._0_4_ + auVar31._0_4_ * fVar202;
            auVar168._4_4_ = auVar181._4_4_ + auVar31._4_4_ * fVar373;
            auVar168._8_4_ = auVar181._8_4_ + auVar31._8_4_ * fVar221;
            auVar168._12_4_ = auVar181._12_4_ + auVar31._12_4_ * fVar252;
            auVar168._16_4_ = auVar181._0_4_ + auVar31._16_4_ * fVar333;
            auVar168._20_4_ = auVar181._4_4_ + auVar31._20_4_ * fVar223;
            auVar168._24_4_ = auVar181._8_4_ + auVar31._24_4_ * fVar253;
            auVar168._28_4_ = auVar181._12_4_ + auVar31._28_4_;
            auVar125 = vsubps_avx(auVar251,auVar199);
            auVar200._0_4_ = auVar238._0_4_ + auVar125._0_4_ * fVar202;
            auVar200._4_4_ = auVar238._4_4_ + auVar125._4_4_ * fVar373;
            auVar200._8_4_ = auVar238._8_4_ + auVar125._8_4_ * fVar221;
            auVar200._12_4_ = auVar238._12_4_ + auVar125._12_4_ * fVar252;
            auVar200._16_4_ = auVar238._0_4_ + auVar125._16_4_ * fVar333;
            auVar200._20_4_ = auVar238._4_4_ + auVar125._20_4_ * fVar223;
            auVar200._24_4_ = auVar238._8_4_ + auVar125._24_4_ * fVar253;
            auVar200._28_4_ = auVar238._12_4_ + auVar125._28_4_;
            auVar114 = vsubps_avx(auVar111,auVar266);
            auVar132._0_4_ = auVar266._0_4_ + auVar114._0_4_ * fVar202;
            auVar132._4_4_ = auVar266._4_4_ + auVar114._4_4_ * fVar373;
            auVar132._8_4_ = auVar266._8_4_ + auVar114._8_4_ * fVar221;
            auVar132._12_4_ = auVar266._12_4_ + auVar114._12_4_ * fVar252;
            auVar132._16_4_ = auVar266._0_4_ + auVar114._0_4_ * fVar333;
            auVar132._20_4_ = auVar266._4_4_ + auVar114._4_4_ * fVar223;
            auVar132._24_4_ = auVar266._8_4_ + auVar114._8_4_ * fVar253;
            auVar132._28_4_ = auVar266._12_4_ + auVar114._12_4_;
            auVar125 = vsubps_avx(auVar200,auVar168);
            auVar169._0_4_ = auVar168._0_4_ + fVar202 * auVar125._0_4_;
            auVar169._4_4_ = auVar168._4_4_ + fVar373 * auVar125._4_4_;
            auVar169._8_4_ = auVar168._8_4_ + fVar221 * auVar125._8_4_;
            auVar169._12_4_ = auVar168._12_4_ + fVar252 * auVar125._12_4_;
            auVar169._16_4_ = auVar168._16_4_ + fVar333 * auVar125._16_4_;
            auVar169._20_4_ = auVar168._20_4_ + fVar223 * auVar125._20_4_;
            auVar169._24_4_ = auVar168._24_4_ + fVar253 * auVar125._24_4_;
            auVar169._28_4_ = auVar168._28_4_ + auVar125._28_4_;
            auVar125 = vsubps_avx(auVar132,auVar200);
            auVar133._0_4_ = auVar200._0_4_ + fVar202 * auVar125._0_4_;
            auVar133._4_4_ = auVar200._4_4_ + fVar373 * auVar125._4_4_;
            auVar133._8_4_ = auVar200._8_4_ + fVar221 * auVar125._8_4_;
            auVar133._12_4_ = auVar200._12_4_ + fVar252 * auVar125._12_4_;
            auVar133._16_4_ = auVar200._16_4_ + fVar333 * auVar125._16_4_;
            auVar133._20_4_ = auVar200._20_4_ + fVar223 * auVar125._20_4_;
            auVar133._24_4_ = auVar200._24_4_ + fVar253 * auVar125._24_4_;
            auVar133._28_4_ = auVar200._28_4_ + auVar125._28_4_;
            auVar125 = vsubps_avx(auVar133,auVar169);
            auVar286._0_4_ = auVar169._0_4_ + fVar202 * auVar125._0_4_;
            auVar286._4_4_ = auVar169._4_4_ + fVar373 * auVar125._4_4_;
            auVar286._8_4_ = auVar169._8_4_ + fVar221 * auVar125._8_4_;
            auVar286._12_4_ = auVar169._12_4_ + fVar252 * auVar125._12_4_;
            auVar289._16_4_ = auVar169._16_4_ + fVar333 * auVar125._16_4_;
            auVar289._0_16_ = auVar286;
            auVar289._20_4_ = auVar169._20_4_ + fVar223 * auVar125._20_4_;
            auVar289._24_4_ = auVar169._24_4_ + fVar253 * auVar125._24_4_;
            auVar289._28_4_ = auVar169._28_4_ + auVar200._28_4_;
            auVar290 = auVar289._16_16_;
            auVar147 = vshufps_avx(ZEXT416((uint)(fVar201 * 0.33333334)),
                                   ZEXT416((uint)(fVar201 * 0.33333334)),0);
            auVar267._0_4_ = auVar286._0_4_ + auVar147._0_4_ * auVar125._0_4_ * 3.0;
            auVar267._4_4_ = auVar286._4_4_ + auVar147._4_4_ * auVar125._4_4_ * 3.0;
            auVar267._8_4_ = auVar286._8_4_ + auVar147._8_4_ * auVar125._8_4_ * 3.0;
            auVar267._12_4_ = auVar286._12_4_ + auVar147._12_4_ * auVar125._12_4_ * 3.0;
            auVar194 = vshufpd_avx(auVar286,auVar286,3);
            auVar158 = vshufpd_avx(auVar290,auVar290,3);
            _local_308 = auVar194;
            auVar114 = vsubps_avx(auVar194,auVar286);
            _local_498 = auVar158;
            auVar210 = vsubps_avx(auVar158,auVar290);
            auVar112._0_4_ = auVar114._0_4_ + auVar210._0_4_;
            auVar112._4_4_ = auVar114._4_4_ + auVar210._4_4_;
            auVar112._8_4_ = auVar114._8_4_ + auVar210._8_4_;
            auVar112._12_4_ = auVar114._12_4_ + auVar210._12_4_;
            auVar114 = vmovshdup_avx(auVar286);
            auVar210 = vmovshdup_avx(auVar267);
            auVar184 = vshufps_avx(auVar112,auVar112,0);
            auVar148 = vshufps_avx(auVar112,auVar112,0x55);
            fVar202 = auVar148._0_4_;
            fVar373 = auVar148._4_4_;
            fVar221 = auVar148._8_4_;
            fVar252 = auVar148._12_4_;
            fVar333 = auVar184._0_4_;
            fVar223 = auVar184._4_4_;
            fVar253 = auVar184._8_4_;
            fVar222 = auVar184._12_4_;
            auVar113._0_4_ = fVar333 * auVar286._0_4_ + auVar114._0_4_ * fVar202;
            auVar113._4_4_ = fVar223 * auVar286._4_4_ + auVar114._4_4_ * fVar373;
            auVar113._8_4_ = fVar253 * auVar286._8_4_ + auVar114._8_4_ * fVar221;
            auVar113._12_4_ = fVar222 * auVar286._12_4_ + auVar114._12_4_ * fVar252;
            _local_4b8 = auVar267;
            auVar182._0_4_ = fVar333 * auVar267._0_4_ + auVar210._0_4_ * fVar202;
            auVar182._4_4_ = fVar223 * auVar267._4_4_ + auVar210._4_4_ * fVar373;
            auVar182._8_4_ = fVar253 * auVar267._8_4_ + auVar210._8_4_ * fVar221;
            auVar182._12_4_ = fVar222 * auVar267._12_4_ + auVar210._12_4_ * fVar252;
            auVar210 = vshufps_avx(auVar113,auVar113,0xe8);
            auVar184 = vshufps_avx(auVar182,auVar182,0xe8);
            auVar114 = vcmpps_avx(auVar210,auVar184,1);
            uVar91 = vextractps_avx(auVar114,0);
            auVar148 = auVar182;
            if ((uVar91 & 1) == 0) {
              auVar148 = auVar113;
            }
            auVar146._0_4_ = auVar147._0_4_ * auVar125._16_4_ * 3.0;
            auVar146._4_4_ = auVar147._4_4_ * auVar125._20_4_ * 3.0;
            auVar146._8_4_ = auVar147._8_4_ * auVar125._24_4_ * 3.0;
            auVar146._12_4_ = auVar147._12_4_ * 0.0;
            auVar11 = vsubps_avx(auVar290,auVar146);
            auVar147 = vmovshdup_avx(auVar11);
            auVar290 = vmovshdup_avx(auVar290);
            fVar224 = auVar11._0_4_;
            fVar254 = auVar11._4_4_;
            auVar239._0_4_ = fVar224 * fVar333 + auVar147._0_4_ * fVar202;
            auVar239._4_4_ = fVar254 * fVar223 + auVar147._4_4_ * fVar373;
            auVar239._8_4_ = auVar11._8_4_ * fVar253 + auVar147._8_4_ * fVar221;
            auVar239._12_4_ = auVar11._12_4_ * fVar222 + auVar147._12_4_ * fVar252;
            auVar268._0_4_ = fVar333 * auVar289._16_4_ + auVar290._0_4_ * fVar202;
            auVar268._4_4_ = fVar223 * auVar289._20_4_ + auVar290._4_4_ * fVar373;
            auVar268._8_4_ = fVar253 * auVar289._24_4_ + auVar290._8_4_ * fVar221;
            auVar268._12_4_ = fVar222 * auVar289._28_4_ + auVar290._12_4_ * fVar252;
            auVar290 = vshufps_avx(auVar239,auVar239,0xe8);
            auVar10 = vshufps_avx(auVar268,auVar268,0xe8);
            auVar147 = vcmpps_avx(auVar290,auVar10,1);
            uVar91 = vextractps_avx(auVar147,0);
            auVar308 = auVar268;
            if ((uVar91 & 1) == 0) {
              auVar308 = auVar239;
            }
            auVar148 = vmaxss_avx(auVar308,auVar148);
            auVar210 = vminps_avx(auVar210,auVar184);
            auVar184 = vminps_avx(auVar290,auVar10);
            auVar184 = vminps_avx(auVar210,auVar184);
            auVar114 = vshufps_avx(auVar114,auVar114,0x55);
            auVar114 = vblendps_avx(auVar114,auVar147,2);
            auVar147 = vpslld_avx(auVar114,0x1f);
            auVar114 = vshufpd_avx(auVar182,auVar182,1);
            auVar114 = vinsertps_avx(auVar114,auVar268,0x9c);
            auVar210 = vshufpd_avx(auVar113,auVar113,1);
            auVar210 = vinsertps_avx(auVar210,auVar239,0x9c);
            auVar114 = vblendvps_avx(auVar210,auVar114,auVar147);
            auVar210 = vmovshdup_avx(auVar114);
            auVar114 = vmaxss_avx(auVar210,auVar114);
            fVar221 = auVar184._0_4_;
            auVar210 = vmovshdup_avx(auVar184);
            fVar373 = auVar114._0_4_;
            fVar252 = auVar210._0_4_;
            fVar202 = auVar148._0_4_;
            if ((fVar221 < 0.0001) && (-0.0001 < fVar373)) break;
            if ((fVar252 < 0.0001 && -0.0001 < fVar202) || (fVar221 < 0.0001 && -0.0001 < fVar202))
            break;
            auVar147 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar114,1);
            auVar210 = vcmpps_avx(auVar210,SUB6416(ZEXT464(0x38d1b717),0),1);
            auVar210 = vandps_avx(auVar210,auVar147);
          } while ((auVar210 & (undefined1  [16])0x1) == (undefined1  [16])0x0);
          auVar147 = vcmpps_avx(auVar184,_DAT_01f7aa10,1);
          auVar210 = vcmpss_avx(auVar148,ZEXT416(0),1);
          auVar183._8_4_ = 0x3f800000;
          auVar183._0_8_ = 0x3f8000003f800000;
          auVar183._12_4_ = 0x3f800000;
          auVar240._8_4_ = 0xbf800000;
          auVar240._0_8_ = 0xbf800000bf800000;
          auVar240._12_4_ = 0xbf800000;
          auVar210 = vblendvps_avx(auVar183,auVar240,auVar210);
          auVar147 = vblendvps_avx(auVar183,auVar240,auVar147);
          auVar184 = vcmpss_avx(auVar147,auVar210,4);
          auVar184 = vpshufd_avx(ZEXT416(auVar184._0_4_ & 1),0x50);
          auVar184 = vpslld_avx(auVar184,0x1f);
          auVar184 = vpsrad_avx(auVar184,0x1f);
          auVar184 = vpandn_avx(auVar184,_DAT_01fafeb0);
          auVar148 = vmovshdup_avx(auVar147);
          fVar333 = auVar148._0_4_;
          if ((auVar147._0_4_ != fVar333) || (NAN(auVar147._0_4_) || NAN(fVar333))) {
            if ((fVar252 != fVar221) || (NAN(fVar252) || NAN(fVar221))) {
              fVar221 = -fVar221 / (fVar252 - fVar221);
              auVar147 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar221) * 0.0 + fVar221)));
            }
            else {
              auVar147 = ZEXT816(0x3f80000000000000);
              if ((fVar221 != 0.0) || (NAN(fVar221))) {
                auVar147 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar290 = vcmpps_avx(auVar184,auVar147,1);
            auVar148 = vblendps_avx(auVar184,auVar147,2);
            auVar147 = vblendps_avx(auVar147,auVar184,2);
            auVar184 = vblendvps_avx(auVar147,auVar148,auVar290);
          }
          auVar114 = vcmpss_avx(auVar114,ZEXT416(0),1);
          auVar185._8_4_ = 0x3f800000;
          auVar185._0_8_ = 0x3f8000003f800000;
          auVar185._12_4_ = 0x3f800000;
          auVar241._8_4_ = 0xbf800000;
          auVar241._0_8_ = 0xbf800000bf800000;
          auVar241._12_4_ = 0xbf800000;
          auVar114 = vblendvps_avx(auVar185,auVar241,auVar114);
          fVar221 = auVar114._0_4_;
          if ((auVar210._0_4_ != fVar221) || (NAN(auVar210._0_4_) || NAN(fVar221))) {
            if ((fVar373 != fVar202) || (NAN(fVar373) || NAN(fVar202))) {
              fVar202 = -fVar202 / (fVar373 - fVar202);
              auVar114 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar202) * 0.0 + fVar202)));
            }
            else {
              auVar114 = ZEXT816(0x3f80000000000000);
              if ((fVar202 != 0.0) || (NAN(fVar202))) {
                auVar114 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar147 = vcmpps_avx(auVar184,auVar114,1);
            auVar210 = vblendps_avx(auVar184,auVar114,2);
            auVar114 = vblendps_avx(auVar114,auVar184,2);
            auVar184 = vblendvps_avx(auVar114,auVar210,auVar147);
          }
          if ((fVar333 != fVar221) || (NAN(fVar333) || NAN(fVar221))) {
            auVar115._8_4_ = 0x3f800000;
            auVar115._0_8_ = 0x3f8000003f800000;
            auVar115._12_4_ = 0x3f800000;
            auVar114 = vcmpps_avx(auVar184,auVar115,1);
            auVar210 = vinsertps_avx(auVar184,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar186._4_12_ = auVar184._4_12_;
            auVar186._0_4_ = 0x3f800000;
            auVar184 = vblendvps_avx(auVar186,auVar210,auVar114);
          }
          auVar114 = vcmpps_avx(auVar184,_DAT_01f7b6f0,1);
          auVar77._12_4_ = 0;
          auVar77._0_12_ = auVar184._4_12_;
          auVar210 = vinsertps_avx(auVar184,ZEXT416(0x3f800000),0x10);
          auVar114 = vblendvps_avx(auVar210,auVar77 << 0x20,auVar114);
          auVar210 = vmovshdup_avx(auVar114);
        } while (auVar210._0_4_ < auVar114._0_4_);
        auVar116._0_4_ = auVar114._0_4_ + -0.1;
        auVar116._4_4_ = auVar114._4_4_ + 0.1;
        auVar116._8_4_ = auVar114._8_4_ + 0.0;
        auVar116._12_4_ = auVar114._12_4_ + 0.0;
        auVar147 = vshufpd_avx(auVar267,auVar267,3);
        register0x00001388 = 0x3f80000000000000;
        local_4b8 = (undefined1  [8])0x3f80000000000000;
        auVar114 = vcmpps_avx(auVar116,_local_4b8,1);
        auVar78._12_4_ = 0;
        auVar78._0_12_ = auVar116._4_12_;
        auVar210 = vinsertps_avx(auVar116,SUB6416(ZEXT464(0x3f800000),0),0x10);
        auVar114 = vblendvps_avx(auVar210,auVar78 << 0x20,auVar114);
        auVar210 = vshufpd_avx(auVar11,auVar11,3);
        auVar184 = vshufps_avx(auVar114,auVar114,0x50);
        auVar287._8_4_ = 0x3f800000;
        auVar287._0_8_ = 0x3f8000003f800000;
        auVar287._12_4_ = 0x3f800000;
        auVar148 = vsubps_avx(auVar287,auVar184);
        local_308._0_4_ = auVar194._0_4_;
        local_308._4_4_ = auVar194._4_4_;
        fStack_300 = auVar194._8_4_;
        fStack_2fc = auVar194._12_4_;
        fVar202 = auVar184._0_4_;
        fVar373 = auVar184._4_4_;
        fVar221 = auVar184._8_4_;
        fVar252 = auVar184._12_4_;
        local_498._0_4_ = auVar158._0_4_;
        local_498._4_4_ = auVar158._4_4_;
        fStack_490 = auVar158._8_4_;
        fStack_48c = auVar158._12_4_;
        fVar333 = auVar148._0_4_;
        fVar223 = auVar148._4_4_;
        fVar253 = auVar148._8_4_;
        fVar222 = auVar148._12_4_;
        auVar117._0_4_ = fVar202 * (float)local_308._0_4_ + fVar333 * auVar286._0_4_;
        auVar117._4_4_ = fVar373 * (float)local_308._4_4_ + fVar223 * auVar286._4_4_;
        auVar117._8_4_ = fVar221 * fStack_300 + fVar253 * auVar286._0_4_;
        auVar117._12_4_ = fVar252 * fStack_2fc + fVar222 * auVar286._4_4_;
        auVar187._0_4_ = fVar202 * auVar147._0_4_ + fVar333 * auVar267._0_4_;
        auVar187._4_4_ = fVar373 * auVar147._4_4_ + fVar223 * auVar267._4_4_;
        auVar187._8_4_ = fVar221 * auVar147._8_4_ + fVar253 * auVar267._0_4_;
        auVar187._12_4_ = fVar252 * auVar147._12_4_ + fVar222 * auVar267._4_4_;
        auVar269._0_4_ = fVar202 * auVar210._0_4_ + fVar333 * fVar224;
        auVar269._4_4_ = fVar373 * auVar210._4_4_ + fVar223 * fVar254;
        auVar269._8_4_ = fVar221 * auVar210._8_4_ + fVar253 * fVar224;
        auVar269._12_4_ = fVar252 * auVar210._12_4_ + fVar222 * fVar254;
        auVar296._0_4_ = fVar202 * (float)local_498._0_4_ + fVar333 * auVar289._16_4_;
        auVar296._4_4_ = fVar373 * (float)local_498._4_4_ + fVar223 * auVar289._20_4_;
        auVar296._8_4_ = fVar221 * fStack_490 + fVar253 * auVar289._16_4_;
        auVar296._12_4_ = fVar252 * fStack_48c + fVar222 * auVar289._20_4_;
        auVar158 = vsubps_avx(auVar287,auVar114);
        auVar210 = vmovshdup_avx(auVar110);
        auVar194 = vmovsldup_avx(auVar110);
        auVar110._0_4_ = auVar194._0_4_ * auVar158._0_4_ + auVar114._0_4_ * auVar210._0_4_;
        auVar110._4_4_ = auVar194._4_4_ * auVar158._4_4_ + auVar114._4_4_ * auVar210._4_4_;
        auVar110._8_4_ = auVar194._8_4_ * auVar158._8_4_ + auVar114._8_4_ * auVar210._8_4_;
        auVar110._12_4_ = auVar194._12_4_ * auVar158._12_4_ + auVar114._12_4_ * auVar210._12_4_;
        _local_498 = vmovshdup_avx(auVar110);
        auVar114 = vsubps_avx(auVar187,auVar117);
        auVar213._0_4_ = auVar114._0_4_ * 3.0;
        auVar213._4_4_ = auVar114._4_4_ * 3.0;
        auVar213._8_4_ = auVar114._8_4_ * 3.0;
        auVar213._12_4_ = auVar114._12_4_ * 3.0;
        auVar114 = vsubps_avx(auVar269,auVar187);
        auVar313._0_4_ = auVar114._0_4_ * 3.0;
        auVar313._4_4_ = auVar114._4_4_ * 3.0;
        auVar313._8_4_ = auVar114._8_4_ * 3.0;
        auVar313._12_4_ = auVar114._12_4_ * 3.0;
        auVar114 = vsubps_avx(auVar296,auVar269);
        auVar322._0_4_ = auVar114._0_4_ * 3.0;
        auVar322._4_4_ = auVar114._4_4_ * 3.0;
        auVar322._8_4_ = auVar114._8_4_ * 3.0;
        auVar322._12_4_ = auVar114._12_4_ * 3.0;
        auVar210 = vminps_avx(auVar313,auVar322);
        auVar114 = vmaxps_avx(auVar313,auVar322);
        auVar210 = vminps_avx(auVar213,auVar210);
        auVar114 = vmaxps_avx(auVar213,auVar114);
        auVar194 = vshufpd_avx(auVar210,auVar210,3);
        auVar158 = vshufpd_avx(auVar114,auVar114,3);
        auVar210 = vminps_avx(auVar210,auVar194);
        auVar114 = vmaxps_avx(auVar114,auVar158);
        auVar194 = vshufps_avx(ZEXT416((uint)(1.0 / fVar201)),ZEXT416((uint)(1.0 / fVar201)),0);
        auVar314._0_4_ = auVar210._0_4_ * auVar194._0_4_;
        auVar314._4_4_ = auVar210._4_4_ * auVar194._4_4_;
        auVar314._8_4_ = auVar210._8_4_ * auVar194._8_4_;
        auVar314._12_4_ = auVar210._12_4_ * auVar194._12_4_;
        auVar323._0_4_ = auVar194._0_4_ * auVar114._0_4_;
        auVar323._4_4_ = auVar194._4_4_ * auVar114._4_4_;
        auVar323._8_4_ = auVar194._8_4_ * auVar114._8_4_;
        auVar323._12_4_ = auVar194._12_4_ * auVar114._12_4_;
        auVar148 = ZEXT416((uint)(1.0 / (local_498._0_4_ - auVar110._0_4_)));
        auVar114 = vshufpd_avx(auVar117,auVar117,3);
        auVar210 = vshufpd_avx(auVar187,auVar187,3);
        auVar194 = vshufpd_avx(auVar269,auVar269,3);
        auVar158 = vshufpd_avx(auVar296,auVar296,3);
        auVar114 = vsubps_avx(auVar114,auVar117);
        auVar147 = vsubps_avx(auVar210,auVar187);
        auVar184 = vsubps_avx(auVar194,auVar269);
        auVar158 = vsubps_avx(auVar158,auVar296);
        auVar210 = vminps_avx(auVar114,auVar147);
        auVar114 = vmaxps_avx(auVar114,auVar147);
        auVar194 = vminps_avx(auVar184,auVar158);
        auVar194 = vminps_avx(auVar210,auVar194);
        auVar210 = vmaxps_avx(auVar184,auVar158);
        auVar114 = vmaxps_avx(auVar114,auVar210);
        auVar210 = vshufps_avx(auVar148,auVar148,0);
        auVar375._0_4_ = auVar210._0_4_ * auVar194._0_4_;
        auVar375._4_4_ = auVar210._4_4_ * auVar194._4_4_;
        auVar375._8_4_ = auVar210._8_4_ * auVar194._8_4_;
        auVar375._12_4_ = auVar210._12_4_ * auVar194._12_4_;
        auVar386._0_4_ = auVar210._0_4_ * auVar114._0_4_;
        auVar386._4_4_ = auVar210._4_4_ * auVar114._4_4_;
        auVar386._8_4_ = auVar210._8_4_ * auVar114._8_4_;
        auVar386._12_4_ = auVar210._12_4_ * auVar114._12_4_;
        auVar114 = vmovsldup_avx(auVar110);
        auVar336._4_12_ = auVar114._4_12_;
        auVar336._0_4_ = fVar220;
        auVar345._4_12_ = auVar110._4_12_;
        auVar345._0_4_ = fVar227;
        auVar214._0_4_ = (fVar220 + fVar227) * 0.5;
        auVar214._4_4_ = (auVar114._4_4_ + auVar110._4_4_) * 0.5;
        auVar214._8_4_ = (auVar114._8_4_ + auVar110._8_4_) * 0.5;
        auVar214._12_4_ = (auVar114._12_4_ + auVar110._12_4_) * 0.5;
        auVar114 = vshufps_avx(auVar214,auVar214,0);
        fVar202 = auVar114._0_4_;
        fVar373 = auVar114._4_4_;
        fVar221 = auVar114._8_4_;
        fVar252 = auVar114._12_4_;
        auVar149._0_4_ = fVar202 * (float)local_1e8._0_4_ + (float)local_458._0_4_;
        auVar149._4_4_ = fVar373 * (float)local_1e8._4_4_ + (float)local_458._4_4_;
        auVar149._8_4_ = fVar221 * fStack_1e0 + fStack_450;
        auVar149._12_4_ = fVar252 * fStack_1dc + fStack_44c;
        auVar188._0_4_ = fVar202 * (float)local_1f8._0_4_ + (float)local_468._0_4_;
        auVar188._4_4_ = fVar373 * (float)local_1f8._4_4_ + (float)local_468._4_4_;
        auVar188._8_4_ = fVar221 * fStack_1f0 + fStack_460;
        auVar188._12_4_ = fVar252 * fStack_1ec + fStack_45c;
        auVar270._0_4_ = fVar202 * (float)local_208._0_4_ + (float)local_478._0_4_;
        auVar270._4_4_ = fVar373 * (float)local_208._4_4_ + (float)local_478._4_4_;
        auVar270._8_4_ = fVar221 * fStack_200 + fStack_470;
        auVar270._12_4_ = fVar252 * fStack_1fc + fStack_46c;
        auVar114 = vsubps_avx(auVar188,auVar149);
        auVar150._0_4_ = auVar149._0_4_ + fVar202 * auVar114._0_4_;
        auVar150._4_4_ = auVar149._4_4_ + fVar373 * auVar114._4_4_;
        auVar150._8_4_ = auVar149._8_4_ + fVar221 * auVar114._8_4_;
        auVar150._12_4_ = auVar149._12_4_ + fVar252 * auVar114._12_4_;
        auVar114 = vsubps_avx(auVar270,auVar188);
        auVar189._0_4_ = auVar188._0_4_ + fVar202 * auVar114._0_4_;
        auVar189._4_4_ = auVar188._4_4_ + fVar373 * auVar114._4_4_;
        auVar189._8_4_ = auVar188._8_4_ + fVar221 * auVar114._8_4_;
        auVar189._12_4_ = auVar188._12_4_ + fVar252 * auVar114._12_4_;
        auVar114 = vsubps_avx(auVar189,auVar150);
        fVar202 = auVar150._0_4_ + fVar202 * auVar114._0_4_;
        fVar373 = auVar150._4_4_ + fVar373 * auVar114._4_4_;
        auVar118._0_8_ = CONCAT44(fVar373,fVar202);
        auVar118._8_4_ = auVar150._8_4_ + fVar221 * auVar114._8_4_;
        auVar118._12_4_ = auVar150._12_4_ + fVar252 * auVar114._12_4_;
        fVar221 = auVar114._0_4_ * 3.0;
        fVar252 = auVar114._4_4_ * 3.0;
        auVar151._0_8_ = CONCAT44(fVar252,fVar221);
        auVar151._8_4_ = auVar114._8_4_ * 3.0;
        auVar151._12_4_ = auVar114._12_4_ * 3.0;
        auVar190._8_8_ = auVar118._0_8_;
        auVar190._0_8_ = auVar118._0_8_;
        auVar114 = vshufpd_avx(auVar118,auVar118,3);
        auVar210 = vshufps_avx(auVar214,auVar214,0x55);
        auVar184 = vsubps_avx(auVar114,auVar190);
        auVar364._0_4_ = auVar184._0_4_ * auVar210._0_4_ + fVar202;
        auVar364._4_4_ = auVar184._4_4_ * auVar210._4_4_ + fVar373;
        auVar364._8_4_ = auVar184._8_4_ * auVar210._8_4_ + fVar202;
        auVar364._12_4_ = auVar184._12_4_ * auVar210._12_4_ + fVar373;
        auVar191._8_8_ = auVar151._0_8_;
        auVar191._0_8_ = auVar151._0_8_;
        auVar114 = vshufpd_avx(auVar151,auVar151,1);
        auVar114 = vsubps_avx(auVar114,auVar191);
        auVar152._0_4_ = auVar114._0_4_ * auVar210._0_4_ + fVar221;
        auVar152._4_4_ = auVar114._4_4_ * auVar210._4_4_ + fVar252;
        auVar152._8_4_ = auVar114._8_4_ * auVar210._8_4_ + fVar221;
        auVar152._12_4_ = auVar114._12_4_ * auVar210._12_4_ + fVar252;
        auVar210 = vmovshdup_avx(auVar152);
        auVar271._0_8_ = auVar210._0_8_ ^ 0x8000000080000000;
        auVar271._8_4_ = auVar210._8_4_ ^ 0x80000000;
        auVar271._12_4_ = auVar210._12_4_ ^ 0x80000000;
        auVar194 = vmovshdup_avx(auVar184);
        auVar114 = vunpcklps_avx(auVar194,auVar271);
        auVar158 = vshufps_avx(auVar114,auVar271,4);
        auVar119._0_8_ = auVar184._0_8_ ^ 0x8000000080000000;
        auVar119._8_4_ = -auVar184._8_4_;
        auVar119._12_4_ = -auVar184._12_4_;
        auVar114 = vmovlhps_avx(auVar119,auVar152);
        auVar147 = vshufps_avx(auVar114,auVar152,8);
        auVar114 = ZEXT416((uint)(auVar152._0_4_ * auVar194._0_4_ - auVar184._0_4_ * auVar210._0_4_)
                          );
        auVar210 = vshufps_avx(auVar114,auVar114,0);
        auVar114 = vdivps_avx(auVar158,auVar210);
        auVar210 = vdivps_avx(auVar147,auVar210);
        auVar147 = vinsertps_avx(auVar314,auVar375,0x1c);
        auVar184 = vinsertps_avx(auVar323,auVar386,0x1c);
        auVar148 = vinsertps_avx(auVar375,auVar314,0x4c);
        auVar290 = vinsertps_avx(auVar386,auVar323,0x4c);
        auVar194 = vmovsldup_avx(auVar114);
        auVar324._0_4_ = auVar147._0_4_ * auVar194._0_4_;
        auVar324._4_4_ = auVar147._4_4_ * auVar194._4_4_;
        auVar324._8_4_ = auVar147._8_4_ * auVar194._8_4_;
        auVar324._12_4_ = auVar147._12_4_ * auVar194._12_4_;
        auVar153._0_4_ = auVar194._0_4_ * auVar184._0_4_;
        auVar153._4_4_ = auVar194._4_4_ * auVar184._4_4_;
        auVar153._8_4_ = auVar194._8_4_ * auVar184._8_4_;
        auVar153._12_4_ = auVar194._12_4_ * auVar184._12_4_;
        auVar158 = vminps_avx(auVar324,auVar153);
        auVar194 = vmaxps_avx(auVar153,auVar324);
        auVar10 = vmovsldup_avx(auVar210);
        auVar387._0_4_ = auVar10._0_4_ * auVar148._0_4_;
        auVar387._4_4_ = auVar10._4_4_ * auVar148._4_4_;
        auVar387._8_4_ = auVar10._8_4_ * auVar148._8_4_;
        auVar387._12_4_ = auVar10._12_4_ * auVar148._12_4_;
        auVar325._0_4_ = auVar10._0_4_ * auVar290._0_4_;
        auVar325._4_4_ = auVar10._4_4_ * auVar290._4_4_;
        auVar325._8_4_ = auVar10._8_4_ * auVar290._8_4_;
        auVar325._12_4_ = auVar10._12_4_ * auVar290._12_4_;
        auVar10 = vminps_avx(auVar387,auVar325);
        auVar242._0_4_ = auVar158._0_4_ + auVar10._0_4_;
        auVar242._4_4_ = auVar158._4_4_ + auVar10._4_4_;
        auVar242._8_4_ = auVar158._8_4_ + auVar10._8_4_;
        auVar242._12_4_ = auVar158._12_4_ + auVar10._12_4_;
        auVar158 = vmaxps_avx(auVar325,auVar387);
        auVar10 = vsubps_avx(auVar336,auVar214);
        auVar11 = vsubps_avx(auVar345,auVar214);
        auVar154._0_4_ = auVar158._0_4_ + auVar194._0_4_;
        auVar154._4_4_ = auVar158._4_4_ + auVar194._4_4_;
        auVar154._8_4_ = auVar158._8_4_ + auVar194._8_4_;
        auVar154._12_4_ = auVar158._12_4_ + auVar194._12_4_;
        auVar346._8_8_ = 0x3f800000;
        auVar346._0_8_ = 0x3f800000;
        auVar194 = vsubps_avx(auVar346,auVar154);
        auVar158 = vsubps_avx(auVar346,auVar242);
        fVar253 = auVar10._0_4_;
        auVar347._0_4_ = fVar253 * auVar194._0_4_;
        fVar222 = auVar10._4_4_;
        auVar347._4_4_ = fVar222 * auVar194._4_4_;
        fVar224 = auVar10._8_4_;
        auVar347._8_4_ = fVar224 * auVar194._8_4_;
        fVar254 = auVar10._12_4_;
        auVar347._12_4_ = fVar254 * auVar194._12_4_;
        fVar221 = auVar11._0_4_;
        auVar155._0_4_ = fVar221 * auVar194._0_4_;
        fVar252 = auVar11._4_4_;
        auVar155._4_4_ = fVar252 * auVar194._4_4_;
        fVar333 = auVar11._8_4_;
        auVar155._8_4_ = fVar333 * auVar194._8_4_;
        fVar223 = auVar11._12_4_;
        auVar155._12_4_ = fVar223 * auVar194._12_4_;
        auVar376._0_4_ = fVar253 * auVar158._0_4_;
        auVar376._4_4_ = fVar222 * auVar158._4_4_;
        auVar376._8_4_ = fVar224 * auVar158._8_4_;
        auVar376._12_4_ = fVar254 * auVar158._12_4_;
        auVar243._0_4_ = fVar221 * auVar158._0_4_;
        auVar243._4_4_ = fVar252 * auVar158._4_4_;
        auVar243._8_4_ = fVar333 * auVar158._8_4_;
        auVar243._12_4_ = fVar223 * auVar158._12_4_;
        auVar194 = vminps_avx(auVar347,auVar376);
        auVar158 = vminps_avx(auVar155,auVar243);
        auVar10 = vminps_avx(auVar194,auVar158);
        auVar194 = vmaxps_avx(auVar376,auVar347);
        auVar158 = vmaxps_avx(auVar243,auVar155);
        auVar11 = vshufps_avx(auVar214,auVar214,0x54);
        auVar158 = vmaxps_avx(auVar158,auVar194);
        auVar308 = vshufps_avx(auVar364,auVar364,0);
        auVar12 = vshufps_avx(auVar364,auVar364,0x55);
        auVar194 = vhaddps_avx(auVar10,auVar10);
        auVar158 = vhaddps_avx(auVar158,auVar158);
        auVar244._0_4_ = auVar12._0_4_ * auVar210._0_4_ + auVar308._0_4_ * auVar114._0_4_;
        auVar244._4_4_ = auVar12._4_4_ * auVar210._4_4_ + auVar308._4_4_ * auVar114._4_4_;
        auVar244._8_4_ = auVar12._8_4_ * auVar210._8_4_ + auVar308._8_4_ * auVar114._8_4_;
        auVar244._12_4_ = auVar12._12_4_ * auVar210._12_4_ + auVar308._12_4_ * auVar114._12_4_;
        auVar10 = vsubps_avx(auVar11,auVar244);
        fVar202 = auVar10._0_4_ + auVar194._0_4_;
        fVar373 = auVar10._0_4_ + auVar158._0_4_;
        auVar194 = vmaxss_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar202));
        auVar158 = vminss_avx(ZEXT416((uint)fVar373),ZEXT416((uint)fVar227));
      } while (auVar158._0_4_ < auVar194._0_4_);
      auVar194 = vmovshdup_avx(auVar114);
      auVar245._0_4_ = auVar147._0_4_ * auVar194._0_4_;
      auVar245._4_4_ = auVar147._4_4_ * auVar194._4_4_;
      auVar245._8_4_ = auVar147._8_4_ * auVar194._8_4_;
      auVar245._12_4_ = auVar147._12_4_ * auVar194._12_4_;
      auVar156._0_4_ = auVar194._0_4_ * auVar184._0_4_;
      auVar156._4_4_ = auVar194._4_4_ * auVar184._4_4_;
      auVar156._8_4_ = auVar194._8_4_ * auVar184._8_4_;
      auVar156._12_4_ = auVar194._12_4_ * auVar184._12_4_;
      auVar158 = vminps_avx(auVar245,auVar156);
      auVar194 = vmaxps_avx(auVar156,auVar245);
      auVar147 = vmovshdup_avx(auVar210);
      auVar120._0_4_ = auVar147._0_4_ * auVar148._0_4_;
      auVar120._4_4_ = auVar147._4_4_ * auVar148._4_4_;
      auVar120._8_4_ = auVar147._8_4_ * auVar148._8_4_;
      auVar120._12_4_ = auVar147._12_4_ * auVar148._12_4_;
      auVar246._0_4_ = auVar290._0_4_ * auVar147._0_4_;
      auVar246._4_4_ = auVar290._4_4_ * auVar147._4_4_;
      auVar246._8_4_ = auVar290._8_4_ * auVar147._8_4_;
      auVar246._12_4_ = auVar290._12_4_ * auVar147._12_4_;
      auVar147 = vminps_avx(auVar120,auVar246);
      auVar192._0_4_ = auVar158._0_4_ + auVar147._0_4_;
      auVar192._4_4_ = auVar158._4_4_ + auVar147._4_4_;
      auVar192._8_4_ = auVar158._8_4_ + auVar147._8_4_;
      auVar192._12_4_ = auVar158._12_4_ + auVar147._12_4_;
      auVar158 = vmaxps_avx(auVar246,auVar120);
      auVar121._0_4_ = auVar194._0_4_ + auVar158._0_4_;
      auVar121._4_4_ = auVar194._4_4_ + auVar158._4_4_;
      auVar121._8_4_ = auVar194._8_4_ + auVar158._8_4_;
      auVar121._12_4_ = auVar194._12_4_ + auVar158._12_4_;
      auVar194 = vsubps_avx(_local_4b8,auVar121);
      auVar158 = vsubps_avx(_local_4b8,auVar192);
      auVar193._0_4_ = fVar253 * auVar194._0_4_;
      auVar193._4_4_ = fVar222 * auVar194._4_4_;
      auVar193._8_4_ = fVar224 * auVar194._8_4_;
      auVar193._12_4_ = fVar254 * auVar194._12_4_;
      auVar247._0_4_ = fVar253 * auVar158._0_4_;
      auVar247._4_4_ = fVar222 * auVar158._4_4_;
      auVar247._8_4_ = fVar224 * auVar158._8_4_;
      auVar247._12_4_ = fVar254 * auVar158._12_4_;
      auVar122._0_4_ = fVar221 * auVar194._0_4_;
      auVar122._4_4_ = fVar252 * auVar194._4_4_;
      auVar122._8_4_ = fVar333 * auVar194._8_4_;
      auVar122._12_4_ = fVar223 * auVar194._12_4_;
      auVar157._0_4_ = fVar221 * auVar158._0_4_;
      auVar157._4_4_ = fVar252 * auVar158._4_4_;
      auVar157._8_4_ = fVar333 * auVar158._8_4_;
      auVar157._12_4_ = fVar223 * auVar158._12_4_;
      auVar194 = vminps_avx(auVar193,auVar247);
      auVar158 = vminps_avx(auVar122,auVar157);
      auVar194 = vminps_avx(auVar194,auVar158);
      auVar158 = vmaxps_avx(auVar247,auVar193);
      auVar147 = vmaxps_avx(auVar157,auVar122);
      auVar194 = vhaddps_avx(auVar194,auVar194);
      auVar158 = vmaxps_avx(auVar147,auVar158);
      auVar158 = vhaddps_avx(auVar158,auVar158);
      auVar147 = vmovshdup_avx(auVar10);
      auVar184 = ZEXT416((uint)(auVar147._0_4_ + auVar194._0_4_));
      auVar194 = vmaxss_avx(auVar110,auVar184);
      auVar147 = ZEXT416((uint)(auVar147._0_4_ + auVar158._0_4_));
      auVar158 = vminss_avx(auVar147,_local_498);
      auVar388._8_4_ = 0x7fffffff;
      auVar388._0_8_ = 0x7fffffff7fffffff;
      auVar388._12_4_ = 0x7fffffff;
    } while (auVar158._0_4_ < auVar194._0_4_);
    uVar91 = 0;
    if ((fVar220 < fVar202) && (fVar373 < fVar227)) {
      auVar194 = vcmpps_avx(auVar147,_local_498,1);
      auVar158 = vcmpps_avx(auVar110,auVar184,1);
      auVar194 = vandps_avx(auVar158,auVar194);
      uVar91 = auVar194._0_4_;
    }
    if ((3 < (uint)uVar86 || fVar201 < 0.001) || (uVar91 & 1) != 0) {
      lVar92 = 200;
      do {
        fVar201 = auVar10._0_4_;
        fVar227 = 1.0 - fVar201;
        auVar194 = ZEXT416((uint)(fVar227 * fVar227 * fVar227));
        auVar194 = vshufps_avx(auVar194,auVar194,0);
        auVar158 = ZEXT416((uint)(fVar201 * 3.0 * fVar227 * fVar227));
        auVar158 = vshufps_avx(auVar158,auVar158,0);
        auVar147 = ZEXT416((uint)(fVar227 * fVar201 * fVar201 * 3.0));
        auVar147 = vshufps_avx(auVar147,auVar147,0);
        auVar184 = ZEXT416((uint)(fVar201 * fVar201 * fVar201));
        auVar184 = vshufps_avx(auVar184,auVar184,0);
        fVar227 = (float)local_458._0_4_ * auVar194._0_4_ +
                  (float)local_468._0_4_ * auVar158._0_4_ +
                  (float)local_2a8._0_4_ * auVar184._0_4_ + (float)local_478._0_4_ * auVar147._0_4_;
        fVar201 = (float)local_458._4_4_ * auVar194._4_4_ +
                  (float)local_468._4_4_ * auVar158._4_4_ +
                  (float)local_2a8._4_4_ * auVar184._4_4_ + (float)local_478._4_4_ * auVar147._4_4_;
        auVar123._0_8_ = CONCAT44(fVar201,fVar227);
        auVar123._8_4_ =
             fStack_450 * auVar194._8_4_ +
             fStack_460 * auVar158._8_4_ + fStack_2a0 * auVar184._8_4_ + fStack_470 * auVar147._8_4_
        ;
        auVar123._12_4_ =
             fStack_44c * auVar194._12_4_ +
             fStack_45c * auVar158._12_4_ +
             fStack_29c * auVar184._12_4_ + fStack_46c * auVar147._12_4_;
        auVar159._8_8_ = auVar123._0_8_;
        auVar159._0_8_ = auVar123._0_8_;
        auVar158 = vshufpd_avx(auVar123,auVar123,1);
        auVar194 = vmovshdup_avx(auVar10);
        auVar158 = vsubps_avx(auVar158,auVar159);
        auVar124._0_4_ = auVar194._0_4_ * auVar158._0_4_ + fVar227;
        auVar124._4_4_ = auVar194._4_4_ * auVar158._4_4_ + fVar201;
        auVar124._8_4_ = auVar194._8_4_ * auVar158._8_4_ + fVar227;
        auVar124._12_4_ = auVar194._12_4_ * auVar158._12_4_ + fVar201;
        auVar194 = vshufps_avx(auVar124,auVar124,0);
        auVar158 = vshufps_avx(auVar124,auVar124,0x55);
        auVar160._0_4_ = auVar114._0_4_ * auVar194._0_4_ + auVar210._0_4_ * auVar158._0_4_;
        auVar160._4_4_ = auVar114._4_4_ * auVar194._4_4_ + auVar210._4_4_ * auVar158._4_4_;
        auVar160._8_4_ = auVar114._8_4_ * auVar194._8_4_ + auVar210._8_4_ * auVar158._8_4_;
        auVar160._12_4_ = auVar114._12_4_ * auVar194._12_4_ + auVar210._12_4_ * auVar158._12_4_;
        auVar10 = vsubps_avx(auVar10,auVar160);
        auVar194 = vandps_avx(auVar388,auVar124);
        auVar158 = vshufps_avx(auVar194,auVar194,0xf5);
        auVar194 = vmaxss_avx(auVar158,auVar194);
        if (auVar194._0_4_ < fVar203) {
          fVar227 = auVar10._0_4_;
          if ((0.0 <= fVar227) && (fVar227 <= 1.0)) {
            auVar114 = vmovshdup_avx(auVar10);
            fVar201 = auVar114._0_4_;
            if ((0.0 <= fVar201) && (fVar201 <= 1.0)) {
              auVar114 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                       ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
              auVar290 = vinsertps_avx(auVar114,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),
                                       0x28);
              aVar9 = (ray->org).field_0;
              auVar114 = vsubps_avx(_local_388,(undefined1  [16])aVar9);
              auVar114 = vdpps_avx(auVar114,auVar290,0x7f);
              auVar210 = vsubps_avx(_local_398,(undefined1  [16])aVar9);
              auVar210 = vdpps_avx(auVar210,auVar290,0x7f);
              auVar194 = vsubps_avx(_local_3a8,(undefined1  [16])aVar9);
              auVar194 = vdpps_avx(auVar194,auVar290,0x7f);
              auVar158 = vsubps_avx(_local_3b8,(undefined1  [16])aVar9);
              auVar158 = vdpps_avx(auVar158,auVar290,0x7f);
              auVar147 = vsubps_avx(_local_3c8,(undefined1  [16])aVar9);
              auVar147 = vdpps_avx(auVar147,auVar290,0x7f);
              auVar184 = vsubps_avx(_local_3d8,(undefined1  [16])aVar9);
              auVar184 = vdpps_avx(auVar184,auVar290,0x7f);
              auVar83._4_4_ = fStack_3e4;
              auVar83._0_4_ = local_3e8;
              auVar83._8_4_ = fStack_3e0;
              auVar83._12_4_ = fStack_3dc;
              auVar148 = vsubps_avx(auVar83,(undefined1  [16])aVar9);
              auVar148 = vdpps_avx(auVar148,auVar290,0x7f);
              auVar81._4_4_ = fStack_414;
              auVar81._0_4_ = local_418;
              auVar81._8_4_ = fStack_410;
              auVar81._12_4_ = fStack_40c;
              auVar11 = vsubps_avx(auVar81,(undefined1  [16])aVar9);
              auVar290 = vdpps_avx(auVar11,auVar290,0x7f);
              fVar252 = 1.0 - fVar201;
              fVar333 = 1.0 - fVar227;
              fVar220 = auVar10._4_4_;
              fVar202 = auVar10._8_4_;
              fVar373 = auVar10._12_4_;
              fVar221 = fVar333 * fVar227 * fVar227 * 3.0;
              auVar272._0_4_ = fVar227 * fVar227 * fVar227;
              auVar272._4_4_ = fVar220 * fVar220 * fVar220;
              auVar272._8_4_ = fVar202 * fVar202 * fVar202;
              auVar272._12_4_ = fVar373 * fVar373 * fVar373;
              fVar220 = fVar227 * 3.0 * fVar333 * fVar333;
              fVar202 = fVar333 * fVar333 * fVar333;
              fVar227 = (fVar252 * auVar114._0_4_ + auVar147._0_4_ * fVar201) * fVar202 +
                        fVar220 * (auVar184._0_4_ * fVar201 + fVar252 * auVar210._0_4_) +
                        fVar221 * (auVar148._0_4_ * fVar201 + fVar252 * auVar194._0_4_) +
                        auVar272._0_4_ * (fVar252 * auVar158._0_4_ + fVar201 * auVar290._0_4_);
              if (((ray->org).field_0.m128[3] <= fVar227) &&
                 (fVar201 = ray->tfar, fVar227 <= fVar201)) {
                pGVar25 = (context->scene->geometries).items[local_420].ptr;
                if ((pGVar25->mask & ray->mask) == 0) {
LAB_0112f5f9:
                  bVar84 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar84 = 1, pGVar25->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  auVar114 = vshufps_avx(auVar10,auVar10,0x55);
                  auVar315._8_4_ = 0x3f800000;
                  auVar315._0_8_ = 0x3f8000003f800000;
                  auVar315._12_4_ = 0x3f800000;
                  auVar210 = vsubps_avx(auVar315,auVar114);
                  fVar373 = auVar114._0_4_;
                  fVar252 = auVar114._4_4_;
                  fVar223 = auVar114._8_4_;
                  fVar253 = auVar114._12_4_;
                  fVar222 = auVar210._0_4_;
                  fVar224 = auVar210._4_4_;
                  fVar254 = auVar210._8_4_;
                  fVar225 = auVar210._12_4_;
                  auVar326._0_4_ =
                       fVar373 * (float)local_3c8._0_4_ + fVar222 * (float)local_388._0_4_;
                  auVar326._4_4_ =
                       fVar252 * (float)local_3c8._4_4_ + fVar224 * (float)local_388._4_4_;
                  auVar326._8_4_ = fVar223 * fStack_3c0 + fVar254 * fStack_380;
                  auVar326._12_4_ = fVar253 * fStack_3bc + fVar225 * fStack_37c;
                  auVar337._0_4_ =
                       fVar373 * (float)local_3d8._0_4_ + fVar222 * (float)local_398._0_4_;
                  auVar337._4_4_ =
                       fVar252 * (float)local_3d8._4_4_ + fVar224 * (float)local_398._4_4_;
                  auVar337._8_4_ = fVar223 * fStack_3d0 + fVar254 * fStack_390;
                  auVar337._12_4_ = fVar253 * fStack_3cc + fVar225 * fStack_38c;
                  auVar348._0_4_ = fVar373 * local_3e8 + fVar222 * (float)local_3a8._0_4_;
                  auVar348._4_4_ = fVar252 * fStack_3e4 + fVar224 * (float)local_3a8._4_4_;
                  auVar348._8_4_ = fVar223 * fStack_3e0 + fVar254 * fStack_3a0;
                  auVar348._12_4_ = fVar253 * fStack_3dc + fVar225 * fStack_39c;
                  auVar297._0_4_ = fVar222 * (float)local_3b8._0_4_ + fVar373 * local_418;
                  auVar297._4_4_ = fVar224 * (float)local_3b8._4_4_ + fVar252 * fStack_414;
                  auVar297._8_4_ = fVar254 * fStack_3b0 + fVar223 * fStack_410;
                  auVar297._12_4_ = fVar225 * fStack_3ac + fVar253 * fStack_40c;
                  auVar158 = vsubps_avx(auVar337,auVar326);
                  auVar147 = vsubps_avx(auVar348,auVar337);
                  auVar184 = vsubps_avx(auVar297,auVar348);
                  auVar114 = vshufps_avx(auVar10,auVar10,0);
                  fVar253 = auVar114._0_4_;
                  fVar222 = auVar114._4_4_;
                  fVar224 = auVar114._8_4_;
                  fVar254 = auVar114._12_4_;
                  auVar114 = vshufps_avx(ZEXT416((uint)fVar333),ZEXT416((uint)fVar333),0);
                  fVar373 = auVar114._0_4_;
                  fVar252 = auVar114._4_4_;
                  fVar333 = auVar114._8_4_;
                  fVar223 = auVar114._12_4_;
                  auVar114 = vshufps_avx(auVar272,auVar272,0);
                  auVar210 = vshufps_avx(ZEXT416((uint)fVar221),ZEXT416((uint)fVar221),0);
                  auVar194 = vshufps_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar220),0);
                  auVar248._0_4_ =
                       ((auVar158._0_4_ * fVar373 + fVar253 * auVar147._0_4_) * fVar373 +
                       fVar253 * (auVar147._0_4_ * fVar373 + fVar253 * auVar184._0_4_)) * 3.0;
                  auVar248._4_4_ =
                       ((auVar158._4_4_ * fVar252 + fVar222 * auVar147._4_4_) * fVar252 +
                       fVar222 * (auVar147._4_4_ * fVar252 + fVar222 * auVar184._4_4_)) * 3.0;
                  auVar248._8_4_ =
                       ((auVar158._8_4_ * fVar333 + fVar224 * auVar147._8_4_) * fVar333 +
                       fVar224 * (auVar147._8_4_ * fVar333 + fVar224 * auVar184._8_4_)) * 3.0;
                  auVar248._12_4_ =
                       ((auVar158._12_4_ * fVar223 + fVar254 * auVar147._12_4_) * fVar223 +
                       fVar254 * (auVar147._12_4_ * fVar223 + fVar254 * auVar184._12_4_)) * 3.0;
                  auVar158 = vshufps_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),0);
                  auVar161._0_4_ =
                       auVar158._0_4_ * (float)local_228._0_4_ +
                       auVar194._0_4_ * (float)local_238._0_4_ +
                       auVar114._0_4_ * (float)local_258._0_4_ +
                       auVar210._0_4_ * (float)local_248._0_4_;
                  auVar161._4_4_ =
                       auVar158._4_4_ * (float)local_228._4_4_ +
                       auVar194._4_4_ * (float)local_238._4_4_ +
                       auVar114._4_4_ * (float)local_258._4_4_ +
                       auVar210._4_4_ * (float)local_248._4_4_;
                  auVar161._8_4_ =
                       auVar158._8_4_ * fStack_220 +
                       auVar194._8_4_ * fStack_230 +
                       auVar114._8_4_ * fStack_250 + auVar210._8_4_ * fStack_240;
                  auVar161._12_4_ =
                       auVar158._12_4_ * fStack_21c +
                       auVar194._12_4_ * fStack_22c +
                       auVar114._12_4_ * fStack_24c + auVar210._12_4_ * fStack_23c;
                  auVar114 = vshufps_avx(auVar248,auVar248,0xc9);
                  auVar195._0_4_ = auVar161._0_4_ * auVar114._0_4_;
                  auVar195._4_4_ = auVar161._4_4_ * auVar114._4_4_;
                  auVar195._8_4_ = auVar161._8_4_ * auVar114._8_4_;
                  auVar195._12_4_ = auVar161._12_4_ * auVar114._12_4_;
                  auVar114 = vshufps_avx(auVar161,auVar161,0xc9);
                  auVar162._0_4_ = auVar248._0_4_ * auVar114._0_4_;
                  auVar162._4_4_ = auVar248._4_4_ * auVar114._4_4_;
                  auVar162._8_4_ = auVar248._8_4_ * auVar114._8_4_;
                  auVar162._12_4_ = auVar248._12_4_ * auVar114._12_4_;
                  auVar210 = vsubps_avx(auVar162,auVar195);
                  auVar114 = vshufps_avx(auVar210,auVar210,0xe9);
                  local_288 = vmovlps_avx(auVar114);
                  local_280 = auVar210._0_4_;
                  local_27c = vmovlps_avx(auVar10);
                  local_274 = (int)local_2e8;
                  local_270 = (int)local_420;
                  local_26c = context->user->instID[0];
                  local_268 = context->user->instPrimID[0];
                  ray->tfar = fVar227;
                  local_4cc = -1;
                  local_2d8.valid = &local_4cc;
                  local_2d8.geometryUserPtr = pGVar25->userPtr;
                  local_2d8.context = context->user;
                  local_2d8.hit = (RTCHitN *)&local_288;
                  local_2d8.N = 1;
                  local_2d8.ray = (RTCRayN *)ray;
                  if (pGVar25->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0112f5a0:
                    p_Var30 = context->args->filter;
                    if ((p_Var30 == (RTCFilterFunctionN)0x0) ||
                       ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                          RTC_RAY_QUERY_FLAG_INCOHERENT &&
                         (((pGVar25->field_8).field_0x2 & 0x40) == 0)) ||
                        ((*p_Var30)(&local_2d8), *local_2d8.valid != 0)))) {
                      bVar84 = 1;
                      goto LAB_0112f5fb;
                    }
                  }
                  else {
                    _local_448 = ZEXT832((ulong)auVar94);
                    (*pGVar25->occlusionFilterN)(&local_2d8);
                    auVar94 = local_448;
                    if (*local_2d8.valid != 0) goto LAB_0112f5a0;
                  }
                  ray->tfar = fVar201;
                  goto LAB_0112f5f9;
                }
LAB_0112f5fb:
                bVar90 = (bool)(bVar90 | bVar84);
              }
            }
          }
          break;
        }
        lVar92 = lVar92 + -1;
      } while (lVar92 != 0);
      goto LAB_0112e711;
    }
    local_218 = vinsertps_avx(ZEXT416((uint)fVar220),ZEXT416((uint)fVar227),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }